

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int cppwinrt::run(int argc,char **argv)

{
  pointer *ppTVar1;
  _Base_ptr *members;
  _Rb_tree_node_base *first;
  vector<char,_std::allocator<char>_> *pvVar2;
  vector<char,std::allocator<char>> *pvVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  uint32_t uVar5;
  _Rb_tree_color _Var6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  database *pdVar8;
  _List_node_base *p_Var9;
  iterator __position;
  cache *pcVar10;
  _Base_ptr p_Var11;
  table_base *ptVar12;
  _Base_ptr p_Var13;
  size_type sVar14;
  pointer ppVar15;
  undefined8 uVar16;
  undefined4 uVar17;
  namespace_members *pnVar18;
  pointer pTVar19;
  char cVar20;
  bool bVar21;
  bool bVar22;
  int iVar23;
  uint uVar24;
  long lVar25;
  const_iterator cVar26;
  const_iterator cVar27;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar28;
  istream *piVar29;
  pointer *ppcVar30;
  long *plVar31;
  _Node *p_Var32;
  mapped_type *this;
  mapped_type *this_00;
  _Base_ptr p_Var33;
  _Base_ptr p_Var34;
  _Rb_tree_node_base *p_Var35;
  size_t sVar36;
  _Result_base *this_01;
  pointer pcVar37;
  undefined8 uVar38;
  undefined8 *puVar39;
  long lVar40;
  size_type *psVar41;
  string *psVar42;
  TypeDef *extraout_RDX;
  TypeDef *extraout_RDX_00;
  undefined8 extraout_RDX_01;
  TypeDef *extraout_RDX_02;
  TypeDef *extraout_RDX_03;
  TypeDef *extraout_RDX_04;
  TypeDef *extraout_RDX_05;
  TypeDef *extraout_RDX_06;
  TypeDef *extraout_RDX_07;
  TypeDef *extraout_RDX_08;
  TypeDef *extraout_RDX_09;
  TypeDef *extraout_RDX_10;
  TypeDef *extraout_RDX_11;
  TypeDef *extraout_RDX_12;
  TypeDef *extraout_RDX_13;
  TypeDef *pTVar43;
  TypeDef *type_00;
  TypeDef *extraout_RDX_14;
  TypeDef *extraout_RDX_15;
  TypeDef *extraout_RDX_16;
  TypeDef *extraout_RDX_17;
  TypeDef *extraout_RDX_18;
  TypeDef *extraout_RDX_19;
  TypeDef *extraout_RDX_20;
  TypeDef *extraout_RDX_21;
  TypeDef *extraout_RDX_22;
  TypeDef *extraout_RDX_23;
  TypeDef *extraout_RDX_24;
  TypeDef *extraout_RDX_25;
  TypeDef *extraout_RDX_26;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *include;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar44;
  writer *this_02;
  TypeDef *type;
  uint32_t uVar45;
  _Alloc_hider _Var46;
  ifstream *includes;
  undefined1 uVar47;
  anon_class_1_0_00000001 *in_R8;
  anon_class_1_0_00000001 *in_R9;
  _State_baseV2 *__tmp;
  size_t *this_03;
  pointer pcVar48;
  _Rb_tree_color row;
  TypeDef *type_2;
  pointer type_01;
  pointer ppVar49;
  _List_node_base **pp_Var50;
  size_type sVar51;
  bool bVar52;
  string_view sVar53;
  coded_index<winmd::reader::TypeDefOrRef> cVar54;
  TypeDef TVar55;
  undefined1 auVar56 [16];
  anon_class_8_1_89897ddb *paVar57;
  method_signature *local_6a0;
  string base_type_parameter;
  string license_arg;
  bool local_639;
  get_interfaces_t base_interfaces;
  string_view type_name;
  path output_folder;
  pointer local_5e0;
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>_>_>
  local_5b0;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  vStack_580;
  string base_type_argument;
  string no_module_lock;
  string_view type_namespace;
  string external_requires;
  string_view local_4f0;
  undefined1 local_4e0 [24];
  ifstream template_file;
  namespace_members *pnStack_4c0;
  undefined1 local_4b8 [16];
  undefined1 auStack_4a8 [24];
  size_type local_490;
  undefined1 local_488 [32];
  _Rb_tree_node_base local_468;
  undefined8 local_448;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  avStack_440 [2];
  bool local_400;
  vector<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_> local_3f8;
  vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
  local_3e0 [12];
  vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> classes;
  cache c;
  reader args;
  long *local_1e8;
  anon_class_8_1_89897ddb_conflict1 local_1e0;
  writer ixx;
  task_group group;
  anon_class_8_1_89897ddb local_f8;
  anon_class_8_1_89897ddb local_f0;
  anon_class_8_1_89897ddb local_e8;
  anon_class_8_1_89897ddb local_e0;
  anon_class_8_1_89897ddb local_d8;
  writer w;
  
  ixx.super_writer_base<cppwinrt::writer>.m_second.super__Vector_base<char,_std::allocator<char>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       ixx.super_writer_base<cppwinrt::writer>.m_second.
       super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start;
  writer_base<cppwinrt::writer>::writer_base(&w.super_writer_base<cppwinrt::writer>);
  w.type_namespace._M_dataplus._M_p = (pointer)&w.type_namespace.field_2;
  w.type_namespace._M_string_length = 0;
  w.type_namespace.field_2._M_local_buf[0] = '\0';
  w.depends._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &w.depends._M_t._M_impl.super__Rb_tree_header._M_header;
  w.depends._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  w.depends._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  w.abi_types = false;
  w.delegate_types = false;
  w.param_names = false;
  w.consume_types = false;
  w.async_types = false;
  w.depends._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  w.generic_param_stack.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  w.generic_param_stack.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  w.generic_param_stack.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  w.depends._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       w.depends._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  lVar25 = std::chrono::_V2::system_clock::now();
  reader::reader<int,char**,22ul>(&args,argc,argv,(option (*) [22])options);
  if (args.m_options._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
LAB_0010e9ce:
    uVar38 = __cxa_allocate_exception(1);
    __cxa_throw(uVar38,&usage_exception::typeinfo,0);
  }
  _template_file = (pointer)0x4;
  pnStack_4c0 = (namespace_members *)0x178bfa;
  cVar26 = std::
           _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)&args,(key_type *)&template_file);
  if ((_Rb_tree_header *)cVar26._M_node != &args.m_options._M_t._M_impl.super__Rb_tree_header)
  goto LAB_0010e9ce;
  output_folder._M_pathname._M_dataplus._M_p = (pointer)0x1;
  output_folder._M_pathname._M_string_length =
       (long)"((\\d+)\\.(\\d+)\\.(\\d+)\\.(\\d+))\\+?" + 0x1e;
  cVar27 = std::
           _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)&args,(key_type *)&output_folder);
  if (cVar27._M_node != cVar26._M_node) goto LAB_0010e9ce;
  _template_file = (pointer)0x7;
  pnStack_4c0 = (namespace_members *)0x178dfd;
  cVar27 = std::
           _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)&args,(key_type *)&template_file);
  settings[0xa9] = cVar27._M_node != cVar26._M_node;
  _template_file = (pointer)0x7;
  pnStack_4c0 = (namespace_members *)0x17906e;
  cVar27 = std::
           _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)&args,(key_type *)&template_file);
  settings[0x1d0] = cVar27._M_node != cVar26._M_node;
  output_folder._M_pathname._M_dataplus._M_p = (pointer)0x5;
  output_folder._M_pathname._M_string_length =
       (long)"One or more prefixes to exclude from input" + 0x25;
  reader::files<bool(*)(std::basic_string_view<char,std::char_traits<char>>const&)>
            ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&template_file,&args,(string_view *)&output_folder,
             winmd::reader::database::is_database);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)settings);
  if ((_Base_ptr)local_4b8._0_8_ != (_Base_ptr)0x0) {
    settings._8_4_ = (_Rb_tree_color)pnStack_4c0;
    settings._16_8_ = local_4b8._0_8_;
    settings._24_8_ = local_4b8._8_8_;
    settings._32_8_ = auStack_4a8._0_8_;
    *(_Base_ptr *)(local_4b8._0_8_ + 8) = (_Base_ptr)0x2448d0;
    settings._40_8_ = auStack_4a8._8_8_;
    local_4b8._0_8_ = (_Base_ptr)0x0;
    auStack_4a8._8_8_ = (cache *)0x0;
    local_4b8._8_8_ = (namespace_members *)&pnStack_4c0;
    auStack_4a8._0_8_ = (namespace_members *)&pnStack_4c0;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&template_file);
  output_folder._M_pathname._M_dataplus._M_p = (pointer)0x9;
  output_folder._M_pathname._M_string_length = (long)"invalid back reference" + 0xd;
  reader::files<bool(*)(std::basic_string_view<char,std::char_traits<char>>const&)>
            ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&template_file,&args,(string_view *)&output_folder,
             winmd::reader::database::is_database);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)(settings + 0x30));
  if ((_Base_ptr)local_4b8._0_8_ != (_Base_ptr)0x0) {
    settings._56_4_ = (_Rb_tree_color)pnStack_4c0;
    settings._64_8_ = local_4b8._0_8_;
    settings._72_8_ = local_4b8._8_8_;
    settings._80_8_ = auStack_4a8._0_8_;
    *(_Base_ptr *)(local_4b8._0_8_ + 8) = (_Base_ptr)0x244900;
    settings._88_8_ = auStack_4a8._8_8_;
    local_4b8._0_8_ = (_Base_ptr)0x0;
    auStack_4a8._8_8_ = (cache *)0x0;
    local_4b8._8_8_ = (namespace_members *)&pnStack_4c0;
    auStack_4a8._0_8_ = (namespace_members *)&pnStack_4c0;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&template_file);
  _template_file = (pointer)0x9;
  pnStack_4c0 = (namespace_members *)0x178d7f;
  cVar27 = std::
           _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)&args,(key_type *)&template_file);
  settings[0xaa] = cVar27._M_node != cVar26._M_node;
  _template_file = (pointer)0x4;
  pnStack_4c0 = (namespace_members *)0x178f68;
  cVar27 = std::
           _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)&args,(key_type *)&template_file);
  settings[0x80] = cVar27._M_node != cVar26._M_node;
  _template_file = (pointer)0x7;
  pnStack_4c0 = (namespace_members *)0x179031;
  cVar27 = std::
           _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)&args,(key_type *)&template_file);
  settings[0x81] = cVar27._M_node != cVar26._M_node;
  _template_file = (pointer)0x8;
  pnStack_4c0 = (namespace_members *)0x179065;
  cVar27 = std::
           _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)&args,(key_type *)&template_file);
  settings[0xa8] = cVar27._M_node != cVar26._M_node;
  license_arg._M_dataplus._M_p = (pointer)0x6;
  license_arg._M_string_length = (size_type)anon_var_dwarf_b780a;
  base_type_parameter._M_string_length = (size_type)".";
  base_type_parameter._M_dataplus._M_p = (pointer)0x1;
  reader::value_abi_cxx11_
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&template_file,
             &args,(string_view *)&license_arg,(string_view *)&base_type_parameter);
  std::filesystem::__cxx11::path::path(&output_folder,(string_type *)&template_file,auto_format);
  if (_template_file != local_4b8) {
    operator_delete(_template_file,(ulong)(local_4b8._0_8_ + 1));
  }
  std::filesystem::__cxx11::path::path<char[11],std::filesystem::__cxx11::path>
            ((path *)&ixx,(char (*) [11])"winrt/impl",auto_format);
  std::filesystem::__cxx11::operator/((path *)&template_file,&output_folder,(path *)&ixx);
  std::filesystem::create_directories((path *)&template_file);
  std::filesystem::__cxx11::path::~path((path *)&template_file);
  std::filesystem::__cxx11::path::~path((path *)&ixx);
  std::filesystem::canonical((path *)&template_file);
  ppcVar30 = &ixx.super_writer_base<cppwinrt::writer>.m_second.
              super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage;
  ixx.super_writer_base<cppwinrt::writer>.m_second.super__Vector_base<char,_std::allocator<char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)ppcVar30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&ixx,_template_file,_template_file + (long)&pnStack_4c0->types);
  std::__cxx11::string::operator=((string *)(settings + 0x60),(string *)&ixx);
  if ((pointer *)
      ixx.super_writer_base<cppwinrt::writer>.m_second.
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start !=
      ppcVar30) {
    operator_delete(ixx.super_writer_base<cppwinrt::writer>.m_second.
                    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                    _M_start,(ulong)(ixx.super_writer_base<cppwinrt::writer>.m_second.
                                     super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage + 1));
  }
  local_4e0._16_8_ = argv;
  std::filesystem::__cxx11::path::~path((path *)&template_file);
  std::__cxx11::string::push_back('(');
  _template_file = (pointer)0x7;
  pnStack_4c0 = (namespace_members *)0x178efb;
  pvVar28 = reader::values_abi_cxx11_(&args,(string_view *)&template_file);
  pbVar7 = (pvVar28->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar44 = (pvVar28->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; pbVar44 != pbVar7;
      pbVar44 = pbVar44 + 1) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)(settings + 0x140),pbVar44);
  }
  _template_file = (pointer)0x6;
  pnStack_4c0 = (namespace_members *)0x17902a;
  pvVar28 = reader::values_abi_cxx11_(&args,(string_view *)&template_file);
  pbVar7 = (pvVar28->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar44 = (pvVar28->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; pbVar44 != pbVar7;
      pbVar44 = pbVar44 + 1) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)(settings + 0x140),pbVar44);
  }
  _template_file = (pointer)0x7;
  pnStack_4c0 = (namespace_members *)0x178f35;
  pvVar28 = reader::values_abi_cxx11_(&args,(string_view *)&template_file);
  pbVar7 = (pvVar28->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar44 = (pvVar28->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; pbVar44 != pbVar7;
      pbVar44 = pbVar44 + 1) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)(settings + 0x170),pbVar44);
  }
  if (settings[0x81] != '\0') {
    _template_file = (pointer)0x7;
    pnStack_4c0 = (namespace_members *)0x179031;
    ixx.super_writer_base<cppwinrt::writer>.m_second.super__Vector_base<char,_std::allocator<char>_>
    ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0);
    reader::value_abi_cxx11_(&license_arg,&args,(string_view *)&template_file,(string_view *)&ixx);
    if (license_arg._M_string_length == 0) {
      in_R8 = (anon_class_1_0_00000001 *)0x60;
      std::__cxx11::string::_M_replace(0x244950,0,(char *)settings._144_8_,0x179149);
    }
    else {
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                ((path *)&ixx,&license_arg,auto_format);
      std::filesystem::absolute((path *)&c);
      std::ifstream::ifstream
                ((istream *)&template_file,
                 (char *)c.m_databases.
                         super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>
                         ._M_impl._M_node.super__List_node_base._M_next,_S_in);
      std::filesystem::__cxx11::path::~path((path *)&c);
      if ((auStack_4a8[*(long *)(_template_file + -0x18)] & 5) != 0) {
        base_type_parameter._M_dataplus._M_p = (pointer)&base_type_parameter.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&base_type_parameter,"Cannot read license template file \'","");
        std::filesystem::absolute((path *)&c);
        no_module_lock._M_dataplus._M_p = (pointer)&no_module_lock.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&no_module_lock,
                   c.m_databases.
                   super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>
                   ._M_impl._M_node.super__List_node_base._M_next,
                   (long)&(c.m_databases.
                           super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>
                           ._M_impl._M_node.super__List_node_base._M_next)->_M_next +
                   (long)&(c.m_databases.
                           super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>
                           ._M_impl._M_node.super__List_node_base._M_prev)->_M_next);
        plVar31 = (long *)std::__cxx11::string::append((char *)&no_module_lock);
        base_type_argument._M_dataplus._M_p = (pointer)*plVar31;
        psVar41 = (size_type *)(plVar31 + 2);
        if ((size_type *)base_type_argument._M_dataplus._M_p == psVar41) {
          base_type_argument.field_2._M_allocated_capacity = *psVar41;
          base_type_argument.field_2._8_8_ = plVar31[3];
          base_type_argument._M_dataplus._M_p = (pointer)&base_type_argument.field_2;
        }
        else {
          base_type_argument.field_2._M_allocated_capacity = *psVar41;
        }
        base_type_argument._M_string_length = plVar31[1];
        *plVar31 = (long)psVar41;
        plVar31[1] = 0;
        *(undefined1 *)(plVar31 + 2) = 0;
        throw_invalid<std::__cxx11::string>(&base_type_parameter,&base_type_argument);
      }
      c.m_databases.
      super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>._M_impl.
      _M_node.super__List_node_base._M_next =
           (_List_node_base *)
           &c.m_databases.
            super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>.
            _M_impl._M_node._M_size;
      c.m_databases.
      super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>._M_impl.
      _M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
      c.m_databases.
      super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>._M_impl.
      _M_node._M_size =
           c.m_databases.
           super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>.
           _M_impl._M_node._M_size & 0xffffffffffffff00;
      while( true ) {
        cVar20 = std::ios::widen((char)*(undefined8 *)(_template_file + -0x18) +
                                 (char)(istream *)&template_file);
        piVar29 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)&template_file,(string *)&c,cVar20);
        if (((byte)piVar29[*(long *)(*(long *)piVar29 + -0x18) + 0x20] & 5) != 0) break;
        if (c.m_databases.
            super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>.
            _M_impl._M_node.super__List_node_base._M_prev != (_List_node_base *)0x0) {
          std::__cxx11::string::append(settings + 0x88);
          std::__cxx11::string::_M_append
                    (settings + 0x88,
                     (ulong)c.m_databases.
                            super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>
                            ._M_impl._M_node.super__List_node_base._M_next);
        }
        std::__cxx11::string::append(settings + 0x88);
      }
      if (c.m_databases.
          super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>.
          _M_impl._M_node.super__List_node_base._M_next !=
          (_List_node_base *)
          &c.m_databases.
           super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>.
           _M_impl._M_node._M_size) {
        operator_delete(c.m_databases.
                        super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>
                        ._M_impl._M_node.super__List_node_base._M_next,
                        c.m_databases.
                        super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>
                        ._M_impl._M_node._M_size + 1);
      }
      std::ifstream::~ifstream(&template_file);
      std::filesystem::__cxx11::path::~path((path *)&ixx);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)license_arg._M_dataplus._M_p != &license_arg.field_2) {
      operator_delete(license_arg._M_dataplus._M_p,license_arg.field_2._M_allocated_capacity + 1);
    }
  }
  if (settings[0xaa] != '\x01') goto LAB_0010ac19;
  _template_file = (pointer)0x9;
  pnStack_4c0 = (namespace_members *)0x178e28;
  cVar27 = std::
           _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)&args,(key_type *)&template_file);
  settings[0x111] = cVar27._M_node != cVar26._M_node;
  ixx.super_writer_base<cppwinrt::writer>.m_second.super__Vector_base<char,_std::allocator<char>_>.
  _M_impl.super__Vector_impl_data._M_finish = "name";
  ixx.super_writer_base<cppwinrt::writer>.m_second.super__Vector_base<char,_std::allocator<char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x4;
  c.m_databases.super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  c.m_databases.super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  reader::value_abi_cxx11_
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&template_file,
             &args,(string_view *)&ixx,(string_view *)&c);
  std::__cxx11::string::operator=((string *)(settings + 0xd0),(string *)&template_file);
  if (_template_file != local_4b8) {
    operator_delete(_template_file,(ulong)(local_4b8._0_8_ + 1));
  }
  if (settings._216_8_ == 0) {
    _template_file = (pointer)0x5;
    pnStack_4c0 = (namespace_members *)0x178f62;
    pvVar28 = reader::values_abi_cxx11_(&args,(string_view *)&template_file);
    pbVar44 = (pvVar28->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (pbVar44 !=
        (pvVar28->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      this_02 = &ixx;
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                ((path *)this_02,pbVar44,auto_format);
      if (ixx.super_writer_base<cppwinrt::writer>.m_second.
          super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
          == (pointer)0x0) {
LAB_0010a880:
        std::filesystem::__cxx11::path::path((path *)&template_file);
      }
      else {
        if ((~(byte)ixx.super_writer_base<cppwinrt::writer>.m_first.
                    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                    _M_finish & 3) != 0) {
          if ((((ulong)ixx.super_writer_base<cppwinrt::writer>.m_first.
                       super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish & 3) == 0) &&
             ((ixx.super_writer_base<cppwinrt::writer>.m_second.
               super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start + -1)
              [(long)ixx.super_writer_base<cppwinrt::writer>.m_second.
                     super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                     ._M_finish] != '/')) {
            uVar24 = (uint)((ulong)ixx.super_writer_base<cppwinrt::writer>.m_first.
                                   super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_finish & 3);
            if (((ulong)ixx.super_writer_base<cppwinrt::writer>.m_first.
                        super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish & 3) == 0) {
              lVar40 = std::filesystem::__cxx11::path::_List::end();
              this_02 = (writer *)(lVar40 + -0x30);
              ppcVar30 = (pointer *)(lVar40 + -0x10);
              if (((ulong)ixx.super_writer_base<cppwinrt::writer>.m_first.
                          super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish & 3) != 0) {
                ppcVar30 = &ixx.super_writer_base<cppwinrt::writer>.m_first.
                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                this_02 = &ixx;
              }
              uVar24 = (uint)*ppcVar30 & 3;
            }
            else {
              this_02 = &ixx;
            }
            if (uVar24 == 3) goto LAB_0010a86e;
          }
          goto LAB_0010a880;
        }
LAB_0010a86e:
        std::filesystem::__cxx11::path::path((path *)&template_file,(path *)this_02);
      }
      std::filesystem::__cxx11::path::path((path *)&c);
      plVar31 = (long *)std::filesystem::__cxx11::path::replace_extension((path *)&template_file);
      license_arg._M_dataplus._M_p = (pointer)&license_arg.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&license_arg,*plVar31,plVar31[1] + *plVar31);
      std::__cxx11::string::operator=((string *)(settings + 0xd0),(string *)&license_arg);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)license_arg._M_dataplus._M_p != &license_arg.field_2) {
        operator_delete(license_arg._M_dataplus._M_p,license_arg.field_2._M_allocated_capacity + 1);
      }
      std::filesystem::__cxx11::path::~path((path *)&c);
      std::filesystem::__cxx11::path::~path((path *)&template_file);
      std::filesystem::__cxx11::path::~path((path *)&ixx);
    }
  }
  ixx.super_writer_base<cppwinrt::writer>.m_second.super__Vector_base<char,_std::allocator<char>_>.
  _M_impl.super__Vector_impl_data._M_finish = "pch";
  ixx.super_writer_base<cppwinrt::writer>.m_second.super__Vector_base<char,_std::allocator<char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x3;
  c.m_databases.super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x5;
  c.m_databases.super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)anon_var_dwarf_b7b29;
  reader::value_abi_cxx11_
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&template_file,
             &args,(string_view *)&ixx,(string_view *)&c);
  std::__cxx11::string::operator=((string *)(settings + 0xf0),(string *)&template_file);
  if (_template_file != local_4b8) {
    operator_delete(_template_file,(ulong)(local_4b8._0_8_ + 1));
  }
  _template_file = (pointer)0x6;
  pnStack_4c0 = (namespace_members *)0x178e56;
  cVar27 = std::
           _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)&args,(key_type *)&template_file);
  settings[0x110] = cVar27._M_node != cVar26._M_node;
  ixx.super_writer_base<cppwinrt::writer>.m_second.super__Vector_base<char,_std::allocator<char>_>.
  _M_impl.super__Vector_impl_data._M_finish = "library";
  ixx.super_writer_base<cppwinrt::writer>.m_second.super__Vector_base<char,_std::allocator<char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x7;
  c.m_databases.super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x5;
  c.m_databases.super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)anon_var_dwarf_b7b35;
  reader::value_abi_cxx11_
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&template_file,
             &args,(string_view *)&ixx,(string_view *)&c);
  std::__cxx11::string::operator=((string *)(settings + 0x118),(string *)&template_file);
  if (_template_file != local_4b8) {
    operator_delete(_template_file,(ulong)(local_4b8._0_8_ + 1));
  }
  _template_file = (pointer)0x8;
  pnStack_4c0 = (namespace_members *)0x178f8d;
  cVar27 = std::
           _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)&args,(key_type *)&template_file);
  settings[0x138] = cVar27._M_node != cVar26._M_node;
  _template_file = (pointer)0xf;
  pnStack_4c0 = (namespace_members *)0x179076;
  cVar27 = std::
           _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)&args,(key_type *)&template_file);
  settings[0x139] = cVar27._M_node != cVar26._M_node;
  iVar23 = std::__cxx11::string::compare(settings + 0xf0);
  if (iVar23 == 0) {
    settings._248_8_ = 0;
    *(undefined1 *)settings._240_8_ = 0;
  }
  _template_file = (pointer)0x9;
  pnStack_4c0 = (namespace_members *)0x178d7f;
  ixx.super_writer_base<cppwinrt::writer>.m_second.super__Vector_base<char,_std::allocator<char>_>.
  _M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0);
  reader::value_abi_cxx11_
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c,&args,
             (string_view *)&template_file,(string_view *)&ixx);
  if (c.m_databases.
      super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>._M_impl.
      _M_node.super__List_node_base._M_prev != (_List_node_base *)0x0) {
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)&template_file,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c,auto_format);
    std::filesystem::create_directories((path *)&template_file);
    std::filesystem::__cxx11::path::~path((path *)&template_file);
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)&ixx,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c,
               auto_format);
    std::filesystem::canonical((path *)&template_file);
    license_arg._M_dataplus._M_p = (pointer)&license_arg.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&license_arg,_template_file,_template_file + (long)&pnStack_4c0->types);
    std::__cxx11::string::operator=((string *)(settings + 0xb0),(string *)&license_arg);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)license_arg._M_dataplus._M_p != &license_arg.field_2) {
      operator_delete(license_arg._M_dataplus._M_p,license_arg.field_2._M_allocated_capacity + 1);
    }
    std::filesystem::__cxx11::path::~path((path *)&template_file);
    std::filesystem::__cxx11::path::~path((path *)&ixx);
    std::__cxx11::string::push_back('x');
  }
  if (c.m_databases.
      super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>._M_impl.
      _M_node.super__List_node_base._M_next !=
      (_List_node_base *)
      &c.m_databases.
       super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>._M_impl.
       _M_node._M_size) {
    operator_delete(c.m_databases.
                    super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>
                    ._M_impl._M_node.super__List_node_base._M_next,
                    c.m_databases.
                    super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>
                    ._M_impl._M_node._M_size + 1);
  }
LAB_0010ac19:
  std::filesystem::__cxx11::path::~path(&output_folder);
  _template_file = (pointer)0x0;
  pnStack_4c0 = (namespace_members *)0x0;
  local_4b8._0_8_ = (cache *)0x0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<std::_Rb_tree_const_iterator<std::__cxx11::string>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&template_file,0,
             settings._24_8_,0x2448d0);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<std::_Rb_tree_const_iterator<std::__cxx11::string>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&template_file,
             pnStack_4c0,settings._72_8_,0x244900);
  pnVar18 = pnStack_4c0;
  c.m_databases.super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&c;
  c.m_databases.super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>.
  _M_impl._M_node._M_size = 0;
  c.m_namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c.m_namespaces._M_t._M_impl.super__Rb_tree_header._M_header;
  c.m_namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c.m_namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c.m_namespaces._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c.m_nested_types._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c.m_nested_types._M_t._M_impl.super__Rb_tree_header._M_header;
  c.m_nested_types._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c.m_nested_types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c.m_nested_types._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c.m_databases.super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>.
  _M_impl._M_node.super__List_node_base._M_prev =
       c.m_databases.
       super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>._M_impl.
       _M_node.super__List_node_base._M_next;
  c.m_namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c.m_namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  c.m_nested_types._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c.m_nested_types._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((namespace_members *)_template_file != pnStack_4c0) {
    _Var46._M_p = _template_file;
    do {
      output_folder._M_pathname._M_dataplus._M_p = (pointer)&c;
      p_Var32 = std::__cxx11::list<winmd::reader::database,std::allocator<winmd::reader::database>>
                ::_M_create_node<std::__cxx11::string_const&,winmd::reader::cache*>
                          ((list<winmd::reader::database,std::allocator<winmd::reader::database>> *)
                           output_folder._M_pathname._M_dataplus._M_p,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           _Var46._M_p,(cache **)&output_folder);
      std::__detail::_List_node_base::_M_hook(&p_Var32->super__List_node_base);
      p_Var9 = c.m_databases.
               super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>.
               _M_impl._M_node.super__List_node_base._M_prev;
      c.m_databases.
      super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>._M_impl.
      _M_node._M_size =
           c.m_databases.
           super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>.
           _M_impl._M_node._M_size + 1;
      pp_Var50 = &c.m_databases.
                  super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>
                  ._M_impl._M_node.super__List_node_base._M_prev[8]._M_prev;
      output_folder._M_pathname._M_string_length =
           output_folder._M_pathname._M_string_length & 0xffffffff00000000;
      uVar5 = *(uint32_t *)
               &c.m_databases.
                super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>.
                _M_impl._M_node.super__List_node_base._M_prev[9]._M_prev;
      output_folder._M_pathname._M_dataplus._M_p = (pointer)pp_Var50;
      if (uVar5 != 0) {
        uVar45 = 0;
        do {
          uVar24 = winmd::reader::table_base::get_value<unsigned_int>
                             ((table_base *)output_folder._M_pathname._M_dataplus._M_p,uVar45,0);
          if (uVar24 != 0) {
            uVar24 = winmd::reader::table_base::get_value<unsigned_int>
                               ((table_base *)output_folder._M_pathname._M_dataplus._M_p,
                                (uint32_t)output_folder._M_pathname._M_string_length,0);
            if ((uVar24 & 6) == 0) {
              uVar24 = winmd::reader::table_base::get_value<unsigned_int>
                                 ((table_base *)output_folder._M_pathname._M_dataplus._M_p,
                                  (uint32_t)output_folder._M_pathname._M_string_length,0);
              if ((uVar24 >> 0xe & 1) != 0) {
                pdVar8 = *(database **)output_folder._M_pathname._M_dataplus._M_p;
                uVar24 = winmd::reader::table_base::get_value<unsigned_int>
                                   ((table_base *)output_folder._M_pathname._M_dataplus._M_p,
                                    (uint32_t)output_folder._M_pathname._M_string_length,2);
                ixx.super_writer_base<cppwinrt::writer>.m_second.
                super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                _0_16_ = winmd::reader::database::get_string(pdVar8,uVar24);
                this = std::
                       map<std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members>_>_>
                       ::operator[](&c.m_namespaces,(key_type *)&ixx);
                pdVar8 = *(database **)output_folder._M_pathname._M_dataplus._M_p;
                uVar24 = winmd::reader::table_base::get_value<unsigned_int>
                                   ((table_base *)output_folder._M_pathname._M_dataplus._M_p,
                                    (uint32_t)output_folder._M_pathname._M_string_length,1);
                ixx.super_writer_base<cppwinrt::writer>.m_second.
                super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                _0_16_ = winmd::reader::database::get_string(pdVar8,uVar24);
                std::
                map<std::basic_string_view<char,std::char_traits<char>>,winmd::reader::TypeDef,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,winmd::reader::TypeDef>>>
                ::try_emplace<winmd::reader::TypeDef_const&>
                          ((map<std::basic_string_view<char,std::char_traits<char>>,winmd::reader::TypeDef,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,winmd::reader::TypeDef>>>
                            *)this,(key_type *)&ixx,(TypeDef *)&output_folder);
              }
            }
          }
          uVar45 = (uint32_t)output_folder._M_pathname._M_string_length + 1;
          output_folder._M_pathname._M_string_length =
               CONCAT44(output_folder._M_pathname._M_string_length._4_4_,uVar45);
        } while (uVar45 != uVar5 ||
                 (_List_node_base **)output_folder._M_pathname._M_dataplus._M_p != pp_Var50);
      }
      uVar5 = *(uint32_t *)&p_Var9[0x59]._M_prev;
      if (uVar5 != 0) {
        pp_Var50 = &p_Var9[0x58]._M_prev;
        uVar45 = 0;
        do {
          p_Var9 = *pp_Var50;
          uVar24 = winmd::reader::table_base::get_value<unsigned_int>
                             ((table_base *)pp_Var50,uVar45,1);
          output_folder._M_pathname._M_dataplus._M_p = (pointer)&p_Var9[7]._M_prev;
          output_folder._M_pathname._M_string_length =
               CONCAT44(output_folder._M_pathname._M_string_length._4_4_,uVar24 - 1);
          this_00 = std::
                    map<winmd::reader::TypeDef,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>,_std::less<winmd::reader::TypeDef>,_std::allocator<std::pair<const_winmd::reader::TypeDef,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>_>_>
                    ::operator[](&c.m_nested_types,(key_type *)&output_folder);
          p_Var9 = *pp_Var50;
          uVar24 = winmd::reader::table_base::get_value<unsigned_int>
                             ((table_base *)pp_Var50,uVar45,0);
          ixx.super_writer_base<cppwinrt::writer>.m_second.
          super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish.
          _0_4_ = uVar24 - 1;
          ixx.super_writer_base<cppwinrt::writer>.m_second.
          super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
               (pointer)&p_Var9[7]._M_prev;
          __position._M_current =
               (this_00->
               super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this_00->
              super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::
            _M_realloc_insert<winmd::reader::TypeDef>(this_00,__position,(TypeDef *)&ixx);
          }
          else {
            ((__position._M_current)->super_row_base<winmd::reader::TypeDef>).m_table =
                 (table_base *)&p_Var9[7]._M_prev;
            *(pointer *)&((__position._M_current)->super_row_base<winmd::reader::TypeDef>).m_index =
                 ixx.super_writer_base<cppwinrt::writer>.m_second.
                 super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
            ppTVar1 = &(this_00->
                       super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppTVar1 = *ppTVar1 + 1;
          }
          uVar45 = uVar45 + 1;
        } while (uVar5 != uVar45);
      }
      _Var46._M_p = _Var46._M_p + 0x20;
    } while ((namespace_members *)_Var46._M_p != pnVar18);
    if ((_Rb_tree_header *)c.m_namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
        &c.m_namespaces._M_t._M_impl.super__Rb_tree_header) {
      p_Var34 = c.m_namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        p_Var33 = p_Var34[2]._M_parent;
        if (p_Var33 != (_Base_ptr)&p_Var34[1]._M_right) {
          do {
            winmd::reader::cache::add_type_to_members
                      (&c,(TypeDef *)&p_Var33[1]._M_left,(namespace_members *)&p_Var34[1]._M_left);
            p_Var33 = (_Base_ptr)std::_Rb_tree_increment(p_Var33);
          } while (p_Var33 != (_Base_ptr)&p_Var34[1]._M_right);
        }
        p_Var34 = (_Base_ptr)std::_Rb_tree_increment(p_Var34);
      } while ((_Rb_tree_header *)p_Var34 != &c.m_namespaces._M_t._M_impl.super__Rb_tree_header);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&template_file);
  _template_file = (pointer)0x12;
  pnStack_4c0 = (namespace_members *)0x176e32;
  output_folder._M_pathname._M_dataplus._M_p = (pointer)0x8;
  output_folder._M_pathname._M_string_length = (long)"Windows.Foundation.DateTime" + 0x13;
  winmd::reader::cache::remove_type(&c,(string_view *)&template_file,(string_view *)&output_folder);
  _template_file = (pointer)0x12;
  pnStack_4c0 = (namespace_members *)0x176e32;
  output_folder._M_pathname._M_dataplus._M_p = (pointer)0x16;
  output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_b4772;
  winmd::reader::cache::remove_type(&c,(string_view *)&template_file,(string_view *)&output_folder);
  _template_file = (pointer)0x12;
  pnStack_4c0 = (namespace_members *)0x176e32;
  output_folder._M_pathname._M_dataplus._M_p = (pointer)0x7;
  output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_b47b2;
  winmd::reader::cache::remove_type(&c,(string_view *)&template_file,(string_view *)&output_folder);
  _template_file = (pointer)0x12;
  pnStack_4c0 = (namespace_members *)0x176e32;
  output_folder._M_pathname._M_dataplus._M_p = (pointer)0x5;
  output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_b4830;
  winmd::reader::cache::remove_type(&c,(string_view *)&template_file,(string_view *)&output_folder);
  _template_file = (pointer)0x12;
  pnStack_4c0 = (namespace_members *)0x176e32;
  output_folder._M_pathname._M_dataplus._M_p = (pointer)0x4;
  output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_b4856;
  winmd::reader::cache::remove_type(&c,(string_view *)&template_file,(string_view *)&output_folder);
  _template_file = (pointer)0x12;
  pnStack_4c0 = (namespace_members *)0x176e32;
  output_folder._M_pathname._M_dataplus._M_p = (pointer)0x4;
  output_folder._M_pathname._M_string_length = (long)" __%Size" + 4;
  winmd::reader::cache::remove_type(&c,(string_view *)&template_file,(string_view *)&output_folder);
  _template_file = (pointer)0x12;
  pnStack_4c0 = (namespace_members *)0x176e32;
  output_folder._M_pathname._M_dataplus._M_p = (pointer)0x8;
  output_folder._M_pathname._M_string_length = (long)"Windows.Foundation.TimeSpan" + 0x13;
  winmd::reader::cache::remove_type(&c,(string_view *)&template_file,(string_view *)&output_folder);
  _template_file = (pointer)0x1b;
  pnStack_4c0 = (namespace_members *)0x176e6f;
  output_folder._M_pathname._M_dataplus._M_p = (pointer)0x9;
  output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_b4886;
  winmd::reader::cache::remove_type(&c,(string_view *)&template_file,(string_view *)&output_folder);
  _template_file = (pointer)0x1b;
  pnStack_4c0 = (namespace_members *)0x176e6f;
  output_folder._M_pathname._M_dataplus._M_p = (pointer)0x9;
  output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_b48ac;
  winmd::reader::cache::remove_type(&c,(string_view *)&template_file,(string_view *)&output_folder);
  _template_file = (pointer)0x1b;
  pnStack_4c0 = (namespace_members *)0x176e6f;
  output_folder._M_pathname._M_dataplus._M_p = (pointer)0x5;
  output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_b48c4;
  winmd::reader::cache::remove_type(&c,(string_view *)&template_file,(string_view *)&output_folder);
  _template_file = (pointer)0x1b;
  pnStack_4c0 = (namespace_members *)0x176e6f;
  output_folder._M_pathname._M_dataplus._M_p = (pointer)0xa;
  output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_b48dc;
  winmd::reader::cache::remove_type(&c,(string_view *)&template_file,(string_view *)&output_folder);
  _template_file = (pointer)0x1b;
  pnStack_4c0 = (namespace_members *)0x176e6f;
  output_folder._M_pathname._M_dataplus._M_p = (pointer)0x7;
  output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_b4902;
  winmd::reader::cache::remove_type(&c,(string_view *)&template_file,(string_view *)&output_folder);
  _template_file = (pointer)0x1b;
  pnStack_4c0 = (namespace_members *)0x176e6f;
  output_folder._M_pathname._M_dataplus._M_p = (pointer)0x7;
  output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_b4928;
  winmd::reader::cache::remove_type(&c,(string_view *)&template_file,(string_view *)&output_folder);
  _template_file = (pointer)0x1b;
  pnStack_4c0 = (namespace_members *)0x176e6f;
  output_folder._M_pathname._M_dataplus._M_p = (pointer)0x7;
  output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_b4940;
  winmd::reader::cache::remove_type(&c,(string_view *)&template_file,(string_view *)&output_folder);
  if (settings._88_8_ != 0) {
    local_4b8._8_8_ = &pnStack_4c0;
    pnStack_4c0 = (namespace_members *)((ulong)pnStack_4c0 & 0xffffffff00000000);
    local_4b8._0_8_ = (cache *)0x0;
    auStack_4a8._8_8_ = (cache *)0x0;
    auStack_4a8._0_8_ = local_4b8._8_8_;
    if (settings._24_8_ != 0x2448d0) {
      p_Var35 = (_Rb_tree_node_base *)settings._24_8_;
      do {
        output_folder._M_pathname._M_dataplus._M_p = (pointer)&output_folder._M_pathname.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&output_folder,*(long *)(p_Var35 + 1),
                   (long)&(p_Var35[1]._M_parent)->_M_color + *(long *)(p_Var35 + 1));
        sVar14 = output_folder._M_pathname._M_string_length;
        _Var46._M_p = output_folder._M_pathname._M_dataplus._M_p;
        pcVar10 = (cache *)c.m_databases.
                           super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>
                           ._M_impl._M_node.super__List_node_base._M_next;
        while ((pcVar10 != &c &&
               ((*(size_type *)
                  &pcVar10[0xd].m_namespaces._M_t._M_impl.super__Rb_tree_header._M_header != sVar14
                || ((sVar14 != 0 &&
                    (iVar23 = bcmp(*(void **)&pcVar10[0xd].m_namespaces._M_t._M_impl,_Var46._M_p,
                                   sVar14), iVar23 != 0))))))) {
          pcVar10 = (cache *)(pcVar10->m_databases).
                             super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>
                             ._M_impl._M_node.super__List_node_base._M_next;
        }
        _Var6 = pcVar10[1].m_namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
        if (_Var6 != _S_red) {
          this_03 = &pcVar10[1].m_databases.
                     super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>
                     ._M_impl._M_node._M_size;
          row = _S_red;
          do {
            uVar24 = winmd::reader::table_base::get_value<unsigned_int>((table_base *)this_03,row,0)
            ;
            if ((uVar24 >> 0xe & 1) != 0) {
              pdVar8 = (database *)*this_03;
              uVar24 = winmd::reader::table_base::get_value<unsigned_int>
                                 ((table_base *)this_03,row,2);
              sVar53 = winmd::reader::database::get_string(pdVar8,uVar24);
              ixx.super_writer_base<cppwinrt::writer>.m_second.
              super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start = (pointer)&ixx.super_writer_base<cppwinrt::writer>.m_second.
                                   super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&ixx,sVar53._M_str,sVar53._M_str + sVar53._M_len);
              std::__cxx11::string::push_back((char)&ixx);
              pdVar8 = (database *)*this_03;
              uVar24 = winmd::reader::table_base::get_value<unsigned_int>
                                 ((table_base *)this_03,row,1);
              sVar53 = winmd::reader::database::get_string(pdVar8,uVar24);
              std::__cxx11::string::append((char *)&ixx,(ulong)sVar53._M_str);
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&template_file,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ixx);
              if ((pointer *)
                  ixx.super_writer_base<cppwinrt::writer>.m_second.
                  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                  _M_start !=
                  &ixx.super_writer_base<cppwinrt::writer>.m_second.
                   super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                   _M_end_of_storage) {
                operator_delete(ixx.super_writer_base<cppwinrt::writer>.m_second.
                                super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (ulong)(ixx.super_writer_base<cppwinrt::writer>.m_second.
                                        super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage + 1));
              }
            }
            row = row + _S_black;
            _Var46._M_p = output_folder._M_pathname._M_dataplus._M_p;
          } while (_Var6 != row);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var46._M_p != &output_folder._M_pathname.field_2) {
          operator_delete(_Var46._M_p,output_folder._M_pathname.field_2._M_allocated_capacity + 1);
        }
        p_Var35 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var35);
      } while (p_Var35 != (_Rb_tree_node_base *)(settings + 8));
    }
    output_folder._M_pathname.field_2._8_8_ = &output_folder._M_pathname._M_string_length;
    output_folder._M_pathname.field_2._M_allocated_capacity = 0;
    output_folder._M_pathname._M_dataplus._M_p = (pointer)0x0;
    output_folder._M_pathname._M_string_length = 0;
    local_5e0 = (pointer)0x0;
    output_folder._32_8_ = output_folder._M_pathname.field_2._8_8_;
    winmd::reader::filter::
    filter<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              ((filter *)&license_arg,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&template_file,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&output_folder);
    ixx.super_writer_base<cppwinrt::writer>.m_second.super__Vector_base<char,_std::allocator<char>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)settings._432_8_;
    ixx.super_writer_base<cppwinrt::writer>.m_second.super__Vector_base<char,_std::allocator<char>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)settings._424_8_;
    ixx.super_writer_base<cppwinrt::writer>.m_second.super__Vector_base<char,_std::allocator<char>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)settings._416_8_;
    settings._432_8_ = license_arg.field_2._M_allocated_capacity;
    settings._416_8_ = license_arg._M_dataplus._M_p;
    settings._424_8_ = license_arg._M_string_length;
    license_arg._M_dataplus._M_p = (pointer)0x0;
    license_arg._M_string_length = 0;
    license_arg.field_2._M_allocated_capacity = 0;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               *)&ixx);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               *)&license_arg);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&output_folder);
    includes = (ifstream *)(settings + 0x140);
    if (settings._360_8_ == 0) {
      includes = &template_file;
    }
    winmd::reader::filter::
    filter<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              ((filter *)&ixx,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)includes,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(settings + 0x170));
    output_folder._M_pathname.field_2._M_allocated_capacity = settings._456_8_;
    output_folder._M_pathname._M_string_length = settings._448_8_;
    output_folder._M_pathname._M_dataplus._M_p = (pointer)settings._440_8_;
    settings._456_8_ =
         ixx.super_writer_base<cppwinrt::writer>.m_second.
         super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    settings._440_8_ =
         ixx.super_writer_base<cppwinrt::writer>.m_second.
         super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start;
    settings._448_8_ =
         ixx.super_writer_base<cppwinrt::writer>.m_second.
         super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish;
    ixx.super_writer_base<cppwinrt::writer>.m_second.super__Vector_base<char,_std::allocator<char>_>
    ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0);
    ixx.super_writer_base<cppwinrt::writer>.m_second.super__Vector_base<char,_std::allocator<char>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               *)&output_folder);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               *)&ixx);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&template_file);
  }
  bVar21 = true;
  if (settings[0x80] == '\0') {
    if (settings[0xaa] == '\0') {
      bVar21 = settings._416_8_ == settings._424_8_;
    }
    else {
      bVar21 = false;
    }
  }
  settings[0x80] = bVar21;
  if ((settings[0x1d0] == '\x01') &&
     ((_Rb_tree_header *)c.m_namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &c.m_namespaces._M_t._M_impl.super__Rb_tree_header)) {
    p_Var34 = c.m_namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      p_Var11 = *(_Base_ptr *)(p_Var34 + 4);
      for (p_Var33 = p_Var34[3]._M_right; p_Var33 != p_Var11; p_Var33 = (_Base_ptr)&p_Var33->_M_left
          ) {
        bVar21 = has_fastabi((TypeDef *)p_Var33);
        if (bVar21) {
          cVar54 = get_default_interface((TypeDef *)p_Var33);
          iVar23 = ((uint)(cVar54.super_typed_index<winmd::reader::TypeDefOrRef>.
                           super_index_base<winmd::reader::TypeDefOrRef>._8_8_ >> 2) & 0x3fffffff) -
                   1;
          if (((undefined1  [16])
               cVar54.super_typed_index<winmd::reader::TypeDefOrRef>.
               super_index_base<winmd::reader::TypeDefOrRef> & (undefined1  [16])0x3) ==
              (undefined1  [16])0x0) {
            _template_file =
                 (pointer)&(cVar54.super_typed_index<winmd::reader::TypeDefOrRef>.
                            super_index_base<winmd::reader::TypeDefOrRef>.m_table)->m_database->
                           TypeDef;
            pnStack_4c0 = (namespace_members *)CONCAT44(pnStack_4c0._4_4_,iVar23);
            std::
            map<winmd::reader::TypeDef,winmd::reader::TypeDef,std::less<winmd::reader::TypeDef>,std::allocator<std::pair<winmd::reader::TypeDef_const,winmd::reader::TypeDef>>>
            ::try_emplace<winmd::reader::TypeDef_const&>
                      ((map<winmd::reader::TypeDef,winmd::reader::TypeDef,std::less<winmd::reader::TypeDef>,std::allocator<std::pair<winmd::reader::TypeDef_const,winmd::reader::TypeDef>>>
                        *)(settings + 0x1d8),(key_type *)&template_file,(TypeDef *)p_Var33);
          }
          else {
            output_folder._M_pathname._M_dataplus._M_p =
                 (pointer)(cVar54.super_typed_index<winmd::reader::TypeDefOrRef>.
                           super_index_base<winmd::reader::TypeDefOrRef>.m_table)->m_database;
            output_folder._M_pathname._M_string_length =
                 CONCAT44(output_folder._M_pathname._M_string_length._4_4_,iVar23);
            TVar55 = winmd::reader::find_required((TypeRef *)&output_folder);
            _template_file = (pointer)TVar55.super_row_base<winmd::reader::TypeDef>.m_table;
            pnStack_4c0 = (namespace_members *)
                          CONCAT44(pnStack_4c0._4_4_,
                                   TVar55.super_row_base<winmd::reader::TypeDef>.m_index);
            std::
            map<winmd::reader::TypeDef,winmd::reader::TypeDef,std::less<winmd::reader::TypeDef>,std::allocator<std::pair<winmd::reader::TypeDef_const,winmd::reader::TypeDef>>>
            ::try_emplace<winmd::reader::TypeDef_const&>
                      ((map<winmd::reader::TypeDef,winmd::reader::TypeDef,std::less<winmd::reader::TypeDef>,std::allocator<std::pair<winmd::reader::TypeDef_const,winmd::reader::TypeDef>>>
                        *)(settings + 0x1d8),(key_type *)&template_file,(TypeDef *)p_Var33);
          }
        }
      }
      p_Var34 = (_Base_ptr)std::_Rb_tree_increment(p_Var34);
    } while ((_Rb_tree_header *)p_Var34 != &c.m_namespaces._M_t._M_impl.super__Rb_tree_header);
  }
  if (settings[0xa9] == '\x01') {
    output_folder._M_pathname._M_dataplus._M_p =
         (pointer)(((_Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)local_4e0._16_8_)->_M_impl).super__Vector_impl_data._M_start;
    _template_file = (pointer)0xa;
    pnStack_4c0 = (namespace_members *)0x178bff;
    writer_base<cppwinrt::writer>::write_segment<char*>
              (&w.super_writer_base<cppwinrt::writer>,(string_view *)&template_file,
               (char **)&output_folder);
    _template_file = (pointer)0xa;
    pnStack_4c0 = (namespace_members *)0x178c0a;
    writer_base<cppwinrt::writer>::write_segment<char[8]>
              (&w.super_writer_base<cppwinrt::writer>,(string_view *)&template_file,
               (char (*) [8])"2.3.4.5");
    if (settings._24_8_ != 0x2448d0) {
      p_Var35 = (_Rb_tree_node_base *)settings._24_8_;
      do {
        _template_file = (pointer)0xa;
        pnStack_4c0 = (namespace_members *)0x178c1d;
        writer_base<cppwinrt::writer>::write_segment<std::__cxx11::string>
                  (&w.super_writer_base<cppwinrt::writer>,(string_view *)&template_file,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (p_Var35 + 1));
        p_Var35 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var35);
      } while (p_Var35 != (_Rb_tree_node_base *)(settings + 8));
    }
    if (settings._72_8_ != 0x244900) {
      p_Var35 = (_Rb_tree_node_base *)settings._72_8_;
      do {
        _template_file = (pointer)0xa;
        pnStack_4c0 = (namespace_members *)0x178c28;
        writer_base<cppwinrt::writer>::write_segment<std::__cxx11::string>
                  (&w.super_writer_base<cppwinrt::writer>,(string_view *)&template_file,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (p_Var35 + 1));
        p_Var35 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var35);
      } while (p_Var35 != (_Rb_tree_node_base *)(settings + 0x38));
    }
    _template_file = (pointer)0xa;
    pnStack_4c0 = (namespace_members *)0x178c33;
    writer_base<cppwinrt::writer>::write_segment<std::__cxx11::string>
              (&w.super_writer_base<cppwinrt::writer>,(string_view *)&template_file,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (settings + 0x60));
    if (settings._184_8_ != 0) {
      _template_file = (pointer)0xa;
      pnStack_4c0 = (namespace_members *)0x178c3e;
      writer_base<cppwinrt::writer>::write_segment<std::__cxx11::string>
                (&w.super_writer_base<cppwinrt::writer>,(string_view *)&template_file,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (settings + 0xb0));
    }
  }
  writer_base<cppwinrt::writer>::flush_to_console(&w.super_writer_base<cppwinrt::writer>,true);
  group.m_tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  group._17_8_ = 0;
  group.m_tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  group.m_tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  group.m_tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  _template_file = (pointer)0xb;
  pnStack_4c0 = (namespace_members *)0x178c49;
  cVar27 = std::
           _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)&args,(key_type *)&template_file);
  group.m_synchronous = cVar27._M_node != cVar26._M_node;
  writer_base<cppwinrt::writer>::writer_base(&ixx.super_writer_base<cppwinrt::writer>);
  ixx.type_namespace._M_dataplus._M_p = (pointer)&ixx.type_namespace.field_2;
  ixx.type_namespace._M_string_length = 0;
  ixx.type_namespace.field_2._M_local_buf[0] = '\0';
  ixx.depends._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &ixx.depends._M_t._M_impl.super__Rb_tree_header._M_header;
  ixx.depends._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  ixx.depends._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  ixx.abi_types = false;
  ixx.delegate_types = false;
  ixx.param_names = false;
  ixx.consume_types = false;
  ixx.async_types = false;
  ixx.depends._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ixx.generic_param_stack.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ixx.generic_param_stack.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ixx.generic_param_stack.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ixx.depends._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       ixx.depends._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  write_preamble(&ixx);
  pvVar2 = &ixx.super_writer_base<cppwinrt::writer>.m_first;
  std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
            ((vector<char,std::allocator<char>> *)pvVar2,
             ixx.super_writer_base<cppwinrt::writer>.m_first.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_finish,"module;\n","");
  sVar36 = strlen(
                 "\n#include <intrin.h>\n#include <algorithm>\n#include <array>\n#include <atomic>\n#include <charconv>\n#include <chrono>\n#include <cstddef>\n#include <cstring>\n#include <iterator>\n#include <map>\n#include <memory>\n#include <optional>\n#include <stdexcept>\n#include <string_view>\n#include <string>\n#include <thread>\n#include <tuple>\n#include <type_traits>\n#include <unordered_map>\n#include <utility>\n#include <vector>\n\n#if __has_include(<version>)\n#include <version>\n#endif\n\n#if __has_include(<windowsnumerics.impl.h>)\n#define WINRT_IMPL_NUMERICS\n#include <directxmath.h>\n#endif\n\n#ifndef WINRT_LEAN_AND_MEAN\n#include <ostream>\n#endif\n\n#ifdef __cpp_lib_format\n#include <format>\n#endif\n\n#ifdef __cpp_lib_source_location\n#include <source_location>\n#endif\n\n#ifdef __cpp_lib_coroutine\n\n#include <coroutine>\n\nnamespace winrt::impl\n{\n    template <typename T = void>\n    using coroutine_handle = std::coroutine_handle<T>;\n\n    using suspend_always = std::suspend_always;\n    using suspend_never = std::suspend_never;\n}\n\n#elif __has_include(<experimental/coroutine>)\n\n#include <experimental/coroutine>\n\nnamespace winrt::impl\n{\n    template <typename T = void>\n    using coroutine_handle = std::experimental::coroutine_handle<T>;\n\n    using suspend_always = std::experimental::suspend_always;\n    using suspend_never = std::experimental::suspend_never;\n}\n\n#else\n#error C++/WinRT requires coroutine support, which is currently missing. Try enabling C++20 in your compiler.\n#endif\n"
                 );
  std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
            ((vector<char,std::allocator<char>> *)pvVar2,
             ixx.super_writer_base<cppwinrt::writer>.m_first.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_finish,
             "\n#include <intrin.h>\n#include <algorithm>\n#include <array>\n#include <atomic>\n#include <charconv>\n#include <chrono>\n#include <cstddef>\n#include <cstring>\n#include <iterator>\n#include <map>\n#include <memory>\n#include <optional>\n#include <stdexcept>\n#include <string_view>\n#include <string>\n#include <thread>\n#include <tuple>\n#include <type_traits>\n#include <unordered_map>\n#include <utility>\n#include <vector>\n\n#if __has_include(<version>)\n#include <version>\n#endif\n\n#if __has_include(<windowsnumerics.impl.h>)\n#define WINRT_IMPL_NUMERICS\n#include <directxmath.h>\n#endif\n\n#ifndef WINRT_LEAN_AND_MEAN\n#include <ostream>\n#endif\n\n#ifdef __cpp_lib_format\n#include <format>\n#endif\n\n#ifdef __cpp_lib_source_location\n#include <source_location>\n#endif\n\n#ifdef __cpp_lib_coroutine\n\n#include <coroutine>\n\nnamespace winrt::impl\n{\n    template <typename T = void>\n    using coroutine_handle = std::coroutine_handle<T>;\n\n    using suspend_always = std::suspend_always;\n    using suspend_never = std::suspend_never;\n}\n\n#elif __has_include(<experimental/coroutine>)\n\n#include <experimental/coroutine>\n\nnamespace winrt::impl\n{\n    template <typename T = void>\n    using coroutine_handle = std::experimental::coroutine_handle<T>;\n\n    using suspend_always = std::experimental::suspend_always;\n    using suspend_never = std::experimental::suspend_never;\n}\n\n#else\n#error C++/WinRT requires coroutine support, which is currently missing. Try enabling C++20 in your compiler.\n#endif\n"
             ,"\n#include <intrin.h>\n#include <algorithm>\n#include <array>\n#include <atomic>\n#include <charconv>\n#include <chrono>\n#include <cstddef>\n#include <cstring>\n#include <iterator>\n#include <map>\n#include <memory>\n#include <optional>\n#include <stdexcept>\n#include <string_view>\n#include <string>\n#include <thread>\n#include <tuple>\n#include <type_traits>\n#include <unordered_map>\n#include <utility>\n#include <vector>\n\n#if __has_include(<version>)\n#include <version>\n#endif\n\n#if __has_include(<windowsnumerics.impl.h>)\n#define WINRT_IMPL_NUMERICS\n#include <directxmath.h>\n#endif\n\n#ifndef WINRT_LEAN_AND_MEAN\n#include <ostream>\n#endif\n\n#ifdef __cpp_lib_format\n#include <format>\n#endif\n\n#ifdef __cpp_lib_source_location\n#include <source_location>\n#endif\n\n#ifdef __cpp_lib_coroutine\n\n#include <coroutine>\n\nnamespace winrt::impl\n{\n    template <typename T = void>\n    using coroutine_handle = std::coroutine_handle<T>;\n\n    using suspend_always = std::suspend_always;\n    using suspend_never = std::suspend_never;\n}\n\n#elif __has_include(<experimental/coroutine>)\n\n#include <experimental/coroutine>\n\nnamespace winrt::impl\n{\n    template <typename T = void>\n    using coroutine_handle = std::experimental::coroutine_handle<T>;\n\n    using suspend_always = std::experimental::suspend_always;\n    using suspend_never = std::experimental::suspend_never;\n}\n\n#else\n#error C++/WinRT requires coroutine support, which is currently missing. Try enabling C++20 in your compiler.\n#endif\n"
              + sVar36);
  std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
            ((vector<char,std::allocator<char>> *)pvVar2,
             ixx.super_writer_base<cppwinrt::writer>.m_first.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_finish,"\nexport module winrt;\n#define WINRT_EXPORT export\n\n","");
  p_Var35 = c.m_namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)c.m_namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &c.m_namespaces._M_t._M_impl.super__Rb_tree_header) {
    do {
      members = &p_Var35[1]._M_left;
      bVar21 = has_projected_types((namespace_members *)members);
      if ((bVar21) &&
         (bVar21 = winmd::reader::filter::includes
                             ((filter *)(settings + 0x1a0),(namespace_members *)members), bVar21)) {
        first = p_Var35 + 1;
        _template_file = (pointer)0x15;
        pnStack_4c0 = (namespace_members *)0x178c92;
        writer_base<cppwinrt::writer>::
        write_segment<std::basic_string_view<char,std::char_traits<char>>>
                  (&ixx.super_writer_base<cppwinrt::writer>,(string_view *)&template_file,
                   (basic_string_view<char,_std::char_traits<char>_> *)first);
        local_4b8._0_8_ = &c;
        _template_file = (pointer)first;
        pnStack_4c0 = (namespace_members *)members;
        if (group.m_synchronous == true) {
          std::
          _Head_base<0UL,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/main.cpp:360:27),_false>
          ::anon_class_24_3_41b5e664_for__M_head_impl::operator()
                    ((anon_class_24_3_41b5e664_for__M_head_impl *)&template_file);
        }
        else {
          output_folder._M_pathname._M_dataplus._M_p = (pointer)0x0;
          output_folder._M_pathname._M_string_length = 0;
          puVar39 = (undefined8 *)operator_new(0x60);
          puVar39[1] = 0x100000001;
          *puVar39 = &PTR___Sp_counted_ptr_inplace_00243738;
          puVar39[3] = 0;
          *(undefined4 *)(puVar39 + 4) = 0;
          *(undefined1 *)((long)puVar39 + 0x24) = 0;
          *(undefined4 *)(puVar39 + 5) = 0;
          puVar39[6] = 0;
          *(undefined4 *)(puVar39 + 7) = 0;
          puVar39[2] = &PTR___Async_state_impl_00243788;
          this_01 = (_Result_base *)operator_new(0x10);
          *(undefined8 *)this_01 = 0;
          *(undefined8 *)(this_01 + 8) = 0;
          std::__future_base::_Result_base::_Result_base(this_01);
          *(undefined ***)this_01 = &PTR__M_destroy_00243cd8;
          puVar39[8] = this_01;
          puVar39[9] = _template_file;
          puVar39[10] = pnStack_4c0;
          puVar39[0xb] = local_4b8._0_8_;
          license_arg._M_dataplus._M_p = (pointer)0x0;
          local_1e8 = (long *)operator_new(0x20);
          *local_1e8 = (long)&PTR___State_002437e0;
          local_1e8[1] = (long)(puVar39 + 2);
          local_1e8[2] = (long)std::__future_base::
                               _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/main.cpp:360:27)>_>,_void>
                               ::_M_run;
          local_1e8[3] = 0;
          std::thread::_M_start_thread(&license_arg,&local_1e8,0);
          if (local_1e8 != (long *)0x0) {
            (**(code **)(*local_1e8 + 8))();
          }
          if (puVar39[6] != 0) {
            std::terminate();
          }
          puVar39[6] = license_arg._M_dataplus._M_p;
          output_folder._M_pathname._M_dataplus._M_p = (pointer)(puVar39 + 2);
          output_folder._M_pathname._M_string_length = (size_type)puVar39;
          std::__basic_future<void>::__basic_future
                    ((__basic_future<void> *)&base_type_parameter,(__state_type *)&output_folder);
          if (output_folder._M_pathname._M_string_length != 0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       output_folder._M_pathname._M_string_length);
          }
          std::vector<std::future<void>,std::allocator<std::future<void>>>::
          emplace_back<std::future<void>>
                    ((vector<std::future<void>,std::allocator<std::future<void>>> *)&group,
                     (future<void> *)&base_type_parameter);
          if (base_type_parameter._M_string_length != 0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       base_type_parameter._M_string_length);
          }
        }
      }
      p_Var35 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var35);
    } while ((_Rb_tree_header *)p_Var35 != &c.m_namespaces._M_t._M_impl.super__Rb_tree_header);
  }
  if (settings[0x80] != '\0') {
    writer_base<cppwinrt::writer>::writer_base((writer_base<cppwinrt::writer> *)&template_file);
    local_490 = 0;
    local_488[0] = false;
    local_468._M_left = &local_468;
    local_468._M_color = _S_red;
    local_468._M_parent = (_Base_ptr)0x0;
    local_488[0x10] = false;
    local_488[0x11] = false;
    local_488[0x12] = false;
    local_488[0x13] = false;
    local_488[0x14] = false;
    local_448 = 0;
    avStack_440[0].
    super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    avStack_440[0].
    super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    avStack_440[0].
    super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    auStack_4a8._16_8_ = local_488;
    local_468._M_right = local_468._M_left;
    write_preamble((writer *)&template_file);
    output_folder._M_pathname._M_dataplus._M_p =
         (pointer)strlen("#define CPPWINRT_VERSION \"%\"\n\n");
    output_folder._M_pathname._M_string_length = (size_type)strings::base_version_odr;
    writer_base<cppwinrt::writer>::write_segment<char[8]>
              ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder,
               (char (*) [8])"2.3.4.5");
    output_folder._M_pathname._M_dataplus._M_p = (pointer)0x4;
    output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_bcd56;
    write_open_file_guard((writer *)&template_file,(string_view *)&output_folder,'\0');
    sVar36 = strlen(
                   "\n#include <intrin.h>\n#include <algorithm>\n#include <array>\n#include <atomic>\n#include <charconv>\n#include <chrono>\n#include <cstddef>\n#include <cstring>\n#include <iterator>\n#include <map>\n#include <memory>\n#include <optional>\n#include <stdexcept>\n#include <string_view>\n#include <string>\n#include <thread>\n#include <tuple>\n#include <type_traits>\n#include <unordered_map>\n#include <utility>\n#include <vector>\n\n#if __has_include(<version>)\n#include <version>\n#endif\n\n#if __has_include(<windowsnumerics.impl.h>)\n#define WINRT_IMPL_NUMERICS\n#include <directxmath.h>\n#endif\n\n#ifndef WINRT_LEAN_AND_MEAN\n#include <ostream>\n#endif\n\n#ifdef __cpp_lib_format\n#include <format>\n#endif\n\n#ifdef __cpp_lib_source_location\n#include <source_location>\n#endif\n\n#ifdef __cpp_lib_coroutine\n\n#include <coroutine>\n\nnamespace winrt::impl\n{\n    template <typename T = void>\n    using coroutine_handle = std::coroutine_handle<T>;\n\n    using suspend_always = std::suspend_always;\n    using suspend_never = std::suspend_never;\n}\n\n#elif __has_include(<experimental/coroutine>)\n\n#include <experimental/coroutine>\n\nnamespace winrt::impl\n{\n    template <typename T = void>\n    using coroutine_handle = std::experimental::coroutine_handle<T>;\n\n    using suspend_always = std::experimental::suspend_always;\n    using suspend_never = std::experimental::suspend_never;\n}\n\n#else\n#error C++/WinRT requires coroutine support, which is currently missing. Try enabling C++20 in your compiler.\n#endif\n"
                   );
    pvVar3 = (vector<char,std::allocator<char>> *)(local_4b8 + 8);
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar3,auStack_4a8._0_8_,
               "\n#include <intrin.h>\n#include <algorithm>\n#include <array>\n#include <atomic>\n#include <charconv>\n#include <chrono>\n#include <cstddef>\n#include <cstring>\n#include <iterator>\n#include <map>\n#include <memory>\n#include <optional>\n#include <stdexcept>\n#include <string_view>\n#include <string>\n#include <thread>\n#include <tuple>\n#include <type_traits>\n#include <unordered_map>\n#include <utility>\n#include <vector>\n\n#if __has_include(<version>)\n#include <version>\n#endif\n\n#if __has_include(<windowsnumerics.impl.h>)\n#define WINRT_IMPL_NUMERICS\n#include <directxmath.h>\n#endif\n\n#ifndef WINRT_LEAN_AND_MEAN\n#include <ostream>\n#endif\n\n#ifdef __cpp_lib_format\n#include <format>\n#endif\n\n#ifdef __cpp_lib_source_location\n#include <source_location>\n#endif\n\n#ifdef __cpp_lib_coroutine\n\n#include <coroutine>\n\nnamespace winrt::impl\n{\n    template <typename T = void>\n    using coroutine_handle = std::coroutine_handle<T>;\n\n    using suspend_always = std::suspend_always;\n    using suspend_never = std::suspend_never;\n}\n\n#elif __has_include(<experimental/coroutine>)\n\n#include <experimental/coroutine>\n\nnamespace winrt::impl\n{\n    template <typename T = void>\n    using coroutine_handle = std::experimental::coroutine_handle<T>;\n\n    using suspend_always = std::experimental::suspend_always;\n    using suspend_never = std::experimental::suspend_never;\n}\n\n#else\n#error C++/WinRT requires coroutine support, which is currently missing. Try enabling C++20 in your compiler.\n#endif\n"
               ,"\n#include <intrin.h>\n#include <algorithm>\n#include <array>\n#include <atomic>\n#include <charconv>\n#include <chrono>\n#include <cstddef>\n#include <cstring>\n#include <iterator>\n#include <map>\n#include <memory>\n#include <optional>\n#include <stdexcept>\n#include <string_view>\n#include <string>\n#include <thread>\n#include <tuple>\n#include <type_traits>\n#include <unordered_map>\n#include <utility>\n#include <vector>\n\n#if __has_include(<version>)\n#include <version>\n#endif\n\n#if __has_include(<windowsnumerics.impl.h>)\n#define WINRT_IMPL_NUMERICS\n#include <directxmath.h>\n#endif\n\n#ifndef WINRT_LEAN_AND_MEAN\n#include <ostream>\n#endif\n\n#ifdef __cpp_lib_format\n#include <format>\n#endif\n\n#ifdef __cpp_lib_source_location\n#include <source_location>\n#endif\n\n#ifdef __cpp_lib_coroutine\n\n#include <coroutine>\n\nnamespace winrt::impl\n{\n    template <typename T = void>\n    using coroutine_handle = std::coroutine_handle<T>;\n\n    using suspend_always = std::suspend_always;\n    using suspend_never = std::suspend_never;\n}\n\n#elif __has_include(<experimental/coroutine>)\n\n#include <experimental/coroutine>\n\nnamespace winrt::impl\n{\n    template <typename T = void>\n    using coroutine_handle = std::experimental::coroutine_handle<T>;\n\n    using suspend_always = std::experimental::suspend_always;\n    using suspend_never = std::experimental::suspend_never;\n}\n\n#else\n#error C++/WinRT requires coroutine support, which is currently missing. Try enabling C++20 in your compiler.\n#endif\n"
                + sVar36);
    sVar36 = strlen(
                   "\n#ifdef _DEBUG\n\n#define WINRT_ASSERT _ASSERTE\n#define WINRT_VERIFY WINRT_ASSERT\n#define WINRT_VERIFY_(result, expression) WINRT_ASSERT(result == expression)\n\n#else\n\n#define WINRT_ASSERT(expression) ((void)0)\n#define WINRT_VERIFY(expression) (void)(expression)\n#define WINRT_VERIFY_(result, expression) (void)(expression)\n\n#endif\n\n#define WINRT_IMPL_SHIM(...) (*(abi_t<__VA_ARGS__>**)&static_cast<__VA_ARGS__ const&>(static_cast<D const&>(*this)))\n\n#ifdef _MSC_VER\n// Note: this is a workaround for a false-positive warning produced by the Visual C++ 15.9 compiler.\n#pragma warning(disable : 5046)\n\n// Note: this is a workaround for a false-positive warning produced by the Visual C++ 16.3 compiler.\n#pragma warning(disable : 4268)\n#endif\n\n#if defined(__cpp_lib_coroutine) || defined(__cpp_coroutines) || defined(_RESUMABLE_FUNCTIONS_SUPPORTED)\n#define WINRT_IMPL_COROUTINES\n#endif\n\n#ifndef WINRT_EXPORT\n#define WINRT_EXPORT\n#endif\n\n#ifdef WINRT_IMPL_NUMERICS\n#define _WINDOWS_NUMERICS_NAMESPACE_ winrt::Windows::Foundation::Numerics\n#define _WINDOWS_NUMERICS_BEGIN_NAMESPACE_ WINRT_EXPORT namespace winrt::Windows::Foundation::Numerics\n#define _WINDOWS_NUMERICS_END_NAMESPACE_\n#include <windowsnumerics.impl.h>\n#undef _WINDOWS_NUMERICS_NAMESPACE_\n#undef _WINDOWS_NUMERICS_BEGIN_NAMESPACE_\n#undef _WINDOWS_NUMERICS_END_NAMESPACE_\n#endif\n\n#if defined(_MSC_VER)\n#define WINRT_IMPL_NOINLINE __declspec(noinline)\n#elif defined(__GNUC__)\n#define WINRT_IMPL_NOINLINE __attribute__((noinline))\n#else\n#define WINRT_IMPL_NOINLINE\n#endif\n\n#if defined(_MSC_VER)\n#define WINRT_IMPL_EMPTY_BASES __declspec(empty_bases)\n#else\n#define WINRT_IMPL_EMPTY_BASES\n#endif\n\n#if defined(_MSC_VER)\n#define WINRT_IMPL_NOVTABLE __declspec(novtable)\n#else\n#define WINRT_IMPL_NOVTABLE\n#endif\n\n#if defined(__clang__)\n#define WINRT_IMPL_HAS_DECLSPEC_UUID __has_declspec_attribute(uuid)\n#elif defined(_MSC_VER)\n#define WINRT_IMPL_HAS_DECLSPEC_UUID 1\n#else\n#define WINRT_IMPL_HAS_DECLSPEC_UUID 0\n#endif\n\n#ifdef __IUnknown_INTERFACE_DEFINED__\n#define WINRT_IMPL_IUNKNOWN_DEFINED\n#els..." /* TRUNCATED STRING LITERAL */
                   );
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar3,auStack_4a8._0_8_,
               "\n#ifdef _DEBUG\n\n#define WINRT_ASSERT _ASSERTE\n#define WINRT_VERIFY WINRT_ASSERT\n#define WINRT_VERIFY_(result, expression) WINRT_ASSERT(result == expression)\n\n#else\n\n#define WINRT_ASSERT(expression) ((void)0)\n#define WINRT_VERIFY(expression) (void)(expression)\n#define WINRT_VERIFY_(result, expression) (void)(expression)\n\n#endif\n\n#define WINRT_IMPL_SHIM(...) (*(abi_t<__VA_ARGS__>**)&static_cast<__VA_ARGS__ const&>(static_cast<D const&>(*this)))\n\n#ifdef _MSC_VER\n// Note: this is a workaround for a false-positive warning produced by the Visual C++ 15.9 compiler.\n#pragma warning(disable : 5046)\n\n// Note: this is a workaround for a false-positive warning produced by the Visual C++ 16.3 compiler.\n#pragma warning(disable : 4268)\n#endif\n\n#if defined(__cpp_lib_coroutine) || defined(__cpp_coroutines) || defined(_RESUMABLE_FUNCTIONS_SUPPORTED)\n#define WINRT_IMPL_COROUTINES\n#endif\n\n#ifndef WINRT_EXPORT\n#define WINRT_EXPORT\n#endif\n\n#ifdef WINRT_IMPL_NUMERICS\n#define _WINDOWS_NUMERICS_NAMESPACE_ winrt::Windows::Foundation::Numerics\n#define _WINDOWS_NUMERICS_BEGIN_NAMESPACE_ WINRT_EXPORT namespace winrt::Windows::Foundation::Numerics\n#define _WINDOWS_NUMERICS_END_NAMESPACE_\n#include <windowsnumerics.impl.h>\n#undef _WINDOWS_NUMERICS_NAMESPACE_\n#undef _WINDOWS_NUMERICS_BEGIN_NAMESPACE_\n#undef _WINDOWS_NUMERICS_END_NAMESPACE_\n#endif\n\n#if defined(_MSC_VER)\n#define WINRT_IMPL_NOINLINE __declspec(noinline)\n#elif defined(__GNUC__)\n#define WINRT_IMPL_NOINLINE __attribute__((noinline))\n#else\n#define WINRT_IMPL_NOINLINE\n#endif\n\n#if defined(_MSC_VER)\n#define WINRT_IMPL_EMPTY_BASES __declspec(empty_bases)\n#else\n#define WINRT_IMPL_EMPTY_BASES\n#endif\n\n#if defined(_MSC_VER)\n#define WINRT_IMPL_NOVTABLE __declspec(novtable)\n#else\n#define WINRT_IMPL_NOVTABLE\n#endif\n\n#if defined(__clang__)\n#define WINRT_IMPL_HAS_DECLSPEC_UUID __has_declspec_attribute(uuid)\n#elif defined(_MSC_VER)\n#define WINRT_IMPL_HAS_DECLSPEC_UUID 1\n#else\n#define WINRT_IMPL_HAS_DECLSPEC_UUID 0\n#endif\n\n#ifdef __IUnknown_INTERFACE_DEFINED__\n#define WINRT_IMPL_IUNKNOWN_DEFINED\n#els..." /* TRUNCATED STRING LITERAL */
               ,"\n#ifdef _DEBUG\n\n#define WINRT_ASSERT _ASSERTE\n#define WINRT_VERIFY WINRT_ASSERT\n#define WINRT_VERIFY_(result, expression) WINRT_ASSERT(result == expression)\n\n#else\n\n#define WINRT_ASSERT(expression) ((void)0)\n#define WINRT_VERIFY(expression) (void)(expression)\n#define WINRT_VERIFY_(result, expression) (void)(expression)\n\n#endif\n\n#define WINRT_IMPL_SHIM(...) (*(abi_t<__VA_ARGS__>**)&static_cast<__VA_ARGS__ const&>(static_cast<D const&>(*this)))\n\n#ifdef _MSC_VER\n// Note: this is a workaround for a false-positive warning produced by the Visual C++ 15.9 compiler.\n#pragma warning(disable : 5046)\n\n// Note: this is a workaround for a false-positive warning produced by the Visual C++ 16.3 compiler.\n#pragma warning(disable : 4268)\n#endif\n\n#if defined(__cpp_lib_coroutine) || defined(__cpp_coroutines) || defined(_RESUMABLE_FUNCTIONS_SUPPORTED)\n#define WINRT_IMPL_COROUTINES\n#endif\n\n#ifndef WINRT_EXPORT\n#define WINRT_EXPORT\n#endif\n\n#ifdef WINRT_IMPL_NUMERICS\n#define _WINDOWS_NUMERICS_NAMESPACE_ winrt::Windows::Foundation::Numerics\n#define _WINDOWS_NUMERICS_BEGIN_NAMESPACE_ WINRT_EXPORT namespace winrt::Windows::Foundation::Numerics\n#define _WINDOWS_NUMERICS_END_NAMESPACE_\n#include <windowsnumerics.impl.h>\n#undef _WINDOWS_NUMERICS_NAMESPACE_\n#undef _WINDOWS_NUMERICS_BEGIN_NAMESPACE_\n#undef _WINDOWS_NUMERICS_END_NAMESPACE_\n#endif\n\n#if defined(_MSC_VER)\n#define WINRT_IMPL_NOINLINE __declspec(noinline)\n#elif defined(__GNUC__)\n#define WINRT_IMPL_NOINLINE __attribute__((noinline))\n#else\n#define WINRT_IMPL_NOINLINE\n#endif\n\n#if defined(_MSC_VER)\n#define WINRT_IMPL_EMPTY_BASES __declspec(empty_bases)\n#else\n#define WINRT_IMPL_EMPTY_BASES\n#endif\n\n#if defined(_MSC_VER)\n#define WINRT_IMPL_NOVTABLE __declspec(novtable)\n#else\n#define WINRT_IMPL_NOVTABLE\n#endif\n\n#if defined(__clang__)\n#define WINRT_IMPL_HAS_DECLSPEC_UUID __has_declspec_attribute(uuid)\n#elif defined(_MSC_VER)\n#define WINRT_IMPL_HAS_DECLSPEC_UUID 1\n#else\n#define WINRT_IMPL_HAS_DECLSPEC_UUID 0\n#endif\n\n#ifdef __IUnknown_INTERFACE_DEFINED__\n#define WINRT_IMPL_IUNKNOWN_DEFINED\n#els..." /* TRUNCATED STRING LITERAL */
                + sVar36);
    sVar36 = strlen(
                   "\nnamespace winrt::impl\n{\n    using ptp_io = struct tp_io*;\n    using ptp_timer = struct tp_timer*;\n    using ptp_wait = struct tp_wait*;\n    using ptp_pool = struct tp_pool*;\n    using srwlock = struct srwlock_*;\n    using condition_variable = struct condition_variable_*;\n    using bstr = wchar_t*;\n\n    using filetime_period = std::ratio_multiply<std::ratio<100>, std::nano>;\n    struct IAgileObject;\n\n    struct com_callback_args\n    {\n        uint32_t reserved1;\n        uint32_t reserved2;\n        void* data;\n    };\n\n    template <typename T>\n    constexpr uint8_t hex_to_uint(T const c)\n    {\n        if (c >= \'0\' && c <= \'9\')\n        {\n            return static_cast<uint8_t>(c - \'0\');\n        }\n        else if (c >= \'A\' && c <= \'F\')\n        {\n            return static_cast<uint8_t>(10 + c - \'A\');\n        }\n        else if (c >= \'a\' && c <= \'f\')\n        {\n            return static_cast<uint8_t>(10 + c - \'a\');\n        }\n        else \n        {\n            throw std::invalid_argument(\"Character is not a hexadecimal digit\");\n        }\n    }\n\n    template <typename T>\n    constexpr uint8_t hex_to_uint8(T const a, T const b)\n    {\n        return (hex_to_uint(a) << 4) | hex_to_uint(b);\n    }\n\n    constexpr uint16_t uint8_to_uint16(uint8_t a, uint8_t b)\n    {\n        return (static_cast<uint16_t>(a) << 8) | static_cast<uint16_t>(b);\n    }\n\n    constexpr uint32_t uint8_to_uint32(uint8_t a, uint8_t b, uint8_t c, uint8_t d)\n    {\n        return (static_cast<uint32_t>(uint8_to_uint16(a, b)) << 16) |\n                static_cast<uint32_t>(uint8_to_uint16(c, d));\n    }\n}\n\nWINRT_EXPORT namespace winrt\n{\n    struct event_token;\n    struct hstring;\n    struct clock;\n\n    struct hresult\n    {\n        int32_t value{};\n\n        constexpr hresult() noexcept = default;\n\n        constexpr hresult(int32_t const value) noexcept : value(value)\n        {\n        }\n\n        constexpr operator int32_t() const noexcept\n        {\n            return value;\n        }\n    };\n\n    struct guid\n    {\n    private:\n\n        template <typename TStringVi..." /* TRUNCATED STRING LITERAL */
                   );
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar3,auStack_4a8._0_8_,
               "\nnamespace winrt::impl\n{\n    using ptp_io = struct tp_io*;\n    using ptp_timer = struct tp_timer*;\n    using ptp_wait = struct tp_wait*;\n    using ptp_pool = struct tp_pool*;\n    using srwlock = struct srwlock_*;\n    using condition_variable = struct condition_variable_*;\n    using bstr = wchar_t*;\n\n    using filetime_period = std::ratio_multiply<std::ratio<100>, std::nano>;\n    struct IAgileObject;\n\n    struct com_callback_args\n    {\n        uint32_t reserved1;\n        uint32_t reserved2;\n        void* data;\n    };\n\n    template <typename T>\n    constexpr uint8_t hex_to_uint(T const c)\n    {\n        if (c >= \'0\' && c <= \'9\')\n        {\n            return static_cast<uint8_t>(c - \'0\');\n        }\n        else if (c >= \'A\' && c <= \'F\')\n        {\n            return static_cast<uint8_t>(10 + c - \'A\');\n        }\n        else if (c >= \'a\' && c <= \'f\')\n        {\n            return static_cast<uint8_t>(10 + c - \'a\');\n        }\n        else \n        {\n            throw std::invalid_argument(\"Character is not a hexadecimal digit\");\n        }\n    }\n\n    template <typename T>\n    constexpr uint8_t hex_to_uint8(T const a, T const b)\n    {\n        return (hex_to_uint(a) << 4) | hex_to_uint(b);\n    }\n\n    constexpr uint16_t uint8_to_uint16(uint8_t a, uint8_t b)\n    {\n        return (static_cast<uint16_t>(a) << 8) | static_cast<uint16_t>(b);\n    }\n\n    constexpr uint32_t uint8_to_uint32(uint8_t a, uint8_t b, uint8_t c, uint8_t d)\n    {\n        return (static_cast<uint32_t>(uint8_to_uint16(a, b)) << 16) |\n                static_cast<uint32_t>(uint8_to_uint16(c, d));\n    }\n}\n\nWINRT_EXPORT namespace winrt\n{\n    struct event_token;\n    struct hstring;\n    struct clock;\n\n    struct hresult\n    {\n        int32_t value{};\n\n        constexpr hresult() noexcept = default;\n\n        constexpr hresult(int32_t const value) noexcept : value(value)\n        {\n        }\n\n        constexpr operator int32_t() const noexcept\n        {\n            return value;\n        }\n    };\n\n    struct guid\n    {\n    private:\n\n        template <typename TStringVi..." /* TRUNCATED STRING LITERAL */
               ,"\nnamespace winrt::impl\n{\n    using ptp_io = struct tp_io*;\n    using ptp_timer = struct tp_timer*;\n    using ptp_wait = struct tp_wait*;\n    using ptp_pool = struct tp_pool*;\n    using srwlock = struct srwlock_*;\n    using condition_variable = struct condition_variable_*;\n    using bstr = wchar_t*;\n\n    using filetime_period = std::ratio_multiply<std::ratio<100>, std::nano>;\n    struct IAgileObject;\n\n    struct com_callback_args\n    {\n        uint32_t reserved1;\n        uint32_t reserved2;\n        void* data;\n    };\n\n    template <typename T>\n    constexpr uint8_t hex_to_uint(T const c)\n    {\n        if (c >= \'0\' && c <= \'9\')\n        {\n            return static_cast<uint8_t>(c - \'0\');\n        }\n        else if (c >= \'A\' && c <= \'F\')\n        {\n            return static_cast<uint8_t>(10 + c - \'A\');\n        }\n        else if (c >= \'a\' && c <= \'f\')\n        {\n            return static_cast<uint8_t>(10 + c - \'a\');\n        }\n        else \n        {\n            throw std::invalid_argument(\"Character is not a hexadecimal digit\");\n        }\n    }\n\n    template <typename T>\n    constexpr uint8_t hex_to_uint8(T const a, T const b)\n    {\n        return (hex_to_uint(a) << 4) | hex_to_uint(b);\n    }\n\n    constexpr uint16_t uint8_to_uint16(uint8_t a, uint8_t b)\n    {\n        return (static_cast<uint16_t>(a) << 8) | static_cast<uint16_t>(b);\n    }\n\n    constexpr uint32_t uint8_to_uint32(uint8_t a, uint8_t b, uint8_t c, uint8_t d)\n    {\n        return (static_cast<uint32_t>(uint8_to_uint16(a, b)) << 16) |\n                static_cast<uint32_t>(uint8_to_uint16(c, d));\n    }\n}\n\nWINRT_EXPORT namespace winrt\n{\n    struct event_token;\n    struct hstring;\n    struct clock;\n\n    struct hresult\n    {\n        int32_t value{};\n\n        constexpr hresult() noexcept = default;\n\n        constexpr hresult(int32_t const value) noexcept : value(value)\n        {\n        }\n\n        constexpr operator int32_t() const noexcept\n        {\n            return value;\n        }\n    };\n\n    struct guid\n    {\n    private:\n\n        template <typename TStringVi..." /* TRUNCATED STRING LITERAL */
                + sVar36);
    sVar36 = strlen(
                   "\n__declspec(selectany) int32_t(__stdcall* winrt_to_hresult_handler)(void* address) noexcept {};\n__declspec(selectany) winrt::hstring(__stdcall* winrt_to_message_handler)(void* address) {};\n__declspec(selectany) void(__stdcall* winrt_throw_hresult_handler)(uint32_t lineNumber, char const* fileName, char const* functionName, void* returnAddress, winrt::hresult const result) noexcept {};\n__declspec(selectany) int32_t(__stdcall* winrt_activation_handler)(void* classId, winrt::guid const& iid, void** factory) noexcept {};\n\n#if defined(_MSC_VER)\n#ifdef _M_HYBRID\n#define WINRT_IMPL_LINK(function, count) __pragma(comment(linker, \"/alternatename:#WINRT_IMPL_\" #function \"@\" #count \"=#\" #function \"@\" #count))\n#elif _M_ARM64EC\n#define WINRT_IMPL_LINK(function, count) __pragma(comment(linker, \"/alternatename:#WINRT_IMPL_\" #function \"=#\" #function))\n#elif _M_IX86\n#define WINRT_IMPL_LINK(function, count) __pragma(comment(linker, \"/alternatename:_WINRT_IMPL_\" #function \"@\" #count \"=_\" #function \"@\" #count))\n#else\n#define WINRT_IMPL_LINK(function, count) __pragma(comment(linker, \"/alternatename:WINRT_IMPL_\" #function \"=\" #function))\n#endif\n#elif defined(__GNUC__)\n#if defined(__i386__)\n#define WINRT_IMPL_LINK(function, count) __asm__(\"_\" #function \"@\" #count)\n#else\n#define WINRT_IMPL_LINK(function, count) __asm__(#function)\n#endif\n#endif\n\nextern \"C\"\n{\n    void* __stdcall WINRT_IMPL_LoadLibraryW(wchar_t const* name) noexcept WINRT_IMPL_LINK(LoadLibraryW, 4);\n    int32_t __stdcall WINRT_IMPL_FreeLibrary(void* library) noexcept WINRT_IMPL_LINK(FreeLibrary, 4);\n    void* __stdcall WINRT_IMPL_GetProcAddress(void* library, char const* name) noexcept WINRT_IMPL_LINK(GetProcAddress, 8);\n\n    int32_t __stdcall WINRT_IMPL_SetErrorInfo(uint32_t reserved, void* info) noexcept WINRT_IMPL_LINK(SetErrorInfo, 8);\n    int32_t __stdcall WINRT_IMPL_GetErrorInfo(uint32_t reserved, void** info) noexcept WINRT_IMPL_LINK(GetErrorInfo, 8);\n    int32_t __stdcall WINRT_IMPL_CoInitializeEx(void*, uint32_t type) noexcept WINRT_IMPL_LINK(CoInitializeEx, 8);\n ..." /* TRUNCATED STRING LITERAL */
                   );
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar3,auStack_4a8._0_8_,
               "\n__declspec(selectany) int32_t(__stdcall* winrt_to_hresult_handler)(void* address) noexcept {};\n__declspec(selectany) winrt::hstring(__stdcall* winrt_to_message_handler)(void* address) {};\n__declspec(selectany) void(__stdcall* winrt_throw_hresult_handler)(uint32_t lineNumber, char const* fileName, char const* functionName, void* returnAddress, winrt::hresult const result) noexcept {};\n__declspec(selectany) int32_t(__stdcall* winrt_activation_handler)(void* classId, winrt::guid const& iid, void** factory) noexcept {};\n\n#if defined(_MSC_VER)\n#ifdef _M_HYBRID\n#define WINRT_IMPL_LINK(function, count) __pragma(comment(linker, \"/alternatename:#WINRT_IMPL_\" #function \"@\" #count \"=#\" #function \"@\" #count))\n#elif _M_ARM64EC\n#define WINRT_IMPL_LINK(function, count) __pragma(comment(linker, \"/alternatename:#WINRT_IMPL_\" #function \"=#\" #function))\n#elif _M_IX86\n#define WINRT_IMPL_LINK(function, count) __pragma(comment(linker, \"/alternatename:_WINRT_IMPL_\" #function \"@\" #count \"=_\" #function \"@\" #count))\n#else\n#define WINRT_IMPL_LINK(function, count) __pragma(comment(linker, \"/alternatename:WINRT_IMPL_\" #function \"=\" #function))\n#endif\n#elif defined(__GNUC__)\n#if defined(__i386__)\n#define WINRT_IMPL_LINK(function, count) __asm__(\"_\" #function \"@\" #count)\n#else\n#define WINRT_IMPL_LINK(function, count) __asm__(#function)\n#endif\n#endif\n\nextern \"C\"\n{\n    void* __stdcall WINRT_IMPL_LoadLibraryW(wchar_t const* name) noexcept WINRT_IMPL_LINK(LoadLibraryW, 4);\n    int32_t __stdcall WINRT_IMPL_FreeLibrary(void* library) noexcept WINRT_IMPL_LINK(FreeLibrary, 4);\n    void* __stdcall WINRT_IMPL_GetProcAddress(void* library, char const* name) noexcept WINRT_IMPL_LINK(GetProcAddress, 8);\n\n    int32_t __stdcall WINRT_IMPL_SetErrorInfo(uint32_t reserved, void* info) noexcept WINRT_IMPL_LINK(SetErrorInfo, 8);\n    int32_t __stdcall WINRT_IMPL_GetErrorInfo(uint32_t reserved, void** info) noexcept WINRT_IMPL_LINK(GetErrorInfo, 8);\n    int32_t __stdcall WINRT_IMPL_CoInitializeEx(void*, uint32_t type) noexcept WINRT_IMPL_LINK(CoInitializeEx, 8);\n ..." /* TRUNCATED STRING LITERAL */
               ,"\n__declspec(selectany) int32_t(__stdcall* winrt_to_hresult_handler)(void* address) noexcept {};\n__declspec(selectany) winrt::hstring(__stdcall* winrt_to_message_handler)(void* address) {};\n__declspec(selectany) void(__stdcall* winrt_throw_hresult_handler)(uint32_t lineNumber, char const* fileName, char const* functionName, void* returnAddress, winrt::hresult const result) noexcept {};\n__declspec(selectany) int32_t(__stdcall* winrt_activation_handler)(void* classId, winrt::guid const& iid, void** factory) noexcept {};\n\n#if defined(_MSC_VER)\n#ifdef _M_HYBRID\n#define WINRT_IMPL_LINK(function, count) __pragma(comment(linker, \"/alternatename:#WINRT_IMPL_\" #function \"@\" #count \"=#\" #function \"@\" #count))\n#elif _M_ARM64EC\n#define WINRT_IMPL_LINK(function, count) __pragma(comment(linker, \"/alternatename:#WINRT_IMPL_\" #function \"=#\" #function))\n#elif _M_IX86\n#define WINRT_IMPL_LINK(function, count) __pragma(comment(linker, \"/alternatename:_WINRT_IMPL_\" #function \"@\" #count \"=_\" #function \"@\" #count))\n#else\n#define WINRT_IMPL_LINK(function, count) __pragma(comment(linker, \"/alternatename:WINRT_IMPL_\" #function \"=\" #function))\n#endif\n#elif defined(__GNUC__)\n#if defined(__i386__)\n#define WINRT_IMPL_LINK(function, count) __asm__(\"_\" #function \"@\" #count)\n#else\n#define WINRT_IMPL_LINK(function, count) __asm__(#function)\n#endif\n#endif\n\nextern \"C\"\n{\n    void* __stdcall WINRT_IMPL_LoadLibraryW(wchar_t const* name) noexcept WINRT_IMPL_LINK(LoadLibraryW, 4);\n    int32_t __stdcall WINRT_IMPL_FreeLibrary(void* library) noexcept WINRT_IMPL_LINK(FreeLibrary, 4);\n    void* __stdcall WINRT_IMPL_GetProcAddress(void* library, char const* name) noexcept WINRT_IMPL_LINK(GetProcAddress, 8);\n\n    int32_t __stdcall WINRT_IMPL_SetErrorInfo(uint32_t reserved, void* info) noexcept WINRT_IMPL_LINK(SetErrorInfo, 8);\n    int32_t __stdcall WINRT_IMPL_GetErrorInfo(uint32_t reserved, void** info) noexcept WINRT_IMPL_LINK(GetErrorInfo, 8);\n    int32_t __stdcall WINRT_IMPL_CoInitializeEx(void*, uint32_t type) noexcept WINRT_IMPL_LINK(CoInitializeEx, 8);\n ..." /* TRUNCATED STRING LITERAL */
                + sVar36);
    sVar36 = strlen(
                   "\nWINRT_EXPORT namespace winrt\n{\n    hresult check_hresult(hresult const result WINRT_IMPL_SOURCE_LOCATION_ARGS);\n    hresult to_hresult() noexcept;\n\n    template <typename D, typename I>\n    D* get_self(I const& from) noexcept;\n\n    struct take_ownership_from_abi_t {};\n    inline constexpr take_ownership_from_abi_t take_ownership_from_abi{};\n\n    template <typename T>\n    struct com_ptr;\n\n    namespace param\n    {\n        template <typename T>\n        struct iterable;\n\n        template <typename T>\n        struct async_iterable;\n\n        template <typename K, typename V>\n        struct map_view;\n\n        template <typename K, typename V>\n        struct async_map_view;\n\n        template <typename K, typename V>\n        struct map;\n\n        template <typename T>\n        struct vector_view;\n\n        template <typename T>\n        struct async_vector_view;\n\n        template <typename T>\n        struct vector;\n    }\n}\n\nnamespace winrt::impl\n{\n    using namespace std::literals;\n\n    template <typename T>\n    struct reference_traits;\n\n    template <typename T>\n    struct identity\n    {\n        using type = T;\n    };\n\n    template <typename T, typename Enable = void>\n    struct abi\n    {\n        using type = T;\n    };\n\n    template <typename T>\n    struct abi<T, std::enable_if_t<std::is_enum_v<T>>>\n    {\n        using type = std::underlying_type_t<T>;\n    };\n\n    template <typename T>\n    using abi_t = typename abi<T>::type;\n\n    template <typename T>\n    struct consume;\n\n    template <typename D, typename I = D>\n    using consume_t = typename consume<I>::template type<D>;\n\n    template <typename T, typename H>\n    struct delegate;\n\n    template <typename T, typename = std::void_t<>>\n    struct default_interface\n    {\n        using type = T;\n    };\n\n    struct basic_category;\n    struct interface_category;\n    struct delegate_category;\n    struct enum_category;\n    struct class_category;\n\n    template <typename T>\n    struct category\n    {\n        using type = void;\n    };\n\n    template <typename T>\n    using category_t =..." /* TRUNCATED STRING LITERAL */
                   );
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar3,auStack_4a8._0_8_,
               "\nWINRT_EXPORT namespace winrt\n{\n    hresult check_hresult(hresult const result WINRT_IMPL_SOURCE_LOCATION_ARGS);\n    hresult to_hresult() noexcept;\n\n    template <typename D, typename I>\n    D* get_self(I const& from) noexcept;\n\n    struct take_ownership_from_abi_t {};\n    inline constexpr take_ownership_from_abi_t take_ownership_from_abi{};\n\n    template <typename T>\n    struct com_ptr;\n\n    namespace param\n    {\n        template <typename T>\n        struct iterable;\n\n        template <typename T>\n        struct async_iterable;\n\n        template <typename K, typename V>\n        struct map_view;\n\n        template <typename K, typename V>\n        struct async_map_view;\n\n        template <typename K, typename V>\n        struct map;\n\n        template <typename T>\n        struct vector_view;\n\n        template <typename T>\n        struct async_vector_view;\n\n        template <typename T>\n        struct vector;\n    }\n}\n\nnamespace winrt::impl\n{\n    using namespace std::literals;\n\n    template <typename T>\n    struct reference_traits;\n\n    template <typename T>\n    struct identity\n    {\n        using type = T;\n    };\n\n    template <typename T, typename Enable = void>\n    struct abi\n    {\n        using type = T;\n    };\n\n    template <typename T>\n    struct abi<T, std::enable_if_t<std::is_enum_v<T>>>\n    {\n        using type = std::underlying_type_t<T>;\n    };\n\n    template <typename T>\n    using abi_t = typename abi<T>::type;\n\n    template <typename T>\n    struct consume;\n\n    template <typename D, typename I = D>\n    using consume_t = typename consume<I>::template type<D>;\n\n    template <typename T, typename H>\n    struct delegate;\n\n    template <typename T, typename = std::void_t<>>\n    struct default_interface\n    {\n        using type = T;\n    };\n\n    struct basic_category;\n    struct interface_category;\n    struct delegate_category;\n    struct enum_category;\n    struct class_category;\n\n    template <typename T>\n    struct category\n    {\n        using type = void;\n    };\n\n    template <typename T>\n    using category_t =..." /* TRUNCATED STRING LITERAL */
               ,"\nWINRT_EXPORT namespace winrt\n{\n    hresult check_hresult(hresult const result WINRT_IMPL_SOURCE_LOCATION_ARGS);\n    hresult to_hresult() noexcept;\n\n    template <typename D, typename I>\n    D* get_self(I const& from) noexcept;\n\n    struct take_ownership_from_abi_t {};\n    inline constexpr take_ownership_from_abi_t take_ownership_from_abi{};\n\n    template <typename T>\n    struct com_ptr;\n\n    namespace param\n    {\n        template <typename T>\n        struct iterable;\n\n        template <typename T>\n        struct async_iterable;\n\n        template <typename K, typename V>\n        struct map_view;\n\n        template <typename K, typename V>\n        struct async_map_view;\n\n        template <typename K, typename V>\n        struct map;\n\n        template <typename T>\n        struct vector_view;\n\n        template <typename T>\n        struct async_vector_view;\n\n        template <typename T>\n        struct vector;\n    }\n}\n\nnamespace winrt::impl\n{\n    using namespace std::literals;\n\n    template <typename T>\n    struct reference_traits;\n\n    template <typename T>\n    struct identity\n    {\n        using type = T;\n    };\n\n    template <typename T, typename Enable = void>\n    struct abi\n    {\n        using type = T;\n    };\n\n    template <typename T>\n    struct abi<T, std::enable_if_t<std::is_enum_v<T>>>\n    {\n        using type = std::underlying_type_t<T>;\n    };\n\n    template <typename T>\n    using abi_t = typename abi<T>::type;\n\n    template <typename T>\n    struct consume;\n\n    template <typename D, typename I = D>\n    using consume_t = typename consume<I>::template type<D>;\n\n    template <typename T, typename H>\n    struct delegate;\n\n    template <typename T, typename = std::void_t<>>\n    struct default_interface\n    {\n        using type = T;\n    };\n\n    struct basic_category;\n    struct interface_category;\n    struct delegate_category;\n    struct enum_category;\n    struct class_category;\n\n    template <typename T>\n    struct category\n    {\n        using type = void;\n    };\n\n    template <typename T>\n    using category_t =..." /* TRUNCATED STRING LITERAL */
                + sVar36);
    sVar36 = strlen(
                   "\nWINRT_EXPORT namespace winrt\n{\n    template <typename T>\n    using default_interface = typename impl::default_interface<T>::type;\n\n    template <typename T>\n    constexpr guid const& guid_of() noexcept\n    {\n        return impl::guid_v<default_interface<T>>;\n    }\n\n    template <typename... T>\n    bool is_guid_of(guid const& id) noexcept\n    {\n        return ((id == guid_of<T>()) || ...);\n    }\n}\n\nnamespace winrt::impl\n{\n    template <size_t Size, typename T, size_t... Index>\n    constexpr std::array<T, Size> to_array(T const* value, std::index_sequence<Index...> const) noexcept\n    {\n        return { value[Index]... };\n    }\n\n    template <typename T, size_t Size>\n    constexpr auto to_array(std::array<T, Size> const& value) noexcept\n    {\n        return value;\n    }\n\n    template <size_t Size>\n    constexpr auto to_array(char const(&value)[Size]) noexcept\n    {\n        return to_array<Size - 1>(value, std::make_index_sequence<Size - 1>());\n    }\n\n    template <size_t Size>\n    constexpr auto to_array(wchar_t const(&value)[Size]) noexcept\n    {\n        return to_array<Size - 1>(value, std::make_index_sequence<Size - 1>());\n    }\n\n    template <typename T, size_t LeftSize, size_t RightSize, size_t... LeftIndex, size_t... RightIndex>\n    constexpr std::array<T, LeftSize + RightSize> concat(\n        [[maybe_unused]] std::array<T, LeftSize> const& left,\n        [[maybe_unused]] std::array<T, RightSize> const& right,\n        std::index_sequence<LeftIndex...> const,\n        std::index_sequence<RightIndex...> const) noexcept\n    {\n        return { left[LeftIndex]..., right[RightIndex]... };\n    }\n\n    template <typename T, size_t LeftSize, size_t RightSize>\n    constexpr auto concat(std::array<T, LeftSize> const& left, std::array<T, RightSize> const& right) noexcept\n    {\n        return concat(left, right, std::make_index_sequence<LeftSize>(), std::make_index_sequence<RightSize>());\n    }\n\n    template <typename T, size_t LeftSize, size_t RightSize>\n    constexpr auto concat(std::array<T, LeftSize> const& left, T cons..." /* TRUNCATED STRING LITERAL */
                   );
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar3,auStack_4a8._0_8_,
               "\nWINRT_EXPORT namespace winrt\n{\n    template <typename T>\n    using default_interface = typename impl::default_interface<T>::type;\n\n    template <typename T>\n    constexpr guid const& guid_of() noexcept\n    {\n        return impl::guid_v<default_interface<T>>;\n    }\n\n    template <typename... T>\n    bool is_guid_of(guid const& id) noexcept\n    {\n        return ((id == guid_of<T>()) || ...);\n    }\n}\n\nnamespace winrt::impl\n{\n    template <size_t Size, typename T, size_t... Index>\n    constexpr std::array<T, Size> to_array(T const* value, std::index_sequence<Index...> const) noexcept\n    {\n        return { value[Index]... };\n    }\n\n    template <typename T, size_t Size>\n    constexpr auto to_array(std::array<T, Size> const& value) noexcept\n    {\n        return value;\n    }\n\n    template <size_t Size>\n    constexpr auto to_array(char const(&value)[Size]) noexcept\n    {\n        return to_array<Size - 1>(value, std::make_index_sequence<Size - 1>());\n    }\n\n    template <size_t Size>\n    constexpr auto to_array(wchar_t const(&value)[Size]) noexcept\n    {\n        return to_array<Size - 1>(value, std::make_index_sequence<Size - 1>());\n    }\n\n    template <typename T, size_t LeftSize, size_t RightSize, size_t... LeftIndex, size_t... RightIndex>\n    constexpr std::array<T, LeftSize + RightSize> concat(\n        [[maybe_unused]] std::array<T, LeftSize> const& left,\n        [[maybe_unused]] std::array<T, RightSize> const& right,\n        std::index_sequence<LeftIndex...> const,\n        std::index_sequence<RightIndex...> const) noexcept\n    {\n        return { left[LeftIndex]..., right[RightIndex]... };\n    }\n\n    template <typename T, size_t LeftSize, size_t RightSize>\n    constexpr auto concat(std::array<T, LeftSize> const& left, std::array<T, RightSize> const& right) noexcept\n    {\n        return concat(left, right, std::make_index_sequence<LeftSize>(), std::make_index_sequence<RightSize>());\n    }\n\n    template <typename T, size_t LeftSize, size_t RightSize>\n    constexpr auto concat(std::array<T, LeftSize> const& left, T cons..." /* TRUNCATED STRING LITERAL */
               ,"\nWINRT_EXPORT namespace winrt\n{\n    template <typename T>\n    using default_interface = typename impl::default_interface<T>::type;\n\n    template <typename T>\n    constexpr guid const& guid_of() noexcept\n    {\n        return impl::guid_v<default_interface<T>>;\n    }\n\n    template <typename... T>\n    bool is_guid_of(guid const& id) noexcept\n    {\n        return ((id == guid_of<T>()) || ...);\n    }\n}\n\nnamespace winrt::impl\n{\n    template <size_t Size, typename T, size_t... Index>\n    constexpr std::array<T, Size> to_array(T const* value, std::index_sequence<Index...> const) noexcept\n    {\n        return { value[Index]... };\n    }\n\n    template <typename T, size_t Size>\n    constexpr auto to_array(std::array<T, Size> const& value) noexcept\n    {\n        return value;\n    }\n\n    template <size_t Size>\n    constexpr auto to_array(char const(&value)[Size]) noexcept\n    {\n        return to_array<Size - 1>(value, std::make_index_sequence<Size - 1>());\n    }\n\n    template <size_t Size>\n    constexpr auto to_array(wchar_t const(&value)[Size]) noexcept\n    {\n        return to_array<Size - 1>(value, std::make_index_sequence<Size - 1>());\n    }\n\n    template <typename T, size_t LeftSize, size_t RightSize, size_t... LeftIndex, size_t... RightIndex>\n    constexpr std::array<T, LeftSize + RightSize> concat(\n        [[maybe_unused]] std::array<T, LeftSize> const& left,\n        [[maybe_unused]] std::array<T, RightSize> const& right,\n        std::index_sequence<LeftIndex...> const,\n        std::index_sequence<RightIndex...> const) noexcept\n    {\n        return { left[LeftIndex]..., right[RightIndex]... };\n    }\n\n    template <typename T, size_t LeftSize, size_t RightSize>\n    constexpr auto concat(std::array<T, LeftSize> const& left, std::array<T, RightSize> const& right) noexcept\n    {\n        return concat(left, right, std::make_index_sequence<LeftSize>(), std::make_index_sequence<RightSize>());\n    }\n\n    template <typename T, size_t LeftSize, size_t RightSize>\n    constexpr auto concat(std::array<T, LeftSize> const& left, T cons..." /* TRUNCATED STRING LITERAL */
                + sVar36);
    sVar36 = strlen(
                   "\nWINRT_EXPORT namespace winrt\n{\n    template <typename T>\n    struct handle_type\n    {\n        using type = typename T::type;\n\n        handle_type() noexcept = default;\n\n        explicit handle_type(type value) noexcept : m_value(value)\n        {\n        }\n\n        handle_type(handle_type&& other) noexcept : m_value(other.detach())\n        {\n        }\n\n        handle_type& operator=(handle_type&& other) noexcept\n        {\n            if (this != &other)\n            {\n                attach(other.detach());\n            }\n\n            return*this;\n        }\n\n        ~handle_type() noexcept\n        {\n            close();\n        }\n\n        void close() noexcept\n        {\n            if (*this)\n            {\n                T::close(m_value);\n                m_value = T::invalid();\n            }\n        }\n\n        explicit operator bool() const noexcept\n        {\n            return T::invalid() != m_value;\n        }\n\n        type get() const noexcept\n        {\n            return m_value;\n        }\n\n        type* put() noexcept\n        {\n            close();\n            return &m_value;\n        }\n\n        void attach(type value) noexcept\n        {\n            close();\n            *put() = value;\n        }\n\n        type detach() noexcept\n        {\n            type value = m_value;\n            m_value = T::invalid();\n            return value;\n        }\n\n        friend void swap(handle_type& left, handle_type& right) noexcept\n        {\n            std::swap(left.m_value, right.m_value);\n        }\n\n    private:\n\n        type m_value = T::invalid();\n    };\n\n    struct handle_traits\n    {\n        using type = void*;\n\n        static void close(type value) noexcept\n        {\n            WINRT_VERIFY_(1, WINRT_IMPL_CloseHandle(value));\n        }\n\n        static constexpr type invalid() noexcept\n        {\n            return nullptr;\n        }\n    };\n\n    using handle = handle_type<handle_traits>;\n\n    struct file_handle_traits\n    {\n        using type = void*;\n\n        static void close(type value) noexcept\n        {\n          ..." /* TRUNCATED STRING LITERAL */
                   );
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar3,auStack_4a8._0_8_,
               "\nWINRT_EXPORT namespace winrt\n{\n    template <typename T>\n    struct handle_type\n    {\n        using type = typename T::type;\n\n        handle_type() noexcept = default;\n\n        explicit handle_type(type value) noexcept : m_value(value)\n        {\n        }\n\n        handle_type(handle_type&& other) noexcept : m_value(other.detach())\n        {\n        }\n\n        handle_type& operator=(handle_type&& other) noexcept\n        {\n            if (this != &other)\n            {\n                attach(other.detach());\n            }\n\n            return*this;\n        }\n\n        ~handle_type() noexcept\n        {\n            close();\n        }\n\n        void close() noexcept\n        {\n            if (*this)\n            {\n                T::close(m_value);\n                m_value = T::invalid();\n            }\n        }\n\n        explicit operator bool() const noexcept\n        {\n            return T::invalid() != m_value;\n        }\n\n        type get() const noexcept\n        {\n            return m_value;\n        }\n\n        type* put() noexcept\n        {\n            close();\n            return &m_value;\n        }\n\n        void attach(type value) noexcept\n        {\n            close();\n            *put() = value;\n        }\n\n        type detach() noexcept\n        {\n            type value = m_value;\n            m_value = T::invalid();\n            return value;\n        }\n\n        friend void swap(handle_type& left, handle_type& right) noexcept\n        {\n            std::swap(left.m_value, right.m_value);\n        }\n\n    private:\n\n        type m_value = T::invalid();\n    };\n\n    struct handle_traits\n    {\n        using type = void*;\n\n        static void close(type value) noexcept\n        {\n            WINRT_VERIFY_(1, WINRT_IMPL_CloseHandle(value));\n        }\n\n        static constexpr type invalid() noexcept\n        {\n            return nullptr;\n        }\n    };\n\n    using handle = handle_type<handle_traits>;\n\n    struct file_handle_traits\n    {\n        using type = void*;\n\n        static void close(type value) noexcept\n        {\n          ..." /* TRUNCATED STRING LITERAL */
               ,"\nWINRT_EXPORT namespace winrt\n{\n    template <typename T>\n    struct handle_type\n    {\n        using type = typename T::type;\n\n        handle_type() noexcept = default;\n\n        explicit handle_type(type value) noexcept : m_value(value)\n        {\n        }\n\n        handle_type(handle_type&& other) noexcept : m_value(other.detach())\n        {\n        }\n\n        handle_type& operator=(handle_type&& other) noexcept\n        {\n            if (this != &other)\n            {\n                attach(other.detach());\n            }\n\n            return*this;\n        }\n\n        ~handle_type() noexcept\n        {\n            close();\n        }\n\n        void close() noexcept\n        {\n            if (*this)\n            {\n                T::close(m_value);\n                m_value = T::invalid();\n            }\n        }\n\n        explicit operator bool() const noexcept\n        {\n            return T::invalid() != m_value;\n        }\n\n        type get() const noexcept\n        {\n            return m_value;\n        }\n\n        type* put() noexcept\n        {\n            close();\n            return &m_value;\n        }\n\n        void attach(type value) noexcept\n        {\n            close();\n            *put() = value;\n        }\n\n        type detach() noexcept\n        {\n            type value = m_value;\n            m_value = T::invalid();\n            return value;\n        }\n\n        friend void swap(handle_type& left, handle_type& right) noexcept\n        {\n            std::swap(left.m_value, right.m_value);\n        }\n\n    private:\n\n        type m_value = T::invalid();\n    };\n\n    struct handle_traits\n    {\n        using type = void*;\n\n        static void close(type value) noexcept\n        {\n            WINRT_VERIFY_(1, WINRT_IMPL_CloseHandle(value));\n        }\n\n        static constexpr type invalid() noexcept\n        {\n            return nullptr;\n        }\n    };\n\n    using handle = handle_type<handle_traits>;\n\n    struct file_handle_traits\n    {\n        using type = void*;\n\n        static void close(type value) noexcept\n        {\n          ..." /* TRUNCATED STRING LITERAL */
                + sVar36);
    sVar36 = strlen(
                   "\nWINRT_EXPORT namespace winrt\n{\n    struct slim_condition_variable;\n\n    struct slim_mutex\n    {\n        slim_mutex(slim_mutex const&) = delete;\n        slim_mutex& operator=(slim_mutex const&) = delete;\n        slim_mutex() noexcept = default;\n\n        void lock() noexcept\n        {\n            WINRT_IMPL_AcquireSRWLockExclusive(&m_lock);\n        }\n\n        void lock_shared() noexcept\n        {\n            WINRT_IMPL_AcquireSRWLockShared(&m_lock);\n        }\n\n        bool try_lock() noexcept\n        {\n            return 0 != WINRT_IMPL_TryAcquireSRWLockExclusive(&m_lock);\n        }\n\n        bool try_lock_shared() noexcept\n        {\n            return 0 != WINRT_IMPL_TryAcquireSRWLockShared(&m_lock);\n        }\n\n        void unlock() noexcept\n        {\n            WINRT_IMPL_ReleaseSRWLockExclusive(&m_lock);\n        }\n\n        void unlock_shared() noexcept\n        {\n            WINRT_IMPL_ReleaseSRWLockShared(&m_lock);\n        }\n\n    private:\n        friend slim_condition_variable;\n\n        auto get() noexcept\n        {\n            return &m_lock;\n        }\n\n        impl::srwlock m_lock{};\n    };\n\n    struct slim_lock_guard\n    {\n        explicit slim_lock_guard(slim_mutex& m) noexcept :\n        m_mutex(m)\n        {\n            m_mutex.lock();\n        }\n\n        slim_lock_guard(slim_lock_guard const&) = delete;\n\n        ~slim_lock_guard() noexcept\n        {\n            m_mutex.unlock();\n        }\n\n    private:\n        slim_mutex& m_mutex;\n    };\n\n    struct slim_shared_lock_guard\n    {\n        explicit slim_shared_lock_guard(slim_mutex& m) noexcept :\n            m_mutex(m)\n        {\n            m_mutex.lock_shared();\n        }\n\n        slim_shared_lock_guard(slim_shared_lock_guard const&) = delete;\n\n        ~slim_shared_lock_guard() noexcept\n        {\n            m_mutex.unlock_shared();\n        }\n\n    private:\n        slim_mutex& m_mutex;\n    };\n\n    struct slim_condition_variable\n    {\n        slim_condition_variable(slim_condition_variable const&) = delete;\n        slim_condition_variable const& operator=(slim_c..." /* TRUNCATED STRING LITERAL */
                   );
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar3,auStack_4a8._0_8_,
               "\nWINRT_EXPORT namespace winrt\n{\n    struct slim_condition_variable;\n\n    struct slim_mutex\n    {\n        slim_mutex(slim_mutex const&) = delete;\n        slim_mutex& operator=(slim_mutex const&) = delete;\n        slim_mutex() noexcept = default;\n\n        void lock() noexcept\n        {\n            WINRT_IMPL_AcquireSRWLockExclusive(&m_lock);\n        }\n\n        void lock_shared() noexcept\n        {\n            WINRT_IMPL_AcquireSRWLockShared(&m_lock);\n        }\n\n        bool try_lock() noexcept\n        {\n            return 0 != WINRT_IMPL_TryAcquireSRWLockExclusive(&m_lock);\n        }\n\n        bool try_lock_shared() noexcept\n        {\n            return 0 != WINRT_IMPL_TryAcquireSRWLockShared(&m_lock);\n        }\n\n        void unlock() noexcept\n        {\n            WINRT_IMPL_ReleaseSRWLockExclusive(&m_lock);\n        }\n\n        void unlock_shared() noexcept\n        {\n            WINRT_IMPL_ReleaseSRWLockShared(&m_lock);\n        }\n\n    private:\n        friend slim_condition_variable;\n\n        auto get() noexcept\n        {\n            return &m_lock;\n        }\n\n        impl::srwlock m_lock{};\n    };\n\n    struct slim_lock_guard\n    {\n        explicit slim_lock_guard(slim_mutex& m) noexcept :\n        m_mutex(m)\n        {\n            m_mutex.lock();\n        }\n\n        slim_lock_guard(slim_lock_guard const&) = delete;\n\n        ~slim_lock_guard() noexcept\n        {\n            m_mutex.unlock();\n        }\n\n    private:\n        slim_mutex& m_mutex;\n    };\n\n    struct slim_shared_lock_guard\n    {\n        explicit slim_shared_lock_guard(slim_mutex& m) noexcept :\n            m_mutex(m)\n        {\n            m_mutex.lock_shared();\n        }\n\n        slim_shared_lock_guard(slim_shared_lock_guard const&) = delete;\n\n        ~slim_shared_lock_guard() noexcept\n        {\n            m_mutex.unlock_shared();\n        }\n\n    private:\n        slim_mutex& m_mutex;\n    };\n\n    struct slim_condition_variable\n    {\n        slim_condition_variable(slim_condition_variable const&) = delete;\n        slim_condition_variable const& operator=(slim_c..." /* TRUNCATED STRING LITERAL */
               ,"\nWINRT_EXPORT namespace winrt\n{\n    struct slim_condition_variable;\n\n    struct slim_mutex\n    {\n        slim_mutex(slim_mutex const&) = delete;\n        slim_mutex& operator=(slim_mutex const&) = delete;\n        slim_mutex() noexcept = default;\n\n        void lock() noexcept\n        {\n            WINRT_IMPL_AcquireSRWLockExclusive(&m_lock);\n        }\n\n        void lock_shared() noexcept\n        {\n            WINRT_IMPL_AcquireSRWLockShared(&m_lock);\n        }\n\n        bool try_lock() noexcept\n        {\n            return 0 != WINRT_IMPL_TryAcquireSRWLockExclusive(&m_lock);\n        }\n\n        bool try_lock_shared() noexcept\n        {\n            return 0 != WINRT_IMPL_TryAcquireSRWLockShared(&m_lock);\n        }\n\n        void unlock() noexcept\n        {\n            WINRT_IMPL_ReleaseSRWLockExclusive(&m_lock);\n        }\n\n        void unlock_shared() noexcept\n        {\n            WINRT_IMPL_ReleaseSRWLockShared(&m_lock);\n        }\n\n    private:\n        friend slim_condition_variable;\n\n        auto get() noexcept\n        {\n            return &m_lock;\n        }\n\n        impl::srwlock m_lock{};\n    };\n\n    struct slim_lock_guard\n    {\n        explicit slim_lock_guard(slim_mutex& m) noexcept :\n        m_mutex(m)\n        {\n            m_mutex.lock();\n        }\n\n        slim_lock_guard(slim_lock_guard const&) = delete;\n\n        ~slim_lock_guard() noexcept\n        {\n            m_mutex.unlock();\n        }\n\n    private:\n        slim_mutex& m_mutex;\n    };\n\n    struct slim_shared_lock_guard\n    {\n        explicit slim_shared_lock_guard(slim_mutex& m) noexcept :\n            m_mutex(m)\n        {\n            m_mutex.lock_shared();\n        }\n\n        slim_shared_lock_guard(slim_shared_lock_guard const&) = delete;\n\n        ~slim_shared_lock_guard() noexcept\n        {\n            m_mutex.unlock_shared();\n        }\n\n    private:\n        slim_mutex& m_mutex;\n    };\n\n    struct slim_condition_variable\n    {\n        slim_condition_variable(slim_condition_variable const&) = delete;\n        slim_condition_variable const& operator=(slim_c..." /* TRUNCATED STRING LITERAL */
                + sVar36);
    sVar36 = strlen(
                   "\nnamespace winrt::impl\n{\n    template <> struct abi<Windows::Foundation::IUnknown>\n    {\n        struct WINRT_IMPL_NOVTABLE type\n        {\n            virtual int32_t __stdcall QueryInterface(guid const& id, void** object) noexcept = 0;\n            virtual uint32_t __stdcall AddRef() noexcept = 0;\n            virtual uint32_t __stdcall Release() noexcept = 0;\n        };\n    };\n\n    using unknown_abi = abi_t<Windows::Foundation::IUnknown>;\n\n    template <> struct abi<Windows::Foundation::IInspectable>\n    {\n        struct WINRT_IMPL_NOVTABLE type : unknown_abi\n        {\n            virtual int32_t __stdcall GetIids(uint32_t* count, guid** ids) noexcept = 0;\n            virtual int32_t __stdcall GetRuntimeClassName(void** name) noexcept = 0;\n            virtual int32_t __stdcall GetTrustLevel(Windows::Foundation::TrustLevel* level) noexcept = 0;\n        };\n    };\n\n    using inspectable_abi = abi_t<Windows::Foundation::IInspectable>;\n\n    template <> struct abi<Windows::Foundation::IActivationFactory>\n    {\n        struct WINRT_IMPL_NOVTABLE type : inspectable_abi\n        {\n            virtual int32_t __stdcall ActivateInstance(void** instance) noexcept = 0;\n        };\n    };\n\n    struct WINRT_IMPL_NOVTABLE IAgileObject : unknown_abi {};\n\n    struct WINRT_IMPL_NOVTABLE IAgileReference : unknown_abi\n    {\n        virtual int32_t __stdcall Resolve(guid const& id, void** object) noexcept = 0;\n    };\n\n    struct WINRT_IMPL_NOVTABLE IMarshal : unknown_abi\n    {\n        virtual int32_t __stdcall GetUnmarshalClass(guid const& riid, void* pv, uint32_t dwDestContext, void* pvDestContext, uint32_t mshlflags, guid* pCid) noexcept = 0;\n        virtual int32_t __stdcall GetMarshalSizeMax(guid const& riid, void* pv, uint32_t dwDestContext, void* pvDestContext, uint32_t mshlflags, uint32_t* pSize) noexcept = 0;\n        virtual int32_t __stdcall MarshalInterface(void* pStm, guid const& riid, void* pv, uint32_t dwDestContext, void* pvDestContext, uint32_t mshlflags) noexcept = 0;\n        virtual int32_t __stdcall UnmarshalInterface(..." /* TRUNCATED STRING LITERAL */
                   );
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar3,auStack_4a8._0_8_,
               "\nnamespace winrt::impl\n{\n    template <> struct abi<Windows::Foundation::IUnknown>\n    {\n        struct WINRT_IMPL_NOVTABLE type\n        {\n            virtual int32_t __stdcall QueryInterface(guid const& id, void** object) noexcept = 0;\n            virtual uint32_t __stdcall AddRef() noexcept = 0;\n            virtual uint32_t __stdcall Release() noexcept = 0;\n        };\n    };\n\n    using unknown_abi = abi_t<Windows::Foundation::IUnknown>;\n\n    template <> struct abi<Windows::Foundation::IInspectable>\n    {\n        struct WINRT_IMPL_NOVTABLE type : unknown_abi\n        {\n            virtual int32_t __stdcall GetIids(uint32_t* count, guid** ids) noexcept = 0;\n            virtual int32_t __stdcall GetRuntimeClassName(void** name) noexcept = 0;\n            virtual int32_t __stdcall GetTrustLevel(Windows::Foundation::TrustLevel* level) noexcept = 0;\n        };\n    };\n\n    using inspectable_abi = abi_t<Windows::Foundation::IInspectable>;\n\n    template <> struct abi<Windows::Foundation::IActivationFactory>\n    {\n        struct WINRT_IMPL_NOVTABLE type : inspectable_abi\n        {\n            virtual int32_t __stdcall ActivateInstance(void** instance) noexcept = 0;\n        };\n    };\n\n    struct WINRT_IMPL_NOVTABLE IAgileObject : unknown_abi {};\n\n    struct WINRT_IMPL_NOVTABLE IAgileReference : unknown_abi\n    {\n        virtual int32_t __stdcall Resolve(guid const& id, void** object) noexcept = 0;\n    };\n\n    struct WINRT_IMPL_NOVTABLE IMarshal : unknown_abi\n    {\n        virtual int32_t __stdcall GetUnmarshalClass(guid const& riid, void* pv, uint32_t dwDestContext, void* pvDestContext, uint32_t mshlflags, guid* pCid) noexcept = 0;\n        virtual int32_t __stdcall GetMarshalSizeMax(guid const& riid, void* pv, uint32_t dwDestContext, void* pvDestContext, uint32_t mshlflags, uint32_t* pSize) noexcept = 0;\n        virtual int32_t __stdcall MarshalInterface(void* pStm, guid const& riid, void* pv, uint32_t dwDestContext, void* pvDestContext, uint32_t mshlflags) noexcept = 0;\n        virtual int32_t __stdcall UnmarshalInterface(..." /* TRUNCATED STRING LITERAL */
               ,"\nnamespace winrt::impl\n{\n    template <> struct abi<Windows::Foundation::IUnknown>\n    {\n        struct WINRT_IMPL_NOVTABLE type\n        {\n            virtual int32_t __stdcall QueryInterface(guid const& id, void** object) noexcept = 0;\n            virtual uint32_t __stdcall AddRef() noexcept = 0;\n            virtual uint32_t __stdcall Release() noexcept = 0;\n        };\n    };\n\n    using unknown_abi = abi_t<Windows::Foundation::IUnknown>;\n\n    template <> struct abi<Windows::Foundation::IInspectable>\n    {\n        struct WINRT_IMPL_NOVTABLE type : unknown_abi\n        {\n            virtual int32_t __stdcall GetIids(uint32_t* count, guid** ids) noexcept = 0;\n            virtual int32_t __stdcall GetRuntimeClassName(void** name) noexcept = 0;\n            virtual int32_t __stdcall GetTrustLevel(Windows::Foundation::TrustLevel* level) noexcept = 0;\n        };\n    };\n\n    using inspectable_abi = abi_t<Windows::Foundation::IInspectable>;\n\n    template <> struct abi<Windows::Foundation::IActivationFactory>\n    {\n        struct WINRT_IMPL_NOVTABLE type : inspectable_abi\n        {\n            virtual int32_t __stdcall ActivateInstance(void** instance) noexcept = 0;\n        };\n    };\n\n    struct WINRT_IMPL_NOVTABLE IAgileObject : unknown_abi {};\n\n    struct WINRT_IMPL_NOVTABLE IAgileReference : unknown_abi\n    {\n        virtual int32_t __stdcall Resolve(guid const& id, void** object) noexcept = 0;\n    };\n\n    struct WINRT_IMPL_NOVTABLE IMarshal : unknown_abi\n    {\n        virtual int32_t __stdcall GetUnmarshalClass(guid const& riid, void* pv, uint32_t dwDestContext, void* pvDestContext, uint32_t mshlflags, guid* pCid) noexcept = 0;\n        virtual int32_t __stdcall GetMarshalSizeMax(guid const& riid, void* pv, uint32_t dwDestContext, void* pvDestContext, uint32_t mshlflags, uint32_t* pSize) noexcept = 0;\n        virtual int32_t __stdcall MarshalInterface(void* pStm, guid const& riid, void* pv, uint32_t dwDestContext, void* pvDestContext, uint32_t mshlflags) noexcept = 0;\n        virtual int32_t __stdcall UnmarshalInterface(..." /* TRUNCATED STRING LITERAL */
                + sVar36);
    sVar36 = strlen(
                   "\nnamespace winrt::impl\n{\n#ifdef WINRT_DIAGNOSTICS\n\n    struct factory_diagnostics_info\n    {\n        bool is_agile{ true };\n        uint32_t requests{ 0 };\n    };\n\n    struct diagnostics_info\n    {\n        std::map<std::wstring_view, uint32_t> queries;\n        std::map<std::wstring_view, factory_diagnostics_info> factories;\n    };\n\n    struct diagnostics_cache\n    {\n        template <typename T>\n        void add_query()\n        {\n            slim_lock_guard const guard(m_lock);\n            ++m_info.queries[name_of<T>()];\n        }\n\n        template <typename T>\n        void add_factory()\n        {\n            slim_lock_guard const guard(m_lock);\n            factory_diagnostics_info& factory = m_info.factories[name_of<T>()];\n            ++factory.requests;\n        }\n\n        template <typename T>\n        void non_agile_factory()\n        {\n            slim_lock_guard const guard(m_lock);\n            factory_diagnostics_info& factory = m_info.factories[name_of<T>()];\n            factory.is_agile = false;\n        }\n\n        auto get()\n        {\n            slim_lock_guard const guard(m_lock);\n            return m_info;\n        }\n\n        auto detach()\n        {\n            slim_lock_guard const guard(m_lock);\n            return std::move(m_info);\n        }\n\n    private:\n\n        slim_mutex m_lock;\n        diagnostics_info m_info;\n    };\n\n    inline diagnostics_cache& get_diagnostics_info() noexcept\n    {\n        static diagnostics_cache info;\n        return info;\n    }\n\n#endif\n\n    template <typename T>\n    using com_ref = std::conditional_t<std::is_base_of_v<Windows::Foundation::IUnknown, T>, T, com_ptr<T>>;\n\n    template <typename T, std::enable_if_t<is_implements_v<T>, int> = 0>\n    com_ref<T> wrap_as_result(void* result)\n    {\n        return { &static_cast<produce<T, typename default_interface<T>::type>*>(result)->shim(), take_ownership_from_abi };\n    }\n\n    template <typename T, std::enable_if_t<!is_implements_v<T>, int> = 0>\n    com_ref<T> wrap_as_result(void* result)\n    {\n        return { result, take_owners..." /* TRUNCATED STRING LITERAL */
                   );
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar3,auStack_4a8._0_8_,
               "\nnamespace winrt::impl\n{\n#ifdef WINRT_DIAGNOSTICS\n\n    struct factory_diagnostics_info\n    {\n        bool is_agile{ true };\n        uint32_t requests{ 0 };\n    };\n\n    struct diagnostics_info\n    {\n        std::map<std::wstring_view, uint32_t> queries;\n        std::map<std::wstring_view, factory_diagnostics_info> factories;\n    };\n\n    struct diagnostics_cache\n    {\n        template <typename T>\n        void add_query()\n        {\n            slim_lock_guard const guard(m_lock);\n            ++m_info.queries[name_of<T>()];\n        }\n\n        template <typename T>\n        void add_factory()\n        {\n            slim_lock_guard const guard(m_lock);\n            factory_diagnostics_info& factory = m_info.factories[name_of<T>()];\n            ++factory.requests;\n        }\n\n        template <typename T>\n        void non_agile_factory()\n        {\n            slim_lock_guard const guard(m_lock);\n            factory_diagnostics_info& factory = m_info.factories[name_of<T>()];\n            factory.is_agile = false;\n        }\n\n        auto get()\n        {\n            slim_lock_guard const guard(m_lock);\n            return m_info;\n        }\n\n        auto detach()\n        {\n            slim_lock_guard const guard(m_lock);\n            return std::move(m_info);\n        }\n\n    private:\n\n        slim_mutex m_lock;\n        diagnostics_info m_info;\n    };\n\n    inline diagnostics_cache& get_diagnostics_info() noexcept\n    {\n        static diagnostics_cache info;\n        return info;\n    }\n\n#endif\n\n    template <typename T>\n    using com_ref = std::conditional_t<std::is_base_of_v<Windows::Foundation::IUnknown, T>, T, com_ptr<T>>;\n\n    template <typename T, std::enable_if_t<is_implements_v<T>, int> = 0>\n    com_ref<T> wrap_as_result(void* result)\n    {\n        return { &static_cast<produce<T, typename default_interface<T>::type>*>(result)->shim(), take_ownership_from_abi };\n    }\n\n    template <typename T, std::enable_if_t<!is_implements_v<T>, int> = 0>\n    com_ref<T> wrap_as_result(void* result)\n    {\n        return { result, take_owners..." /* TRUNCATED STRING LITERAL */
               ,"\nnamespace winrt::impl\n{\n#ifdef WINRT_DIAGNOSTICS\n\n    struct factory_diagnostics_info\n    {\n        bool is_agile{ true };\n        uint32_t requests{ 0 };\n    };\n\n    struct diagnostics_info\n    {\n        std::map<std::wstring_view, uint32_t> queries;\n        std::map<std::wstring_view, factory_diagnostics_info> factories;\n    };\n\n    struct diagnostics_cache\n    {\n        template <typename T>\n        void add_query()\n        {\n            slim_lock_guard const guard(m_lock);\n            ++m_info.queries[name_of<T>()];\n        }\n\n        template <typename T>\n        void add_factory()\n        {\n            slim_lock_guard const guard(m_lock);\n            factory_diagnostics_info& factory = m_info.factories[name_of<T>()];\n            ++factory.requests;\n        }\n\n        template <typename T>\n        void non_agile_factory()\n        {\n            slim_lock_guard const guard(m_lock);\n            factory_diagnostics_info& factory = m_info.factories[name_of<T>()];\n            factory.is_agile = false;\n        }\n\n        auto get()\n        {\n            slim_lock_guard const guard(m_lock);\n            return m_info;\n        }\n\n        auto detach()\n        {\n            slim_lock_guard const guard(m_lock);\n            return std::move(m_info);\n        }\n\n    private:\n\n        slim_mutex m_lock;\n        diagnostics_info m_info;\n    };\n\n    inline diagnostics_cache& get_diagnostics_info() noexcept\n    {\n        static diagnostics_cache info;\n        return info;\n    }\n\n#endif\n\n    template <typename T>\n    using com_ref = std::conditional_t<std::is_base_of_v<Windows::Foundation::IUnknown, T>, T, com_ptr<T>>;\n\n    template <typename T, std::enable_if_t<is_implements_v<T>, int> = 0>\n    com_ref<T> wrap_as_result(void* result)\n    {\n        return { &static_cast<produce<T, typename default_interface<T>::type>*>(result)->shim(), take_ownership_from_abi };\n    }\n\n    template <typename T, std::enable_if_t<!is_implements_v<T>, int> = 0>\n    com_ref<T> wrap_as_result(void* result)\n    {\n        return { result, take_owners..." /* TRUNCATED STRING LITERAL */
                + sVar36);
    sVar36 = strlen(
                   "\nWINRT_EXPORT namespace winrt\n{\n    template <typename T>\n    struct com_ptr;\n}\n\nnamespace winrt::impl\n{\n    template <typename T, typename F, typename...Args>\n    int32_t capture_to(void**result, F function, Args&& ...args)\n    {\n        return function(args..., guid_of<T>(), result);\n    }\n\n    template <typename T, typename O, typename M, typename...Args, std::enable_if_t<std::is_class_v<O> || std::is_union_v<O>, int> = 0>\n    int32_t capture_to(void** result, O* object, M method, Args&& ...args)\n    {\n        return (object->*method)(args..., guid_of<T>(), result);\n    }\n\n    template <typename T, typename O, typename M, typename...Args>\n    int32_t capture_to(void** result, com_ptr<O> const& object, M method, Args&& ...args);\n}\n\nWINRT_EXPORT namespace winrt\n{\n    template <typename T>\n    struct com_ptr\n    {\n        using type = impl::abi_t<T>;\n\n        com_ptr(std::nullptr_t = nullptr) noexcept {}\n\n        com_ptr(void* ptr, take_ownership_from_abi_t) noexcept : m_ptr(static_cast<type*>(ptr))\n        {\n        }\n\n        com_ptr(com_ptr const& other) noexcept : m_ptr(other.m_ptr)\n        {\n            add_ref();\n        }\n\n        template <typename U>\n        com_ptr(com_ptr<U> const& other) noexcept : m_ptr(other.m_ptr)\n        {\n            add_ref();\n        }\n\n        template <typename U>\n        com_ptr(com_ptr<U>&& other) noexcept : m_ptr(std::exchange(other.m_ptr, {}))\n        {\n        }\n\n        ~com_ptr() noexcept\n        {\n            release_ref();\n        }\n\n        com_ptr& operator=(com_ptr const& other) noexcept\n        {\n            copy_ref(other.m_ptr);\n            return*this;\n        }\n\n        com_ptr& operator=(com_ptr&& other) noexcept\n        {\n            if (this != &other)\n            {\n                release_ref();\n                m_ptr = std::exchange(other.m_ptr, {});\n            }\n\n            return*this;\n        }\n\n        template <typename U>\n        com_ptr& operator=(com_ptr<U> const& other) noexcept\n        {\n            copy_ref(other.m_ptr);\n            return*th..." /* TRUNCATED STRING LITERAL */
                   );
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar3,auStack_4a8._0_8_,
               "\nWINRT_EXPORT namespace winrt\n{\n    template <typename T>\n    struct com_ptr;\n}\n\nnamespace winrt::impl\n{\n    template <typename T, typename F, typename...Args>\n    int32_t capture_to(void**result, F function, Args&& ...args)\n    {\n        return function(args..., guid_of<T>(), result);\n    }\n\n    template <typename T, typename O, typename M, typename...Args, std::enable_if_t<std::is_class_v<O> || std::is_union_v<O>, int> = 0>\n    int32_t capture_to(void** result, O* object, M method, Args&& ...args)\n    {\n        return (object->*method)(args..., guid_of<T>(), result);\n    }\n\n    template <typename T, typename O, typename M, typename...Args>\n    int32_t capture_to(void** result, com_ptr<O> const& object, M method, Args&& ...args);\n}\n\nWINRT_EXPORT namespace winrt\n{\n    template <typename T>\n    struct com_ptr\n    {\n        using type = impl::abi_t<T>;\n\n        com_ptr(std::nullptr_t = nullptr) noexcept {}\n\n        com_ptr(void* ptr, take_ownership_from_abi_t) noexcept : m_ptr(static_cast<type*>(ptr))\n        {\n        }\n\n        com_ptr(com_ptr const& other) noexcept : m_ptr(other.m_ptr)\n        {\n            add_ref();\n        }\n\n        template <typename U>\n        com_ptr(com_ptr<U> const& other) noexcept : m_ptr(other.m_ptr)\n        {\n            add_ref();\n        }\n\n        template <typename U>\n        com_ptr(com_ptr<U>&& other) noexcept : m_ptr(std::exchange(other.m_ptr, {}))\n        {\n        }\n\n        ~com_ptr() noexcept\n        {\n            release_ref();\n        }\n\n        com_ptr& operator=(com_ptr const& other) noexcept\n        {\n            copy_ref(other.m_ptr);\n            return*this;\n        }\n\n        com_ptr& operator=(com_ptr&& other) noexcept\n        {\n            if (this != &other)\n            {\n                release_ref();\n                m_ptr = std::exchange(other.m_ptr, {});\n            }\n\n            return*this;\n        }\n\n        template <typename U>\n        com_ptr& operator=(com_ptr<U> const& other) noexcept\n        {\n            copy_ref(other.m_ptr);\n            return*th..." /* TRUNCATED STRING LITERAL */
               ,"\nWINRT_EXPORT namespace winrt\n{\n    template <typename T>\n    struct com_ptr;\n}\n\nnamespace winrt::impl\n{\n    template <typename T, typename F, typename...Args>\n    int32_t capture_to(void**result, F function, Args&& ...args)\n    {\n        return function(args..., guid_of<T>(), result);\n    }\n\n    template <typename T, typename O, typename M, typename...Args, std::enable_if_t<std::is_class_v<O> || std::is_union_v<O>, int> = 0>\n    int32_t capture_to(void** result, O* object, M method, Args&& ...args)\n    {\n        return (object->*method)(args..., guid_of<T>(), result);\n    }\n\n    template <typename T, typename O, typename M, typename...Args>\n    int32_t capture_to(void** result, com_ptr<O> const& object, M method, Args&& ...args);\n}\n\nWINRT_EXPORT namespace winrt\n{\n    template <typename T>\n    struct com_ptr\n    {\n        using type = impl::abi_t<T>;\n\n        com_ptr(std::nullptr_t = nullptr) noexcept {}\n\n        com_ptr(void* ptr, take_ownership_from_abi_t) noexcept : m_ptr(static_cast<type*>(ptr))\n        {\n        }\n\n        com_ptr(com_ptr const& other) noexcept : m_ptr(other.m_ptr)\n        {\n            add_ref();\n        }\n\n        template <typename U>\n        com_ptr(com_ptr<U> const& other) noexcept : m_ptr(other.m_ptr)\n        {\n            add_ref();\n        }\n\n        template <typename U>\n        com_ptr(com_ptr<U>&& other) noexcept : m_ptr(std::exchange(other.m_ptr, {}))\n        {\n        }\n\n        ~com_ptr() noexcept\n        {\n            release_ref();\n        }\n\n        com_ptr& operator=(com_ptr const& other) noexcept\n        {\n            copy_ref(other.m_ptr);\n            return*this;\n        }\n\n        com_ptr& operator=(com_ptr&& other) noexcept\n        {\n            if (this != &other)\n            {\n                release_ref();\n                m_ptr = std::exchange(other.m_ptr, {});\n            }\n\n            return*this;\n        }\n\n        template <typename U>\n        com_ptr& operator=(com_ptr<U> const& other) noexcept\n        {\n            copy_ref(other.m_ptr);\n            return*th..." /* TRUNCATED STRING LITERAL */
                + sVar36);
    sVar36 = strlen(
                   "\nnamespace winrt::impl\n{\n    struct atomic_ref_count\n    {\n        atomic_ref_count() noexcept = default;\n\n        explicit atomic_ref_count(uint32_t count) noexcept : m_count(count)\n        {\n        }\n\n        uint32_t operator=(uint32_t count) noexcept\n        {\n            return m_count = count;\n        }\n\n        uint32_t operator++() noexcept\n        {\n            return static_cast<uint32_t>(m_count.fetch_add(1, std::memory_order_relaxed) + 1);\n        }\n\n        uint32_t operator--() noexcept\n        {\n            auto const remaining = m_count.fetch_sub(1, std::memory_order_release) - 1;\n\n            if (remaining == 0)\n            {\n                std::atomic_thread_fence(std::memory_order_acquire);\n            }\n            else if (remaining < 0)\n            {\n                abort();\n            }\n\n            return static_cast<uint32_t>(remaining);\n        }\n\n        operator uint32_t() const noexcept\n        {\n            return static_cast<uint32_t>(m_count);\n        }\n\n    private:\n\n        std::atomic<int32_t> m_count;\n    };\n\n    constexpr uint32_t hstring_reference_flag{ 1 };\n\n    struct hstring_header\n    {\n        uint32_t flags;\n        uint32_t length;\n        uint32_t padding1;\n        uint32_t padding2;\n        wchar_t const* ptr;\n    };\n\n    struct shared_hstring_header : hstring_header\n    {\n        atomic_ref_count count;\n        wchar_t buffer[1];\n    };\n\n    inline void release_hstring(hstring_header* handle) noexcept\n    {\n        WINRT_ASSERT((handle->flags & hstring_reference_flag) == 0);\n\n        if (0 == --static_cast<shared_hstring_header*>(handle)->count)\n        {\n            WINRT_IMPL_HeapFree(WINRT_IMPL_GetProcessHeap(), 0, handle);\n        }\n    }\n\n    inline shared_hstring_header* precreate_hstring_on_heap(uint32_t length)\n    {\n        WINRT_ASSERT(length != 0);\n        uint64_t bytes_required = static_cast<uint64_t>(sizeof(shared_hstring_header)) + static_cast<uint64_t>(sizeof(wchar_t)) * static_cast<uint64_t>(length);\n\n        if (bytes_required > UINT_MAX)\n      ..." /* TRUNCATED STRING LITERAL */
                   );
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar3,auStack_4a8._0_8_,
               "\nnamespace winrt::impl\n{\n    struct atomic_ref_count\n    {\n        atomic_ref_count() noexcept = default;\n\n        explicit atomic_ref_count(uint32_t count) noexcept : m_count(count)\n        {\n        }\n\n        uint32_t operator=(uint32_t count) noexcept\n        {\n            return m_count = count;\n        }\n\n        uint32_t operator++() noexcept\n        {\n            return static_cast<uint32_t>(m_count.fetch_add(1, std::memory_order_relaxed) + 1);\n        }\n\n        uint32_t operator--() noexcept\n        {\n            auto const remaining = m_count.fetch_sub(1, std::memory_order_release) - 1;\n\n            if (remaining == 0)\n            {\n                std::atomic_thread_fence(std::memory_order_acquire);\n            }\n            else if (remaining < 0)\n            {\n                abort();\n            }\n\n            return static_cast<uint32_t>(remaining);\n        }\n\n        operator uint32_t() const noexcept\n        {\n            return static_cast<uint32_t>(m_count);\n        }\n\n    private:\n\n        std::atomic<int32_t> m_count;\n    };\n\n    constexpr uint32_t hstring_reference_flag{ 1 };\n\n    struct hstring_header\n    {\n        uint32_t flags;\n        uint32_t length;\n        uint32_t padding1;\n        uint32_t padding2;\n        wchar_t const* ptr;\n    };\n\n    struct shared_hstring_header : hstring_header\n    {\n        atomic_ref_count count;\n        wchar_t buffer[1];\n    };\n\n    inline void release_hstring(hstring_header* handle) noexcept\n    {\n        WINRT_ASSERT((handle->flags & hstring_reference_flag) == 0);\n\n        if (0 == --static_cast<shared_hstring_header*>(handle)->count)\n        {\n            WINRT_IMPL_HeapFree(WINRT_IMPL_GetProcessHeap(), 0, handle);\n        }\n    }\n\n    inline shared_hstring_header* precreate_hstring_on_heap(uint32_t length)\n    {\n        WINRT_ASSERT(length != 0);\n        uint64_t bytes_required = static_cast<uint64_t>(sizeof(shared_hstring_header)) + static_cast<uint64_t>(sizeof(wchar_t)) * static_cast<uint64_t>(length);\n\n        if (bytes_required > UINT_MAX)\n      ..." /* TRUNCATED STRING LITERAL */
               ,"\nnamespace winrt::impl\n{\n    struct atomic_ref_count\n    {\n        atomic_ref_count() noexcept = default;\n\n        explicit atomic_ref_count(uint32_t count) noexcept : m_count(count)\n        {\n        }\n\n        uint32_t operator=(uint32_t count) noexcept\n        {\n            return m_count = count;\n        }\n\n        uint32_t operator++() noexcept\n        {\n            return static_cast<uint32_t>(m_count.fetch_add(1, std::memory_order_relaxed) + 1);\n        }\n\n        uint32_t operator--() noexcept\n        {\n            auto const remaining = m_count.fetch_sub(1, std::memory_order_release) - 1;\n\n            if (remaining == 0)\n            {\n                std::atomic_thread_fence(std::memory_order_acquire);\n            }\n            else if (remaining < 0)\n            {\n                abort();\n            }\n\n            return static_cast<uint32_t>(remaining);\n        }\n\n        operator uint32_t() const noexcept\n        {\n            return static_cast<uint32_t>(m_count);\n        }\n\n    private:\n\n        std::atomic<int32_t> m_count;\n    };\n\n    constexpr uint32_t hstring_reference_flag{ 1 };\n\n    struct hstring_header\n    {\n        uint32_t flags;\n        uint32_t length;\n        uint32_t padding1;\n        uint32_t padding2;\n        wchar_t const* ptr;\n    };\n\n    struct shared_hstring_header : hstring_header\n    {\n        atomic_ref_count count;\n        wchar_t buffer[1];\n    };\n\n    inline void release_hstring(hstring_header* handle) noexcept\n    {\n        WINRT_ASSERT((handle->flags & hstring_reference_flag) == 0);\n\n        if (0 == --static_cast<shared_hstring_header*>(handle)->count)\n        {\n            WINRT_IMPL_HeapFree(WINRT_IMPL_GetProcessHeap(), 0, handle);\n        }\n    }\n\n    inline shared_hstring_header* precreate_hstring_on_heap(uint32_t length)\n    {\n        WINRT_ASSERT(length != 0);\n        uint64_t bytes_required = static_cast<uint64_t>(sizeof(shared_hstring_header)) + static_cast<uint64_t>(sizeof(wchar_t)) * static_cast<uint64_t>(length);\n\n        if (bytes_required > UINT_MAX)\n      ..." /* TRUNCATED STRING LITERAL */
                + sVar36);
    sVar36 = strlen(
                   "\nWINRT_EXPORT namespace winrt::param\n{\n    struct hstring\n    {\n#ifdef _MSC_VER\n#pragma warning(suppress: 26495)\n#endif\n        hstring() noexcept : m_handle(nullptr) {}\n        hstring(hstring const& values) = delete;\n        hstring& operator=(hstring const& values) = delete;\n        hstring(std::nullptr_t) = delete;\n\n#ifdef _MSC_VER\n#pragma warning(suppress: 26495)\n#endif\n        hstring(winrt::hstring const& value) noexcept : m_handle(get_abi(value))\n        {\n        }\n\n        hstring(std::wstring_view const& value) noexcept\n        {\n            create_string_reference(value.data(), value.size());\n        }\n\n        hstring(std::wstring const& value) noexcept\n        {\n            create_string_reference(value.data(), value.size());\n        }\n\n        hstring(wchar_t const* const value) noexcept\n        {\n            create_string_reference(value, wcslen(value));\n        }\n\n        operator winrt::hstring const&() const noexcept\n        {\n            return *reinterpret_cast<winrt::hstring const*>(this);\n        }\n\n    private:\n        void create_string_reference(wchar_t const* const data, size_t size) noexcept\n        {\n            WINRT_ASSERT(size < UINT_MAX);\n            auto size32 = static_cast<uint32_t>(size);\n\n            if (size32 == 0)\n            {\n                m_handle = nullptr;\n            }\n            else\n            {\n                impl::create_hstring_on_stack(m_header, data, size32);\n                m_handle = &m_header;\n            }\n        }\n\n        void* m_handle;\n        impl::hstring_header m_header;\n    };\n\n    inline void* get_abi(hstring const& object) noexcept\n    {\n        return *(void**)(&object);\n    }\n}\n\nnamespace winrt::impl\n{\n    template <typename T>\n    using param_type = std::conditional_t<std::is_same_v<T, hstring>, param::hstring, T>;\n}\n"
                   );
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar3,auStack_4a8._0_8_,
               "\nWINRT_EXPORT namespace winrt::param\n{\n    struct hstring\n    {\n#ifdef _MSC_VER\n#pragma warning(suppress: 26495)\n#endif\n        hstring() noexcept : m_handle(nullptr) {}\n        hstring(hstring const& values) = delete;\n        hstring& operator=(hstring const& values) = delete;\n        hstring(std::nullptr_t) = delete;\n\n#ifdef _MSC_VER\n#pragma warning(suppress: 26495)\n#endif\n        hstring(winrt::hstring const& value) noexcept : m_handle(get_abi(value))\n        {\n        }\n\n        hstring(std::wstring_view const& value) noexcept\n        {\n            create_string_reference(value.data(), value.size());\n        }\n\n        hstring(std::wstring const& value) noexcept\n        {\n            create_string_reference(value.data(), value.size());\n        }\n\n        hstring(wchar_t const* const value) noexcept\n        {\n            create_string_reference(value, wcslen(value));\n        }\n\n        operator winrt::hstring const&() const noexcept\n        {\n            return *reinterpret_cast<winrt::hstring const*>(this);\n        }\n\n    private:\n        void create_string_reference(wchar_t const* const data, size_t size) noexcept\n        {\n            WINRT_ASSERT(size < UINT_MAX);\n            auto size32 = static_cast<uint32_t>(size);\n\n            if (size32 == 0)\n            {\n                m_handle = nullptr;\n            }\n            else\n            {\n                impl::create_hstring_on_stack(m_header, data, size32);\n                m_handle = &m_header;\n            }\n        }\n\n        void* m_handle;\n        impl::hstring_header m_header;\n    };\n\n    inline void* get_abi(hstring const& object) noexcept\n    {\n        return *(void**)(&object);\n    }\n}\n\nnamespace winrt::impl\n{\n    template <typename T>\n    using param_type = std::conditional_t<std::is_same_v<T, hstring>, param::hstring, T>;\n}\n"
               ,"\nWINRT_EXPORT namespace winrt::param\n{\n    struct hstring\n    {\n#ifdef _MSC_VER\n#pragma warning(suppress: 26495)\n#endif\n        hstring() noexcept : m_handle(nullptr) {}\n        hstring(hstring const& values) = delete;\n        hstring& operator=(hstring const& values) = delete;\n        hstring(std::nullptr_t) = delete;\n\n#ifdef _MSC_VER\n#pragma warning(suppress: 26495)\n#endif\n        hstring(winrt::hstring const& value) noexcept : m_handle(get_abi(value))\n        {\n        }\n\n        hstring(std::wstring_view const& value) noexcept\n        {\n            create_string_reference(value.data(), value.size());\n        }\n\n        hstring(std::wstring const& value) noexcept\n        {\n            create_string_reference(value.data(), value.size());\n        }\n\n        hstring(wchar_t const* const value) noexcept\n        {\n            create_string_reference(value, wcslen(value));\n        }\n\n        operator winrt::hstring const&() const noexcept\n        {\n            return *reinterpret_cast<winrt::hstring const*>(this);\n        }\n\n    private:\n        void create_string_reference(wchar_t const* const data, size_t size) noexcept\n        {\n            WINRT_ASSERT(size < UINT_MAX);\n            auto size32 = static_cast<uint32_t>(size);\n\n            if (size32 == 0)\n            {\n                m_handle = nullptr;\n            }\n            else\n            {\n                impl::create_hstring_on_stack(m_header, data, size32);\n                m_handle = &m_header;\n            }\n        }\n\n        void* m_handle;\n        impl::hstring_header m_header;\n    };\n\n    inline void* get_abi(hstring const& object) noexcept\n    {\n        return *(void**)(&object);\n    }\n}\n\nnamespace winrt::impl\n{\n    template <typename T>\n    using param_type = std::conditional_t<std::is_same_v<T, hstring>, param::hstring, T>;\n}\n"
                + sVar36);
    sVar36 = strlen(
                   "\nWINRT_EXPORT namespace winrt\n{\n    inline bool operator==(hstring const& left, hstring const& right) noexcept\n    {\n        return std::wstring_view(left) == std::wstring_view(right);\n    }\n\n    inline bool operator==(hstring const& left, std::wstring const& right) noexcept\n    {\n        return std::wstring_view(left) == right;\n    }\n\n    inline bool operator==(std::wstring const& left, hstring const& right) noexcept\n    {\n        return left == std::wstring_view(right);\n    }\n\n    inline bool operator==(hstring const& left, wchar_t const* right) noexcept\n    {\n        return std::wstring_view(left) == right;\n    }\n\n    inline bool operator==(wchar_t const* left, hstring const& right) noexcept\n    {\n        return left == std::wstring_view(right);\n    }\n\n    bool operator==(hstring const& left, std::nullptr_t) = delete;\n\n    bool operator==(std::nullptr_t, hstring const& right) = delete;\n\n    inline bool operator<(hstring const& left, hstring const& right) noexcept\n    {\n        return std::wstring_view(left) < std::wstring_view(right);\n    }\n\n    inline bool operator<(std::wstring const& left, hstring const& right) noexcept\n    {\n        return left < std::wstring_view(right);\n    }\n\n    inline bool operator<(hstring const& left, std::wstring const& right) noexcept\n    {\n        return std::wstring_view(left) < right;\n    }\n\n    inline bool operator<(hstring const& left, wchar_t const* right) noexcept\n    {\n        return std::wstring_view(left) < right;\n    }\n\n    inline bool operator<(wchar_t const* left, hstring const& right) noexcept\n    {\n        return left < std::wstring_view(right);\n    }\n\n    bool operator<(hstring const& left, std::nullptr_t) = delete;\n\n    bool operator<(std::nullptr_t, hstring const& right) = delete;\n    inline bool operator!=(hstring const& left, hstring const& right) noexcept { return !(left == right); }\n    inline bool operator>(hstring const& left, hstring const& right) noexcept { return right < left; }\n    inline bool operator<=(hstring const& left, hstring const& right) noexce..." /* TRUNCATED STRING LITERAL */
                   );
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar3,auStack_4a8._0_8_,
               "\nWINRT_EXPORT namespace winrt\n{\n    inline bool operator==(hstring const& left, hstring const& right) noexcept\n    {\n        return std::wstring_view(left) == std::wstring_view(right);\n    }\n\n    inline bool operator==(hstring const& left, std::wstring const& right) noexcept\n    {\n        return std::wstring_view(left) == right;\n    }\n\n    inline bool operator==(std::wstring const& left, hstring const& right) noexcept\n    {\n        return left == std::wstring_view(right);\n    }\n\n    inline bool operator==(hstring const& left, wchar_t const* right) noexcept\n    {\n        return std::wstring_view(left) == right;\n    }\n\n    inline bool operator==(wchar_t const* left, hstring const& right) noexcept\n    {\n        return left == std::wstring_view(right);\n    }\n\n    bool operator==(hstring const& left, std::nullptr_t) = delete;\n\n    bool operator==(std::nullptr_t, hstring const& right) = delete;\n\n    inline bool operator<(hstring const& left, hstring const& right) noexcept\n    {\n        return std::wstring_view(left) < std::wstring_view(right);\n    }\n\n    inline bool operator<(std::wstring const& left, hstring const& right) noexcept\n    {\n        return left < std::wstring_view(right);\n    }\n\n    inline bool operator<(hstring const& left, std::wstring const& right) noexcept\n    {\n        return std::wstring_view(left) < right;\n    }\n\n    inline bool operator<(hstring const& left, wchar_t const* right) noexcept\n    {\n        return std::wstring_view(left) < right;\n    }\n\n    inline bool operator<(wchar_t const* left, hstring const& right) noexcept\n    {\n        return left < std::wstring_view(right);\n    }\n\n    bool operator<(hstring const& left, std::nullptr_t) = delete;\n\n    bool operator<(std::nullptr_t, hstring const& right) = delete;\n    inline bool operator!=(hstring const& left, hstring const& right) noexcept { return !(left == right); }\n    inline bool operator>(hstring const& left, hstring const& right) noexcept { return right < left; }\n    inline bool operator<=(hstring const& left, hstring const& right) noexce..." /* TRUNCATED STRING LITERAL */
               ,"\nWINRT_EXPORT namespace winrt\n{\n    inline bool operator==(hstring const& left, hstring const& right) noexcept\n    {\n        return std::wstring_view(left) == std::wstring_view(right);\n    }\n\n    inline bool operator==(hstring const& left, std::wstring const& right) noexcept\n    {\n        return std::wstring_view(left) == right;\n    }\n\n    inline bool operator==(std::wstring const& left, hstring const& right) noexcept\n    {\n        return left == std::wstring_view(right);\n    }\n\n    inline bool operator==(hstring const& left, wchar_t const* right) noexcept\n    {\n        return std::wstring_view(left) == right;\n    }\n\n    inline bool operator==(wchar_t const* left, hstring const& right) noexcept\n    {\n        return left == std::wstring_view(right);\n    }\n\n    bool operator==(hstring const& left, std::nullptr_t) = delete;\n\n    bool operator==(std::nullptr_t, hstring const& right) = delete;\n\n    inline bool operator<(hstring const& left, hstring const& right) noexcept\n    {\n        return std::wstring_view(left) < std::wstring_view(right);\n    }\n\n    inline bool operator<(std::wstring const& left, hstring const& right) noexcept\n    {\n        return left < std::wstring_view(right);\n    }\n\n    inline bool operator<(hstring const& left, std::wstring const& right) noexcept\n    {\n        return std::wstring_view(left) < right;\n    }\n\n    inline bool operator<(hstring const& left, wchar_t const* right) noexcept\n    {\n        return std::wstring_view(left) < right;\n    }\n\n    inline bool operator<(wchar_t const* left, hstring const& right) noexcept\n    {\n        return left < std::wstring_view(right);\n    }\n\n    bool operator<(hstring const& left, std::nullptr_t) = delete;\n\n    bool operator<(std::nullptr_t, hstring const& right) = delete;\n    inline bool operator!=(hstring const& left, hstring const& right) noexcept { return !(left == right); }\n    inline bool operator>(hstring const& left, hstring const& right) noexcept { return right < left; }\n    inline bool operator<=(hstring const& left, hstring const& right) noexce..." /* TRUNCATED STRING LITERAL */
                + sVar36);
    sVar36 = strlen(
                   "\nWINRT_EXPORT namespace winrt\n{\n    template <typename T>\n    struct array_view\n    {\n        using value_type = T;\n        using size_type = uint32_t;\n        using reference = value_type&;\n        using const_reference = value_type const&;\n        using pointer = value_type*;\n        using const_pointer = value_type const*;\n        using iterator = value_type*;\n        using const_iterator = value_type const*;\n        using reverse_iterator = std::reverse_iterator<iterator>;\n        using const_reverse_iterator = std::reverse_iterator<const_iterator>;\n\n        array_view() noexcept = default;\n\n        array_view(pointer data, size_type size) noexcept :\n            m_data(data),\n            m_size(size)\n        {}\n\n        array_view(pointer first, pointer last) noexcept :\n            m_data(first),\n            m_size(static_cast<size_type>(last - first))\n        {}\n\n        array_view(std::initializer_list<value_type> value) noexcept :\n            array_view(value.begin(), static_cast<size_type>(value.size()))\n        {}\n\n        template <typename C, size_type N>\n        array_view(C(&value)[N]) noexcept :\n            array_view(value, N)\n        {}\n\n        template <typename C>\n        array_view(std::vector<C>& value) noexcept :\n            array_view(data(value), static_cast<size_type>(value.size()))\n        {\n        }\n\n        template <typename C>\n        array_view(std::vector<C> const& value) noexcept :\n            array_view(data(value), static_cast<size_type>(value.size()))\n        {\n        }\n\n        template <typename C, size_t N>\n        array_view(std::array<C, N>& value) noexcept :\n            array_view(value.data(), static_cast<size_type>(value.size()))\n        {}\n\n        template <typename C, size_t N>\n        array_view(std::array<C, N> const& value) noexcept :\n            array_view(value.data(), static_cast<size_type>(value.size()))\n        {}\n\n        template <typename OtherType>\n        array_view(array_view<OtherType> const& other,\n            std::enable_if_t<std::is_convertible_v<..." /* TRUNCATED STRING LITERAL */
                   );
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar3,auStack_4a8._0_8_,
               "\nWINRT_EXPORT namespace winrt\n{\n    template <typename T>\n    struct array_view\n    {\n        using value_type = T;\n        using size_type = uint32_t;\n        using reference = value_type&;\n        using const_reference = value_type const&;\n        using pointer = value_type*;\n        using const_pointer = value_type const*;\n        using iterator = value_type*;\n        using const_iterator = value_type const*;\n        using reverse_iterator = std::reverse_iterator<iterator>;\n        using const_reverse_iterator = std::reverse_iterator<const_iterator>;\n\n        array_view() noexcept = default;\n\n        array_view(pointer data, size_type size) noexcept :\n            m_data(data),\n            m_size(size)\n        {}\n\n        array_view(pointer first, pointer last) noexcept :\n            m_data(first),\n            m_size(static_cast<size_type>(last - first))\n        {}\n\n        array_view(std::initializer_list<value_type> value) noexcept :\n            array_view(value.begin(), static_cast<size_type>(value.size()))\n        {}\n\n        template <typename C, size_type N>\n        array_view(C(&value)[N]) noexcept :\n            array_view(value, N)\n        {}\n\n        template <typename C>\n        array_view(std::vector<C>& value) noexcept :\n            array_view(data(value), static_cast<size_type>(value.size()))\n        {\n        }\n\n        template <typename C>\n        array_view(std::vector<C> const& value) noexcept :\n            array_view(data(value), static_cast<size_type>(value.size()))\n        {\n        }\n\n        template <typename C, size_t N>\n        array_view(std::array<C, N>& value) noexcept :\n            array_view(value.data(), static_cast<size_type>(value.size()))\n        {}\n\n        template <typename C, size_t N>\n        array_view(std::array<C, N> const& value) noexcept :\n            array_view(value.data(), static_cast<size_type>(value.size()))\n        {}\n\n        template <typename OtherType>\n        array_view(array_view<OtherType> const& other,\n            std::enable_if_t<std::is_convertible_v<..." /* TRUNCATED STRING LITERAL */
               ,"\nWINRT_EXPORT namespace winrt\n{\n    template <typename T>\n    struct array_view\n    {\n        using value_type = T;\n        using size_type = uint32_t;\n        using reference = value_type&;\n        using const_reference = value_type const&;\n        using pointer = value_type*;\n        using const_pointer = value_type const*;\n        using iterator = value_type*;\n        using const_iterator = value_type const*;\n        using reverse_iterator = std::reverse_iterator<iterator>;\n        using const_reverse_iterator = std::reverse_iterator<const_iterator>;\n\n        array_view() noexcept = default;\n\n        array_view(pointer data, size_type size) noexcept :\n            m_data(data),\n            m_size(size)\n        {}\n\n        array_view(pointer first, pointer last) noexcept :\n            m_data(first),\n            m_size(static_cast<size_type>(last - first))\n        {}\n\n        array_view(std::initializer_list<value_type> value) noexcept :\n            array_view(value.begin(), static_cast<size_type>(value.size()))\n        {}\n\n        template <typename C, size_type N>\n        array_view(C(&value)[N]) noexcept :\n            array_view(value, N)\n        {}\n\n        template <typename C>\n        array_view(std::vector<C>& value) noexcept :\n            array_view(data(value), static_cast<size_type>(value.size()))\n        {\n        }\n\n        template <typename C>\n        array_view(std::vector<C> const& value) noexcept :\n            array_view(data(value), static_cast<size_type>(value.size()))\n        {\n        }\n\n        template <typename C, size_t N>\n        array_view(std::array<C, N>& value) noexcept :\n            array_view(value.data(), static_cast<size_type>(value.size()))\n        {}\n\n        template <typename C, size_t N>\n        array_view(std::array<C, N> const& value) noexcept :\n            array_view(value.data(), static_cast<size_type>(value.size()))\n        {}\n\n        template <typename OtherType>\n        array_view(array_view<OtherType> const& other,\n            std::enable_if_t<std::is_convertible_v<..." /* TRUNCATED STRING LITERAL */
                + sVar36);
    sVar36 = strlen(
                   "\nWINRT_EXPORT namespace winrt\n{\n    template <typename T>\n    struct weak_ref\n    {\n        weak_ref(std::nullptr_t = nullptr) noexcept {}\n\n        template<typename U = impl::com_ref<T> const&, typename = std::enable_if_t<std::is_convertible_v<U&&, impl::com_ref<T> const&>>>\n        weak_ref(U&& object)\n        {\n            from_com_ref(static_cast<impl::com_ref<T> const&>(object));\n        }\n\n        [[nodiscard]] auto get() const noexcept\n        {\n            if (!m_ref)\n            {\n                return impl::com_ref<T>{ nullptr };\n            }\n\n            if constexpr(impl::is_implements_v<T>)\n            {\n                impl::com_ref<default_interface<T>> temp;\n                m_ref->Resolve(guid_of<T>(), put_abi(temp));\n                void* result = nullptr;\n                if (temp) {\n                    result = get_self<T>(temp);\n                    detach_abi(temp);\n                }\n                return impl::com_ref<T>{ result, take_ownership_from_abi };\n            }\n            else\n            {\n                void* result{};\n                m_ref->Resolve(guid_of<T>(), &result);\n                return impl::com_ref<T>{ result, take_ownership_from_abi };\n            }\n        }\n\n        auto put() noexcept\n        {\n            return m_ref.put();\n        }\n\n        explicit operator bool() const noexcept\n        {\n            return static_cast<bool>(m_ref);\n        }\n\n    private:\n\n        template<typename U>\n        void from_com_ref(U&& object)\n        {\n            if (object)\n            {\n                if constexpr (impl::is_implements_v<T>)\n                {\n                    m_ref = std::move(object->get_weak().m_ref);\n                }\n                else\n                {\n                    // An access violation (crash) on the following line means that the object does not support weak references.\n                    // Avoid using weak_ref/auto_revoke with such objects.\n                    check_hresult(object.template try_as<impl::IWeakReferenceSource>()->GetWeakRe..." /* TRUNCATED STRING LITERAL */
                   );
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar3,auStack_4a8._0_8_,
               "\nWINRT_EXPORT namespace winrt\n{\n    template <typename T>\n    struct weak_ref\n    {\n        weak_ref(std::nullptr_t = nullptr) noexcept {}\n\n        template<typename U = impl::com_ref<T> const&, typename = std::enable_if_t<std::is_convertible_v<U&&, impl::com_ref<T> const&>>>\n        weak_ref(U&& object)\n        {\n            from_com_ref(static_cast<impl::com_ref<T> const&>(object));\n        }\n\n        [[nodiscard]] auto get() const noexcept\n        {\n            if (!m_ref)\n            {\n                return impl::com_ref<T>{ nullptr };\n            }\n\n            if constexpr(impl::is_implements_v<T>)\n            {\n                impl::com_ref<default_interface<T>> temp;\n                m_ref->Resolve(guid_of<T>(), put_abi(temp));\n                void* result = nullptr;\n                if (temp) {\n                    result = get_self<T>(temp);\n                    detach_abi(temp);\n                }\n                return impl::com_ref<T>{ result, take_ownership_from_abi };\n            }\n            else\n            {\n                void* result{};\n                m_ref->Resolve(guid_of<T>(), &result);\n                return impl::com_ref<T>{ result, take_ownership_from_abi };\n            }\n        }\n\n        auto put() noexcept\n        {\n            return m_ref.put();\n        }\n\n        explicit operator bool() const noexcept\n        {\n            return static_cast<bool>(m_ref);\n        }\n\n    private:\n\n        template<typename U>\n        void from_com_ref(U&& object)\n        {\n            if (object)\n            {\n                if constexpr (impl::is_implements_v<T>)\n                {\n                    m_ref = std::move(object->get_weak().m_ref);\n                }\n                else\n                {\n                    // An access violation (crash) on the following line means that the object does not support weak references.\n                    // Avoid using weak_ref/auto_revoke with such objects.\n                    check_hresult(object.template try_as<impl::IWeakReferenceSource>()->GetWeakRe..." /* TRUNCATED STRING LITERAL */
               ,"\nWINRT_EXPORT namespace winrt\n{\n    template <typename T>\n    struct weak_ref\n    {\n        weak_ref(std::nullptr_t = nullptr) noexcept {}\n\n        template<typename U = impl::com_ref<T> const&, typename = std::enable_if_t<std::is_convertible_v<U&&, impl::com_ref<T> const&>>>\n        weak_ref(U&& object)\n        {\n            from_com_ref(static_cast<impl::com_ref<T> const&>(object));\n        }\n\n        [[nodiscard]] auto get() const noexcept\n        {\n            if (!m_ref)\n            {\n                return impl::com_ref<T>{ nullptr };\n            }\n\n            if constexpr(impl::is_implements_v<T>)\n            {\n                impl::com_ref<default_interface<T>> temp;\n                m_ref->Resolve(guid_of<T>(), put_abi(temp));\n                void* result = nullptr;\n                if (temp) {\n                    result = get_self<T>(temp);\n                    detach_abi(temp);\n                }\n                return impl::com_ref<T>{ result, take_ownership_from_abi };\n            }\n            else\n            {\n                void* result{};\n                m_ref->Resolve(guid_of<T>(), &result);\n                return impl::com_ref<T>{ result, take_ownership_from_abi };\n            }\n        }\n\n        auto put() noexcept\n        {\n            return m_ref.put();\n        }\n\n        explicit operator bool() const noexcept\n        {\n            return static_cast<bool>(m_ref);\n        }\n\n    private:\n\n        template<typename U>\n        void from_com_ref(U&& object)\n        {\n            if (object)\n            {\n                if constexpr (impl::is_implements_v<T>)\n                {\n                    m_ref = std::move(object->get_weak().m_ref);\n                }\n                else\n                {\n                    // An access violation (crash) on the following line means that the object does not support weak references.\n                    // Avoid using weak_ref/auto_revoke with such objects.\n                    check_hresult(object.template try_as<impl::IWeakReferenceSource>()->GetWeakRe..." /* TRUNCATED STRING LITERAL */
                + sVar36);
    sVar36 = strlen(
                   "\nWINRT_EXPORT namespace winrt\n{\n#if defined (WINRT_NO_MODULE_LOCK)\n\n    // Defining WINRT_NO_MODULE_LOCK is appropriate for apps (executables) or pinned DLLs (that don\'t support unloading)\n    // and can thus avoid the synchronization overhead imposed by the default module lock.\n\n    constexpr auto get_module_lock() noexcept\n    {\n        struct lock\n        {\n            constexpr uint32_t operator++() noexcept\n            {\n                return 1;\n            }\n\n            constexpr uint32_t operator--() noexcept\n            {\n                return 0;\n            }\n\n            constexpr explicit operator bool() noexcept\n            {\n                return true;\n            }\n        };\n\n        return lock{};\n    }\n\n#elif defined (WINRT_CUSTOM_MODULE_LOCK)\n\n    // When WINRT_CUSTOM_MODULE_LOCK is defined, you must provide an implementation of winrt::get_module_lock()\n    // that returns an object that implements operator++ and operator--.\n\n#else\n\n    // This is the default implementation for use with DllCanUnloadNow.\n\n    inline impl::atomic_ref_count& get_module_lock() noexcept\n    {\n        static impl::atomic_ref_count s_lock;\n        return s_lock;\n    }\n\n#endif\n}\n\nnamespace winrt::impl\n{\n    template<bool UseModuleLock>\n    struct module_lock_updater;\n\n    template<>\n    struct module_lock_updater<true>\n    {\n        module_lock_updater() noexcept\n        {\n            ++get_module_lock();\n        }\n\n        ~module_lock_updater() noexcept\n        {\n            --get_module_lock();\n        }\n    };\n\n    template<>\n    struct module_lock_updater<false> {};\n\n    using update_module_lock = module_lock_updater<true>;\n\n    struct agile_ref_fallback final : IAgileReference, update_module_lock\n    {\n        agile_ref_fallback(com_ptr<IGlobalInterfaceTable>&& git, uint32_t cookie) noexcept :\n            m_git(std::move(git)),\n            m_cookie(cookie)\n        {\n        }\n\n        ~agile_ref_fallback() noexcept\n        {\n            m_git->RevokeInterfaceFromGlobal(m_cookie);\n        }\n\n        int32_t __s..." /* TRUNCATED STRING LITERAL */
                   );
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar3,auStack_4a8._0_8_,
               "\nWINRT_EXPORT namespace winrt\n{\n#if defined (WINRT_NO_MODULE_LOCK)\n\n    // Defining WINRT_NO_MODULE_LOCK is appropriate for apps (executables) or pinned DLLs (that don\'t support unloading)\n    // and can thus avoid the synchronization overhead imposed by the default module lock.\n\n    constexpr auto get_module_lock() noexcept\n    {\n        struct lock\n        {\n            constexpr uint32_t operator++() noexcept\n            {\n                return 1;\n            }\n\n            constexpr uint32_t operator--() noexcept\n            {\n                return 0;\n            }\n\n            constexpr explicit operator bool() noexcept\n            {\n                return true;\n            }\n        };\n\n        return lock{};\n    }\n\n#elif defined (WINRT_CUSTOM_MODULE_LOCK)\n\n    // When WINRT_CUSTOM_MODULE_LOCK is defined, you must provide an implementation of winrt::get_module_lock()\n    // that returns an object that implements operator++ and operator--.\n\n#else\n\n    // This is the default implementation for use with DllCanUnloadNow.\n\n    inline impl::atomic_ref_count& get_module_lock() noexcept\n    {\n        static impl::atomic_ref_count s_lock;\n        return s_lock;\n    }\n\n#endif\n}\n\nnamespace winrt::impl\n{\n    template<bool UseModuleLock>\n    struct module_lock_updater;\n\n    template<>\n    struct module_lock_updater<true>\n    {\n        module_lock_updater() noexcept\n        {\n            ++get_module_lock();\n        }\n\n        ~module_lock_updater() noexcept\n        {\n            --get_module_lock();\n        }\n    };\n\n    template<>\n    struct module_lock_updater<false> {};\n\n    using update_module_lock = module_lock_updater<true>;\n\n    struct agile_ref_fallback final : IAgileReference, update_module_lock\n    {\n        agile_ref_fallback(com_ptr<IGlobalInterfaceTable>&& git, uint32_t cookie) noexcept :\n            m_git(std::move(git)),\n            m_cookie(cookie)\n        {\n        }\n\n        ~agile_ref_fallback() noexcept\n        {\n            m_git->RevokeInterfaceFromGlobal(m_cookie);\n        }\n\n        int32_t __s..." /* TRUNCATED STRING LITERAL */
               ,"\nWINRT_EXPORT namespace winrt\n{\n#if defined (WINRT_NO_MODULE_LOCK)\n\n    // Defining WINRT_NO_MODULE_LOCK is appropriate for apps (executables) or pinned DLLs (that don\'t support unloading)\n    // and can thus avoid the synchronization overhead imposed by the default module lock.\n\n    constexpr auto get_module_lock() noexcept\n    {\n        struct lock\n        {\n            constexpr uint32_t operator++() noexcept\n            {\n                return 1;\n            }\n\n            constexpr uint32_t operator--() noexcept\n            {\n                return 0;\n            }\n\n            constexpr explicit operator bool() noexcept\n            {\n                return true;\n            }\n        };\n\n        return lock{};\n    }\n\n#elif defined (WINRT_CUSTOM_MODULE_LOCK)\n\n    // When WINRT_CUSTOM_MODULE_LOCK is defined, you must provide an implementation of winrt::get_module_lock()\n    // that returns an object that implements operator++ and operator--.\n\n#else\n\n    // This is the default implementation for use with DllCanUnloadNow.\n\n    inline impl::atomic_ref_count& get_module_lock() noexcept\n    {\n        static impl::atomic_ref_count s_lock;\n        return s_lock;\n    }\n\n#endif\n}\n\nnamespace winrt::impl\n{\n    template<bool UseModuleLock>\n    struct module_lock_updater;\n\n    template<>\n    struct module_lock_updater<true>\n    {\n        module_lock_updater() noexcept\n        {\n            ++get_module_lock();\n        }\n\n        ~module_lock_updater() noexcept\n        {\n            --get_module_lock();\n        }\n    };\n\n    template<>\n    struct module_lock_updater<false> {};\n\n    using update_module_lock = module_lock_updater<true>;\n\n    struct agile_ref_fallback final : IAgileReference, update_module_lock\n    {\n        agile_ref_fallback(com_ptr<IGlobalInterfaceTable>&& git, uint32_t cookie) noexcept :\n            m_git(std::move(git)),\n            m_cookie(cookie)\n        {\n        }\n\n        ~agile_ref_fallback() noexcept\n        {\n            m_git->RevokeInterfaceFromGlobal(m_cookie);\n        }\n\n        int32_t __s..." /* TRUNCATED STRING LITERAL */
                + sVar36);
    sVar36 = strlen(
                   "\n#if defined(_MSC_VER)\n#define WINRT_IMPL_RETURNADDRESS() _ReturnAddress()\n#elif defined(__GNUC__)\n#define WINRT_IMPL_RETURNADDRESS() __builtin_extract_return_addr(__builtin_return_address(0))\n#else\n#define WINRT_IMPL_RETURNADDRESS() nullptr\n#endif\n\nnamespace winrt::impl\n{\n    struct heap_traits\n    {\n        using type = wchar_t*;\n\n        static void close(type value) noexcept\n        {\n            WINRT_VERIFY(WINRT_IMPL_HeapFree(WINRT_IMPL_GetProcessHeap(), 0, value));\n        }\n\n        static constexpr type invalid() noexcept\n        {\n            return nullptr;\n        }\n    };\n\n    struct bstr_traits\n    {\n        using type = wchar_t*;\n\n        static void close(type value) noexcept\n        {\n            WINRT_IMPL_SysFreeString(value);\n        }\n\n        static constexpr type invalid() noexcept\n        {\n            return nullptr;\n        }\n    };\n\n    using bstr_handle = handle_type<bstr_traits>;\n\n    inline hstring trim_hresult_message(wchar_t const* const message, uint32_t size) noexcept\n    {\n        wchar_t const* back = message + size - 1;\n\n        while (size&& iswspace(*back))\n        {\n            --size;\n            --back;\n        }\n\n        return { message, size };\n    }\n\n    inline hstring message_from_hresult(hresult code) noexcept\n    {\n        handle_type<impl::heap_traits> message;\n\n        uint32_t const size = WINRT_IMPL_FormatMessageW(0x00001300, // FORMAT_MESSAGE_ALLOCATE_BUFFER | FORMAT_MESSAGE_FROM_SYSTEM | FORMAT_MESSAGE_IGNORE_INSERTS\n            nullptr,\n            code,\n            0x00000400, // MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT)\n            reinterpret_cast<wchar_t*>(message.put()),\n            0,\n            nullptr);\n\n        return trim_hresult_message(message.get(), size);\n    }\n\n    constexpr int32_t hresult_from_win32(uint32_t const x) noexcept\n    {\n        return (int32_t)(x) <= 0 ? (int32_t)(x) : (int32_t)(((x) & 0x0000FFFF) | (7 << 16) | 0x80000000);\n    }\n\n    constexpr int32_t hresult_from_nt(uint32_t const x) noexcept\n    {\n        return ((int32_t)((..." /* TRUNCATED STRING LITERAL */
                   );
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar3,auStack_4a8._0_8_,
               "\n#if defined(_MSC_VER)\n#define WINRT_IMPL_RETURNADDRESS() _ReturnAddress()\n#elif defined(__GNUC__)\n#define WINRT_IMPL_RETURNADDRESS() __builtin_extract_return_addr(__builtin_return_address(0))\n#else\n#define WINRT_IMPL_RETURNADDRESS() nullptr\n#endif\n\nnamespace winrt::impl\n{\n    struct heap_traits\n    {\n        using type = wchar_t*;\n\n        static void close(type value) noexcept\n        {\n            WINRT_VERIFY(WINRT_IMPL_HeapFree(WINRT_IMPL_GetProcessHeap(), 0, value));\n        }\n\n        static constexpr type invalid() noexcept\n        {\n            return nullptr;\n        }\n    };\n\n    struct bstr_traits\n    {\n        using type = wchar_t*;\n\n        static void close(type value) noexcept\n        {\n            WINRT_IMPL_SysFreeString(value);\n        }\n\n        static constexpr type invalid() noexcept\n        {\n            return nullptr;\n        }\n    };\n\n    using bstr_handle = handle_type<bstr_traits>;\n\n    inline hstring trim_hresult_message(wchar_t const* const message, uint32_t size) noexcept\n    {\n        wchar_t const* back = message + size - 1;\n\n        while (size&& iswspace(*back))\n        {\n            --size;\n            --back;\n        }\n\n        return { message, size };\n    }\n\n    inline hstring message_from_hresult(hresult code) noexcept\n    {\n        handle_type<impl::heap_traits> message;\n\n        uint32_t const size = WINRT_IMPL_FormatMessageW(0x00001300, // FORMAT_MESSAGE_ALLOCATE_BUFFER | FORMAT_MESSAGE_FROM_SYSTEM | FORMAT_MESSAGE_IGNORE_INSERTS\n            nullptr,\n            code,\n            0x00000400, // MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT)\n            reinterpret_cast<wchar_t*>(message.put()),\n            0,\n            nullptr);\n\n        return trim_hresult_message(message.get(), size);\n    }\n\n    constexpr int32_t hresult_from_win32(uint32_t const x) noexcept\n    {\n        return (int32_t)(x) <= 0 ? (int32_t)(x) : (int32_t)(((x) & 0x0000FFFF) | (7 << 16) | 0x80000000);\n    }\n\n    constexpr int32_t hresult_from_nt(uint32_t const x) noexcept\n    {\n        return ((int32_t)((..." /* TRUNCATED STRING LITERAL */
               ,"\n#if defined(_MSC_VER)\n#define WINRT_IMPL_RETURNADDRESS() _ReturnAddress()\n#elif defined(__GNUC__)\n#define WINRT_IMPL_RETURNADDRESS() __builtin_extract_return_addr(__builtin_return_address(0))\n#else\n#define WINRT_IMPL_RETURNADDRESS() nullptr\n#endif\n\nnamespace winrt::impl\n{\n    struct heap_traits\n    {\n        using type = wchar_t*;\n\n        static void close(type value) noexcept\n        {\n            WINRT_VERIFY(WINRT_IMPL_HeapFree(WINRT_IMPL_GetProcessHeap(), 0, value));\n        }\n\n        static constexpr type invalid() noexcept\n        {\n            return nullptr;\n        }\n    };\n\n    struct bstr_traits\n    {\n        using type = wchar_t*;\n\n        static void close(type value) noexcept\n        {\n            WINRT_IMPL_SysFreeString(value);\n        }\n\n        static constexpr type invalid() noexcept\n        {\n            return nullptr;\n        }\n    };\n\n    using bstr_handle = handle_type<bstr_traits>;\n\n    inline hstring trim_hresult_message(wchar_t const* const message, uint32_t size) noexcept\n    {\n        wchar_t const* back = message + size - 1;\n\n        while (size&& iswspace(*back))\n        {\n            --size;\n            --back;\n        }\n\n        return { message, size };\n    }\n\n    inline hstring message_from_hresult(hresult code) noexcept\n    {\n        handle_type<impl::heap_traits> message;\n\n        uint32_t const size = WINRT_IMPL_FormatMessageW(0x00001300, // FORMAT_MESSAGE_ALLOCATE_BUFFER | FORMAT_MESSAGE_FROM_SYSTEM | FORMAT_MESSAGE_IGNORE_INSERTS\n            nullptr,\n            code,\n            0x00000400, // MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT)\n            reinterpret_cast<wchar_t*>(message.put()),\n            0,\n            nullptr);\n\n        return trim_hresult_message(message.get(), size);\n    }\n\n    constexpr int32_t hresult_from_win32(uint32_t const x) noexcept\n    {\n        return (int32_t)(x) <= 0 ? (int32_t)(x) : (int32_t)(((x) & 0x0000FFFF) | (7 << 16) | 0x80000000);\n    }\n\n    constexpr int32_t hresult_from_nt(uint32_t const x) noexcept\n    {\n        return ((int32_t)((..." /* TRUNCATED STRING LITERAL */
                + sVar36);
    sVar36 = strlen(
                   "\nnamespace winrt::impl\n{\n    inline int32_t make_marshaler(unknown_abi* outer, void** result) noexcept\n    {\n        struct marshaler final : IMarshal\n        {\n            marshaler(unknown_abi* object) noexcept\n            {\n                m_object.copy_from(object);\n            }\n\n            int32_t __stdcall QueryInterface(guid const& id, void** object) noexcept final\n            {\n                if (is_guid_of<IMarshal>(id))\n                {\n                    *object = static_cast<IMarshal*>(this);\n                    AddRef();\n                    return 0;\n                }\n\n                return m_object->QueryInterface(id, object);\n            }\n\n            uint32_t __stdcall AddRef() noexcept final\n            {\n                return ++m_references;\n            }\n\n            uint32_t __stdcall Release() noexcept final\n            {\n                auto const remaining = --m_references;\n\n                if (remaining == 0)\n                {\n                    delete this;\n                }\n\n                return remaining;\n            }\n\n            int32_t __stdcall GetUnmarshalClass(guid const& riid, void* pv, uint32_t dwDestContext, void* pvDestContext, uint32_t mshlflags, guid* pCid) noexcept final\n            {\n                if (m_marshaler)\n                {\n                    return m_marshaler->GetUnmarshalClass(riid, pv, dwDestContext, pvDestContext, mshlflags, pCid);\n                }\n\n                return error_bad_alloc;\n            }\n\n            int32_t __stdcall GetMarshalSizeMax(guid const& riid, void* pv, uint32_t dwDestContext, void* pvDestContext, uint32_t mshlflags, uint32_t* pSize) noexcept final\n            {\n                if (m_marshaler)\n                {\n                    return m_marshaler->GetMarshalSizeMax(riid, pv, dwDestContext, pvDestContext, mshlflags, pSize);\n                }\n\n                return error_bad_alloc;\n            }\n\n            int32_t __stdcall MarshalInterface(void* pStm, guid const& riid, void* pv, uint32_t dwDestContext, void* pvDes..." /* TRUNCATED STRING LITERAL */
                   );
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar3,auStack_4a8._0_8_,
               "\nnamespace winrt::impl\n{\n    inline int32_t make_marshaler(unknown_abi* outer, void** result) noexcept\n    {\n        struct marshaler final : IMarshal\n        {\n            marshaler(unknown_abi* object) noexcept\n            {\n                m_object.copy_from(object);\n            }\n\n            int32_t __stdcall QueryInterface(guid const& id, void** object) noexcept final\n            {\n                if (is_guid_of<IMarshal>(id))\n                {\n                    *object = static_cast<IMarshal*>(this);\n                    AddRef();\n                    return 0;\n                }\n\n                return m_object->QueryInterface(id, object);\n            }\n\n            uint32_t __stdcall AddRef() noexcept final\n            {\n                return ++m_references;\n            }\n\n            uint32_t __stdcall Release() noexcept final\n            {\n                auto const remaining = --m_references;\n\n                if (remaining == 0)\n                {\n                    delete this;\n                }\n\n                return remaining;\n            }\n\n            int32_t __stdcall GetUnmarshalClass(guid const& riid, void* pv, uint32_t dwDestContext, void* pvDestContext, uint32_t mshlflags, guid* pCid) noexcept final\n            {\n                if (m_marshaler)\n                {\n                    return m_marshaler->GetUnmarshalClass(riid, pv, dwDestContext, pvDestContext, mshlflags, pCid);\n                }\n\n                return error_bad_alloc;\n            }\n\n            int32_t __stdcall GetMarshalSizeMax(guid const& riid, void* pv, uint32_t dwDestContext, void* pvDestContext, uint32_t mshlflags, uint32_t* pSize) noexcept final\n            {\n                if (m_marshaler)\n                {\n                    return m_marshaler->GetMarshalSizeMax(riid, pv, dwDestContext, pvDestContext, mshlflags, pSize);\n                }\n\n                return error_bad_alloc;\n            }\n\n            int32_t __stdcall MarshalInterface(void* pStm, guid const& riid, void* pv, uint32_t dwDestContext, void* pvDes..." /* TRUNCATED STRING LITERAL */
               ,"\nnamespace winrt::impl\n{\n    inline int32_t make_marshaler(unknown_abi* outer, void** result) noexcept\n    {\n        struct marshaler final : IMarshal\n        {\n            marshaler(unknown_abi* object) noexcept\n            {\n                m_object.copy_from(object);\n            }\n\n            int32_t __stdcall QueryInterface(guid const& id, void** object) noexcept final\n            {\n                if (is_guid_of<IMarshal>(id))\n                {\n                    *object = static_cast<IMarshal*>(this);\n                    AddRef();\n                    return 0;\n                }\n\n                return m_object->QueryInterface(id, object);\n            }\n\n            uint32_t __stdcall AddRef() noexcept final\n            {\n                return ++m_references;\n            }\n\n            uint32_t __stdcall Release() noexcept final\n            {\n                auto const remaining = --m_references;\n\n                if (remaining == 0)\n                {\n                    delete this;\n                }\n\n                return remaining;\n            }\n\n            int32_t __stdcall GetUnmarshalClass(guid const& riid, void* pv, uint32_t dwDestContext, void* pvDestContext, uint32_t mshlflags, guid* pCid) noexcept final\n            {\n                if (m_marshaler)\n                {\n                    return m_marshaler->GetUnmarshalClass(riid, pv, dwDestContext, pvDestContext, mshlflags, pCid);\n                }\n\n                return error_bad_alloc;\n            }\n\n            int32_t __stdcall GetMarshalSizeMax(guid const& riid, void* pv, uint32_t dwDestContext, void* pvDestContext, uint32_t mshlflags, uint32_t* pSize) noexcept final\n            {\n                if (m_marshaler)\n                {\n                    return m_marshaler->GetMarshalSizeMax(riid, pv, dwDestContext, pvDestContext, mshlflags, pSize);\n                }\n\n                return error_bad_alloc;\n            }\n\n            int32_t __stdcall MarshalInterface(void* pStm, guid const& riid, void* pv, uint32_t dwDestContext, void* pvDes..." /* TRUNCATED STRING LITERAL */
                + sVar36);
    sVar36 = strlen(
                   "\nnamespace winrt::impl\n{\n#if defined(_MSC_VER)\n#pragma warning(push)\n#pragma warning(disable:4458) // declaration hides class member (okay because we do not use named members of base class)\n#endif\n\n    template <typename T, typename H>\n    struct implements_delegate : abi_t<T>, H, update_module_lock\n    {\n        implements_delegate(H&& handler) : H(std::forward<H>(handler))\n        {\n        }\n\n        int32_t __stdcall QueryInterface(guid const& id, void** result) noexcept final\n        {\n            if (is_guid_of<T>(id) || is_guid_of<Windows::Foundation::IUnknown>(id) || is_guid_of<IAgileObject>(id))\n            {\n                *result = static_cast<abi_t<T>*>(this);\n                AddRef();\n                return 0;\n            }\n\n            if (is_guid_of<IMarshal>(id))\n            {\n                return make_marshaler(this, result);\n            }\n\n            *result = nullptr;\n            return error_no_interface;\n        }\n\n        uint32_t __stdcall AddRef() noexcept final\n        {\n            return ++m_references;\n        }\n\n        uint32_t __stdcall Release() noexcept final\n        {\n            auto const remaining = --m_references;\n\n            if (remaining == 0)\n            {\n                delete static_cast<delegate<T, H>*>(this);\n            }\n\n            return remaining;\n        }\n\n    private:\n\n        atomic_ref_count m_references{ 1 };\n    };\n\n    template <typename T, typename H>\n    T make_delegate(H&& handler)\n    {\n        return { static_cast<void*>(static_cast<abi_t<T>*>(new delegate<T, H>(std::forward<H>(handler)))), take_ownership_from_abi };\n    }\n\n    template <typename T>\n    T make_agile_delegate(T const& delegate) noexcept\n    {\n        if constexpr (!has_category_v<T>)\n        {\n            return delegate;\n        }\n        else\n        {\n            if (delegate.template try_as<IAgileObject>())\n            {\n                return delegate;\n            }\n\n            com_ptr<IAgileReference> ref;\n            get_agile_reference(guid_of<T>(), get_abi(delegate), r..." /* TRUNCATED STRING LITERAL */
                   );
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar3,auStack_4a8._0_8_,
               "\nnamespace winrt::impl\n{\n#if defined(_MSC_VER)\n#pragma warning(push)\n#pragma warning(disable:4458) // declaration hides class member (okay because we do not use named members of base class)\n#endif\n\n    template <typename T, typename H>\n    struct implements_delegate : abi_t<T>, H, update_module_lock\n    {\n        implements_delegate(H&& handler) : H(std::forward<H>(handler))\n        {\n        }\n\n        int32_t __stdcall QueryInterface(guid const& id, void** result) noexcept final\n        {\n            if (is_guid_of<T>(id) || is_guid_of<Windows::Foundation::IUnknown>(id) || is_guid_of<IAgileObject>(id))\n            {\n                *result = static_cast<abi_t<T>*>(this);\n                AddRef();\n                return 0;\n            }\n\n            if (is_guid_of<IMarshal>(id))\n            {\n                return make_marshaler(this, result);\n            }\n\n            *result = nullptr;\n            return error_no_interface;\n        }\n\n        uint32_t __stdcall AddRef() noexcept final\n        {\n            return ++m_references;\n        }\n\n        uint32_t __stdcall Release() noexcept final\n        {\n            auto const remaining = --m_references;\n\n            if (remaining == 0)\n            {\n                delete static_cast<delegate<T, H>*>(this);\n            }\n\n            return remaining;\n        }\n\n    private:\n\n        atomic_ref_count m_references{ 1 };\n    };\n\n    template <typename T, typename H>\n    T make_delegate(H&& handler)\n    {\n        return { static_cast<void*>(static_cast<abi_t<T>*>(new delegate<T, H>(std::forward<H>(handler)))), take_ownership_from_abi };\n    }\n\n    template <typename T>\n    T make_agile_delegate(T const& delegate) noexcept\n    {\n        if constexpr (!has_category_v<T>)\n        {\n            return delegate;\n        }\n        else\n        {\n            if (delegate.template try_as<IAgileObject>())\n            {\n                return delegate;\n            }\n\n            com_ptr<IAgileReference> ref;\n            get_agile_reference(guid_of<T>(), get_abi(delegate), r..." /* TRUNCATED STRING LITERAL */
               ,"\nnamespace winrt::impl\n{\n#if defined(_MSC_VER)\n#pragma warning(push)\n#pragma warning(disable:4458) // declaration hides class member (okay because we do not use named members of base class)\n#endif\n\n    template <typename T, typename H>\n    struct implements_delegate : abi_t<T>, H, update_module_lock\n    {\n        implements_delegate(H&& handler) : H(std::forward<H>(handler))\n        {\n        }\n\n        int32_t __stdcall QueryInterface(guid const& id, void** result) noexcept final\n        {\n            if (is_guid_of<T>(id) || is_guid_of<Windows::Foundation::IUnknown>(id) || is_guid_of<IAgileObject>(id))\n            {\n                *result = static_cast<abi_t<T>*>(this);\n                AddRef();\n                return 0;\n            }\n\n            if (is_guid_of<IMarshal>(id))\n            {\n                return make_marshaler(this, result);\n            }\n\n            *result = nullptr;\n            return error_no_interface;\n        }\n\n        uint32_t __stdcall AddRef() noexcept final\n        {\n            return ++m_references;\n        }\n\n        uint32_t __stdcall Release() noexcept final\n        {\n            auto const remaining = --m_references;\n\n            if (remaining == 0)\n            {\n                delete static_cast<delegate<T, H>*>(this);\n            }\n\n            return remaining;\n        }\n\n    private:\n\n        atomic_ref_count m_references{ 1 };\n    };\n\n    template <typename T, typename H>\n    T make_delegate(H&& handler)\n    {\n        return { static_cast<void*>(static_cast<abi_t<T>*>(new delegate<T, H>(std::forward<H>(handler)))), take_ownership_from_abi };\n    }\n\n    template <typename T>\n    T make_agile_delegate(T const& delegate) noexcept\n    {\n        if constexpr (!has_category_v<T>)\n        {\n            return delegate;\n        }\n        else\n        {\n            if (delegate.template try_as<IAgileObject>())\n            {\n                return delegate;\n            }\n\n            com_ptr<IAgileReference> ref;\n            get_agile_reference(guid_of<T>(), get_abi(delegate), r..." /* TRUNCATED STRING LITERAL */
                + sVar36);
    sVar36 = strlen(
                   "\nWINRT_EXPORT namespace winrt\n{\n    struct event_token\n    {\n        int64_t value{};\n\n        explicit operator bool() const noexcept\n        {\n            return value != 0;\n        }\n    };\n\n    inline bool operator==(event_token const& left, event_token const& right) noexcept\n    {\n        return left.value == right.value;\n    }\n\n    struct auto_revoke_t {};\n    inline constexpr auto_revoke_t auto_revoke{};\n\n    template <typename I>\n    struct event_revoker\n    {\n        using method_type = int32_t(__stdcall impl::abi_t<I>::*)(winrt::event_token);\n\n        event_revoker() noexcept = default;\n        event_revoker(event_revoker const&) = delete;\n        event_revoker& operator=(event_revoker const&) = delete;\n        event_revoker(event_revoker&&) noexcept = default;\n\n        event_revoker& operator=(event_revoker&& other) noexcept\n        {\n            if (this != &other)\n            {\n                revoke();\n                m_object = std::move(other.m_object);\n                m_method = other.m_method;\n                m_token = other.m_token;\n            }\n\n            return *this;\n        }\n\n        template <typename U>\n        event_revoker(U&& object, method_type method, event_token token) :\n            m_object(std::forward<U>(object)),\n            m_method(method),\n            m_token(token)\n        {}\n\n        ~event_revoker() noexcept\n        {\n            revoke();\n        }\n\n        void revoke() noexcept\n        {\n            if (I object = std::exchange(m_object, {}).get())\n            {\n                ((*reinterpret_cast<impl::abi_t<I>**>(&object))->*(m_method))(m_token);\n            }\n        }\n\n        explicit operator bool() const noexcept\n        {\n            return m_object ? true : false;\n        }\n\n    private:\n\n        weak_ref<I> m_object;\n        method_type m_method{};\n        event_token m_token{};\n    };\n\n    template <typename I>\n    struct factory_event_revoker\n    {\n        using method_type = int32_t(__stdcall impl::abi_t<I>::*)(winrt::event_token);\n\n        factory_even..." /* TRUNCATED STRING LITERAL */
                   );
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar3,auStack_4a8._0_8_,
               "\nWINRT_EXPORT namespace winrt\n{\n    struct event_token\n    {\n        int64_t value{};\n\n        explicit operator bool() const noexcept\n        {\n            return value != 0;\n        }\n    };\n\n    inline bool operator==(event_token const& left, event_token const& right) noexcept\n    {\n        return left.value == right.value;\n    }\n\n    struct auto_revoke_t {};\n    inline constexpr auto_revoke_t auto_revoke{};\n\n    template <typename I>\n    struct event_revoker\n    {\n        using method_type = int32_t(__stdcall impl::abi_t<I>::*)(winrt::event_token);\n\n        event_revoker() noexcept = default;\n        event_revoker(event_revoker const&) = delete;\n        event_revoker& operator=(event_revoker const&) = delete;\n        event_revoker(event_revoker&&) noexcept = default;\n\n        event_revoker& operator=(event_revoker&& other) noexcept\n        {\n            if (this != &other)\n            {\n                revoke();\n                m_object = std::move(other.m_object);\n                m_method = other.m_method;\n                m_token = other.m_token;\n            }\n\n            return *this;\n        }\n\n        template <typename U>\n        event_revoker(U&& object, method_type method, event_token token) :\n            m_object(std::forward<U>(object)),\n            m_method(method),\n            m_token(token)\n        {}\n\n        ~event_revoker() noexcept\n        {\n            revoke();\n        }\n\n        void revoke() noexcept\n        {\n            if (I object = std::exchange(m_object, {}).get())\n            {\n                ((*reinterpret_cast<impl::abi_t<I>**>(&object))->*(m_method))(m_token);\n            }\n        }\n\n        explicit operator bool() const noexcept\n        {\n            return m_object ? true : false;\n        }\n\n    private:\n\n        weak_ref<I> m_object;\n        method_type m_method{};\n        event_token m_token{};\n    };\n\n    template <typename I>\n    struct factory_event_revoker\n    {\n        using method_type = int32_t(__stdcall impl::abi_t<I>::*)(winrt::event_token);\n\n        factory_even..." /* TRUNCATED STRING LITERAL */
               ,"\nWINRT_EXPORT namespace winrt\n{\n    struct event_token\n    {\n        int64_t value{};\n\n        explicit operator bool() const noexcept\n        {\n            return value != 0;\n        }\n    };\n\n    inline bool operator==(event_token const& left, event_token const& right) noexcept\n    {\n        return left.value == right.value;\n    }\n\n    struct auto_revoke_t {};\n    inline constexpr auto_revoke_t auto_revoke{};\n\n    template <typename I>\n    struct event_revoker\n    {\n        using method_type = int32_t(__stdcall impl::abi_t<I>::*)(winrt::event_token);\n\n        event_revoker() noexcept = default;\n        event_revoker(event_revoker const&) = delete;\n        event_revoker& operator=(event_revoker const&) = delete;\n        event_revoker(event_revoker&&) noexcept = default;\n\n        event_revoker& operator=(event_revoker&& other) noexcept\n        {\n            if (this != &other)\n            {\n                revoke();\n                m_object = std::move(other.m_object);\n                m_method = other.m_method;\n                m_token = other.m_token;\n            }\n\n            return *this;\n        }\n\n        template <typename U>\n        event_revoker(U&& object, method_type method, event_token token) :\n            m_object(std::forward<U>(object)),\n            m_method(method),\n            m_token(token)\n        {}\n\n        ~event_revoker() noexcept\n        {\n            revoke();\n        }\n\n        void revoke() noexcept\n        {\n            if (I object = std::exchange(m_object, {}).get())\n            {\n                ((*reinterpret_cast<impl::abi_t<I>**>(&object))->*(m_method))(m_token);\n            }\n        }\n\n        explicit operator bool() const noexcept\n        {\n            return m_object ? true : false;\n        }\n\n    private:\n\n        weak_ref<I> m_object;\n        method_type m_method{};\n        event_token m_token{};\n    };\n\n    template <typename I>\n    struct factory_event_revoker\n    {\n        using method_type = int32_t(__stdcall impl::abi_t<I>::*)(winrt::event_token);\n\n        factory_even..." /* TRUNCATED STRING LITERAL */
                + sVar36);
    sVar36 = strlen(
                   "\nnamespace winrt::impl\n{\n    struct library_traits\n    {\n        using type = void*;\n\n        static void close(type value) noexcept\n        {\n            WINRT_IMPL_FreeLibrary(value);\n        }\n\n        static constexpr type invalid() noexcept\n        {\n            return nullptr;\n        }\n    };\n\n    using library_handle = handle_type<library_traits>;\n\n    inline int32_t __stdcall fallback_RoGetActivationFactory(void*, guid const&, void** factory) noexcept\n    {\n        *factory = nullptr;\n        return error_class_not_available;\n    }\n\n\n    template <bool isSameInterfaceAsIActivationFactory>\n    WINRT_IMPL_NOINLINE hresult get_runtime_activation_factory_impl(param::hstring const& name, winrt::guid const& guid, void** result) noexcept\n    {\n        if (winrt_activation_handler)\n        {\n            return winrt_activation_handler(*(void**)(&name), guid, result);\n        }\n\n        static int32_t(__stdcall * handler)(void* classId, winrt::guid const& iid, void** factory) noexcept;\n        impl::load_runtime_function(L\"combase.dll\", \"RoGetActivationFactory\", handler, fallback_RoGetActivationFactory);\n        hresult hr = handler(*(void**)(&name), guid, result);\n\n        if (hr == impl::error_not_initialized)\n        {\n            auto usage = reinterpret_cast<int32_t(__stdcall*)(void** cookie) noexcept>(WINRT_IMPL_GetProcAddress(WINRT_IMPL_LoadLibraryW(L\"combase.dll\"), \"CoIncrementMTAUsage\"));\n\n            if (!usage)\n            {\n                return hr;\n            }\n\n            void* cookie;\n            usage(&cookie);\n            hr = handler(*(void**)(&name), guid, result);\n        }\n\n        if (hr == 0)\n        {\n            return 0;\n        }\n\n        com_ptr<IErrorInfo> error_info;\n        WINRT_IMPL_GetErrorInfo(0, error_info.put_void());\n\n        std::wstring path{ static_cast<hstring const&>(name) };\n        std::size_t count{};\n\n        while (std::wstring::npos != (count = path.rfind(\'.\')))\n        {\n            path.resize(count);\n            path += L\".dll\";\n            library_handle lib..." /* TRUNCATED STRING LITERAL */
                   );
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar3,auStack_4a8._0_8_,
               "\nnamespace winrt::impl\n{\n    struct library_traits\n    {\n        using type = void*;\n\n        static void close(type value) noexcept\n        {\n            WINRT_IMPL_FreeLibrary(value);\n        }\n\n        static constexpr type invalid() noexcept\n        {\n            return nullptr;\n        }\n    };\n\n    using library_handle = handle_type<library_traits>;\n\n    inline int32_t __stdcall fallback_RoGetActivationFactory(void*, guid const&, void** factory) noexcept\n    {\n        *factory = nullptr;\n        return error_class_not_available;\n    }\n\n\n    template <bool isSameInterfaceAsIActivationFactory>\n    WINRT_IMPL_NOINLINE hresult get_runtime_activation_factory_impl(param::hstring const& name, winrt::guid const& guid, void** result) noexcept\n    {\n        if (winrt_activation_handler)\n        {\n            return winrt_activation_handler(*(void**)(&name), guid, result);\n        }\n\n        static int32_t(__stdcall * handler)(void* classId, winrt::guid const& iid, void** factory) noexcept;\n        impl::load_runtime_function(L\"combase.dll\", \"RoGetActivationFactory\", handler, fallback_RoGetActivationFactory);\n        hresult hr = handler(*(void**)(&name), guid, result);\n\n        if (hr == impl::error_not_initialized)\n        {\n            auto usage = reinterpret_cast<int32_t(__stdcall*)(void** cookie) noexcept>(WINRT_IMPL_GetProcAddress(WINRT_IMPL_LoadLibraryW(L\"combase.dll\"), \"CoIncrementMTAUsage\"));\n\n            if (!usage)\n            {\n                return hr;\n            }\n\n            void* cookie;\n            usage(&cookie);\n            hr = handler(*(void**)(&name), guid, result);\n        }\n\n        if (hr == 0)\n        {\n            return 0;\n        }\n\n        com_ptr<IErrorInfo> error_info;\n        WINRT_IMPL_GetErrorInfo(0, error_info.put_void());\n\n        std::wstring path{ static_cast<hstring const&>(name) };\n        std::size_t count{};\n\n        while (std::wstring::npos != (count = path.rfind(\'.\')))\n        {\n            path.resize(count);\n            path += L\".dll\";\n            library_handle lib..." /* TRUNCATED STRING LITERAL */
               ,"\nnamespace winrt::impl\n{\n    struct library_traits\n    {\n        using type = void*;\n\n        static void close(type value) noexcept\n        {\n            WINRT_IMPL_FreeLibrary(value);\n        }\n\n        static constexpr type invalid() noexcept\n        {\n            return nullptr;\n        }\n    };\n\n    using library_handle = handle_type<library_traits>;\n\n    inline int32_t __stdcall fallback_RoGetActivationFactory(void*, guid const&, void** factory) noexcept\n    {\n        *factory = nullptr;\n        return error_class_not_available;\n    }\n\n\n    template <bool isSameInterfaceAsIActivationFactory>\n    WINRT_IMPL_NOINLINE hresult get_runtime_activation_factory_impl(param::hstring const& name, winrt::guid const& guid, void** result) noexcept\n    {\n        if (winrt_activation_handler)\n        {\n            return winrt_activation_handler(*(void**)(&name), guid, result);\n        }\n\n        static int32_t(__stdcall * handler)(void* classId, winrt::guid const& iid, void** factory) noexcept;\n        impl::load_runtime_function(L\"combase.dll\", \"RoGetActivationFactory\", handler, fallback_RoGetActivationFactory);\n        hresult hr = handler(*(void**)(&name), guid, result);\n\n        if (hr == impl::error_not_initialized)\n        {\n            auto usage = reinterpret_cast<int32_t(__stdcall*)(void** cookie) noexcept>(WINRT_IMPL_GetProcAddress(WINRT_IMPL_LoadLibraryW(L\"combase.dll\"), \"CoIncrementMTAUsage\"));\n\n            if (!usage)\n            {\n                return hr;\n            }\n\n            void* cookie;\n            usage(&cookie);\n            hr = handler(*(void**)(&name), guid, result);\n        }\n\n        if (hr == 0)\n        {\n            return 0;\n        }\n\n        com_ptr<IErrorInfo> error_info;\n        WINRT_IMPL_GetErrorInfo(0, error_info.put_void());\n\n        std::wstring path{ static_cast<hstring const&>(name) };\n        std::size_t count{};\n\n        while (std::wstring::npos != (count = path.rfind(\'.\')))\n        {\n            path.resize(count);\n            path += L\".dll\";\n            library_handle lib..." /* TRUNCATED STRING LITERAL */
                + sVar36);
    sVar36 = strlen(
                   "#if defined(_MSC_VER)\n#if defined(_DEBUG) && !defined(WINRT_NO_MAKE_DETECTION)\n#pragma detect_mismatch(\"C++/WinRT WINRT_NO_MAKE_DETECTION\", \"make detection enabled (DEBUG and !WINRT_NO_MAKE_DETECTION)\")\n#else\n#pragma detect_mismatch(\"C++/WinRT WINRT_NO_MAKE_DETECTION\", \"make detection disabled (!DEBUG or WINRT_NO_MAKE_DETECTION)\")\n#endif\n#endif\n\nnamespace winrt::impl\n{\n    struct marker\n    {\n        marker() = delete;\n    };\n}\n\nWINRT_EXPORT namespace winrt\n{\n    struct non_agile : impl::marker {};\n    struct no_weak_ref : impl::marker {};\n    struct composing : impl::marker {};\n    struct composable : impl::marker {};\n    struct no_module_lock : impl::marker {};\n    struct static_lifetime : impl::marker {};\n\n    template <typename Interface>\n    struct cloaked : Interface {};\n\n    template <typename D, typename... I>\n    struct implements;\n}\n\nnamespace winrt::impl\n{\n    template<typename...T>\n    using tuple_cat_t = decltype(std::tuple_cat(std::declval<T>()...));\n\n    template <template <typename> typename Condition, typename>\n    struct tuple_if_base;\n\n    template <template <typename> typename Condition, typename...T>\n    struct tuple_if_base<Condition, std::tuple<T...>> { using type = tuple_cat_t<typename std::conditional<Condition<T>::value, std::tuple<T>, std::tuple<>>::type...>; };\n\n    template <template <typename> typename Condition, typename T>\n    using tuple_if = typename tuple_if_base<Condition, T>::type;\n\n    template <typename T>\n    struct is_interface : std::disjunction<std::is_base_of<Windows::Foundation::IInspectable, T>, is_classic_com_interface<T>> {};\n\n    template <typename T>\n    struct is_marker : std::disjunction<std::is_base_of<marker, T>, std::is_void<T>> {};\n\n    template <typename T>\n    struct uncloak_base\n    {\n        using type = T;\n    };\n\n    template <typename T>\n    struct uncloak_base<cloaked<T>>\n    {\n        using type = T;\n    };\n\n    template <typename T>\n    using uncloak = typename uncloak_base<T>::type;\n\n    template <typename I>\n    struct is_cloaked : std::disjuncti..." /* TRUNCATED STRING LITERAL */
                   );
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar3,auStack_4a8._0_8_,
               "#if defined(_MSC_VER)\n#if defined(_DEBUG) && !defined(WINRT_NO_MAKE_DETECTION)\n#pragma detect_mismatch(\"C++/WinRT WINRT_NO_MAKE_DETECTION\", \"make detection enabled (DEBUG and !WINRT_NO_MAKE_DETECTION)\")\n#else\n#pragma detect_mismatch(\"C++/WinRT WINRT_NO_MAKE_DETECTION\", \"make detection disabled (!DEBUG or WINRT_NO_MAKE_DETECTION)\")\n#endif\n#endif\n\nnamespace winrt::impl\n{\n    struct marker\n    {\n        marker() = delete;\n    };\n}\n\nWINRT_EXPORT namespace winrt\n{\n    struct non_agile : impl::marker {};\n    struct no_weak_ref : impl::marker {};\n    struct composing : impl::marker {};\n    struct composable : impl::marker {};\n    struct no_module_lock : impl::marker {};\n    struct static_lifetime : impl::marker {};\n\n    template <typename Interface>\n    struct cloaked : Interface {};\n\n    template <typename D, typename... I>\n    struct implements;\n}\n\nnamespace winrt::impl\n{\n    template<typename...T>\n    using tuple_cat_t = decltype(std::tuple_cat(std::declval<T>()...));\n\n    template <template <typename> typename Condition, typename>\n    struct tuple_if_base;\n\n    template <template <typename> typename Condition, typename...T>\n    struct tuple_if_base<Condition, std::tuple<T...>> { using type = tuple_cat_t<typename std::conditional<Condition<T>::value, std::tuple<T>, std::tuple<>>::type...>; };\n\n    template <template <typename> typename Condition, typename T>\n    using tuple_if = typename tuple_if_base<Condition, T>::type;\n\n    template <typename T>\n    struct is_interface : std::disjunction<std::is_base_of<Windows::Foundation::IInspectable, T>, is_classic_com_interface<T>> {};\n\n    template <typename T>\n    struct is_marker : std::disjunction<std::is_base_of<marker, T>, std::is_void<T>> {};\n\n    template <typename T>\n    struct uncloak_base\n    {\n        using type = T;\n    };\n\n    template <typename T>\n    struct uncloak_base<cloaked<T>>\n    {\n        using type = T;\n    };\n\n    template <typename T>\n    using uncloak = typename uncloak_base<T>::type;\n\n    template <typename I>\n    struct is_cloaked : std::disjuncti..." /* TRUNCATED STRING LITERAL */
               ,"#if defined(_MSC_VER)\n#if defined(_DEBUG) && !defined(WINRT_NO_MAKE_DETECTION)\n#pragma detect_mismatch(\"C++/WinRT WINRT_NO_MAKE_DETECTION\", \"make detection enabled (DEBUG and !WINRT_NO_MAKE_DETECTION)\")\n#else\n#pragma detect_mismatch(\"C++/WinRT WINRT_NO_MAKE_DETECTION\", \"make detection disabled (!DEBUG or WINRT_NO_MAKE_DETECTION)\")\n#endif\n#endif\n\nnamespace winrt::impl\n{\n    struct marker\n    {\n        marker() = delete;\n    };\n}\n\nWINRT_EXPORT namespace winrt\n{\n    struct non_agile : impl::marker {};\n    struct no_weak_ref : impl::marker {};\n    struct composing : impl::marker {};\n    struct composable : impl::marker {};\n    struct no_module_lock : impl::marker {};\n    struct static_lifetime : impl::marker {};\n\n    template <typename Interface>\n    struct cloaked : Interface {};\n\n    template <typename D, typename... I>\n    struct implements;\n}\n\nnamespace winrt::impl\n{\n    template<typename...T>\n    using tuple_cat_t = decltype(std::tuple_cat(std::declval<T>()...));\n\n    template <template <typename> typename Condition, typename>\n    struct tuple_if_base;\n\n    template <template <typename> typename Condition, typename...T>\n    struct tuple_if_base<Condition, std::tuple<T...>> { using type = tuple_cat_t<typename std::conditional<Condition<T>::value, std::tuple<T>, std::tuple<>>::type...>; };\n\n    template <template <typename> typename Condition, typename T>\n    using tuple_if = typename tuple_if_base<Condition, T>::type;\n\n    template <typename T>\n    struct is_interface : std::disjunction<std::is_base_of<Windows::Foundation::IInspectable, T>, is_classic_com_interface<T>> {};\n\n    template <typename T>\n    struct is_marker : std::disjunction<std::is_base_of<marker, T>, std::is_void<T>> {};\n\n    template <typename T>\n    struct uncloak_base\n    {\n        using type = T;\n    };\n\n    template <typename T>\n    struct uncloak_base<cloaked<T>>\n    {\n        using type = T;\n    };\n\n    template <typename T>\n    using uncloak = typename uncloak_base<T>::type;\n\n    template <typename I>\n    struct is_cloaked : std::disjuncti..." /* TRUNCATED STRING LITERAL */
                + sVar36);
    sVar36 = strlen(
                   "\nnamespace winrt::impl\n{\n    template <typename D>\n    struct composable_factory\n    {\n        template <typename I, typename... Args>\n        static I CreateInstance(const Windows::Foundation::IInspectable& outer, Windows::Foundation::IInspectable& inner, Args&&... args)\n        {\n            static_assert(std::is_base_of_v<Windows::Foundation::IInspectable, I>, \"Requested interface must derive from winrt::Windows::Foundation::IInspectable\");\n            inner = CreateInstanceImpl(outer, std::forward<Args>(args)...);\n            return inner.as<I>();\n        }\n\n    private:\n        template <typename... Args>\n        static Windows::Foundation::IInspectable CreateInstanceImpl(const Windows::Foundation::IInspectable& outer, Args&&... args)\n        {\n            // Very specific dance here. The return value must have a ref on the outer, while inner must have a ref count of 1.\n            // Be sure not to make a delegating QueryInterface call because the controlling outer is not fully constructed yet.\n            com_ptr<D> instance = make_self<D>(std::forward<Args>(args)...);\n            instance->m_outer = static_cast<inspectable_abi*>(get_abi(outer));\n            Windows::Foundation::IInspectable inner;\n            attach_abi(inner, to_abi<INonDelegatingInspectable>(detach_abi(instance)));\n            return inner;\n        }\n    };\n\n    template <typename T, typename D, typename I>\n    class WINRT_IMPL_EMPTY_BASES produce_dispatch_to_overridable_base\n    {\n    protected:\n        D& shim() noexcept\n        {\n            return static_cast<T&>(*this).instance;\n        }\n\n        I shim_overridable()\n        {\n            void* result{};\n\n            if (shim().outer())\n            {\n                check_hresult(shim().QueryInterface(guid_of<I>(), &result));\n            }\n\n            return { result, take_ownership_from_abi };\n        }\n    };\n\n    template <typename T, typename D, typename I>\n    struct produce_dispatch_to_overridable;\n\n    template <typename D, typename... I>\n    class dispatch_to_overridable\n..." /* TRUNCATED STRING LITERAL */
                   );
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar3,auStack_4a8._0_8_,
               "\nnamespace winrt::impl\n{\n    template <typename D>\n    struct composable_factory\n    {\n        template <typename I, typename... Args>\n        static I CreateInstance(const Windows::Foundation::IInspectable& outer, Windows::Foundation::IInspectable& inner, Args&&... args)\n        {\n            static_assert(std::is_base_of_v<Windows::Foundation::IInspectable, I>, \"Requested interface must derive from winrt::Windows::Foundation::IInspectable\");\n            inner = CreateInstanceImpl(outer, std::forward<Args>(args)...);\n            return inner.as<I>();\n        }\n\n    private:\n        template <typename... Args>\n        static Windows::Foundation::IInspectable CreateInstanceImpl(const Windows::Foundation::IInspectable& outer, Args&&... args)\n        {\n            // Very specific dance here. The return value must have a ref on the outer, while inner must have a ref count of 1.\n            // Be sure not to make a delegating QueryInterface call because the controlling outer is not fully constructed yet.\n            com_ptr<D> instance = make_self<D>(std::forward<Args>(args)...);\n            instance->m_outer = static_cast<inspectable_abi*>(get_abi(outer));\n            Windows::Foundation::IInspectable inner;\n            attach_abi(inner, to_abi<INonDelegatingInspectable>(detach_abi(instance)));\n            return inner;\n        }\n    };\n\n    template <typename T, typename D, typename I>\n    class WINRT_IMPL_EMPTY_BASES produce_dispatch_to_overridable_base\n    {\n    protected:\n        D& shim() noexcept\n        {\n            return static_cast<T&>(*this).instance;\n        }\n\n        I shim_overridable()\n        {\n            void* result{};\n\n            if (shim().outer())\n            {\n                check_hresult(shim().QueryInterface(guid_of<I>(), &result));\n            }\n\n            return { result, take_ownership_from_abi };\n        }\n    };\n\n    template <typename T, typename D, typename I>\n    struct produce_dispatch_to_overridable;\n\n    template <typename D, typename... I>\n    class dispatch_to_overridable\n..." /* TRUNCATED STRING LITERAL */
               ,"\nnamespace winrt::impl\n{\n    template <typename D>\n    struct composable_factory\n    {\n        template <typename I, typename... Args>\n        static I CreateInstance(const Windows::Foundation::IInspectable& outer, Windows::Foundation::IInspectable& inner, Args&&... args)\n        {\n            static_assert(std::is_base_of_v<Windows::Foundation::IInspectable, I>, \"Requested interface must derive from winrt::Windows::Foundation::IInspectable\");\n            inner = CreateInstanceImpl(outer, std::forward<Args>(args)...);\n            return inner.as<I>();\n        }\n\n    private:\n        template <typename... Args>\n        static Windows::Foundation::IInspectable CreateInstanceImpl(const Windows::Foundation::IInspectable& outer, Args&&... args)\n        {\n            // Very specific dance here. The return value must have a ref on the outer, while inner must have a ref count of 1.\n            // Be sure not to make a delegating QueryInterface call because the controlling outer is not fully constructed yet.\n            com_ptr<D> instance = make_self<D>(std::forward<Args>(args)...);\n            instance->m_outer = static_cast<inspectable_abi*>(get_abi(outer));\n            Windows::Foundation::IInspectable inner;\n            attach_abi(inner, to_abi<INonDelegatingInspectable>(detach_abi(instance)));\n            return inner;\n        }\n    };\n\n    template <typename T, typename D, typename I>\n    class WINRT_IMPL_EMPTY_BASES produce_dispatch_to_overridable_base\n    {\n    protected:\n        D& shim() noexcept\n        {\n            return static_cast<T&>(*this).instance;\n        }\n\n        I shim_overridable()\n        {\n            void* result{};\n\n            if (shim().outer())\n            {\n                check_hresult(shim().QueryInterface(guid_of<I>(), &result));\n            }\n\n            return { result, take_ownership_from_abi };\n        }\n    };\n\n    template <typename T, typename D, typename I>\n    struct produce_dispatch_to_overridable;\n\n    template <typename D, typename... I>\n    class dispatch_to_overridable\n..." /* TRUNCATED STRING LITERAL */
                + sVar36);
    sVar36 = strlen(
                   "\nWINRT_EXPORT namespace winrt::Windows::Foundation\n{\n    struct Point\n    {\n        float X;\n        float Y;\n\n        Point() noexcept = default;\n\n        constexpr Point(float X, float Y) noexcept\n            : X(X), Y(Y)\n        {}\n\n#ifdef WINRT_IMPL_NUMERICS\n\n        constexpr Point(Numerics::float2 const& value) noexcept\n            : X(value.x), Y(value.y)\n        {}\n\n        operator Numerics::float2() const noexcept\n        {\n            return { X, Y };\n        }\n\n#endif\n    };\n\n    constexpr bool operator==(Point const& left, Point const& right) noexcept\n    {\n        return left.X == right.X && left.Y == right.Y;\n    }\n\n    constexpr bool operator!=(Point const& left, Point const& right) noexcept\n    {\n        return !(left == right);\n    }\n\n    struct Size\n    {\n        float Width;\n        float Height;\n\n        Size() noexcept = default;\n\n        constexpr Size(float Width, float Height) noexcept\n            : Width(Width), Height(Height)\n        {}\n\n#ifdef WINRT_IMPL_NUMERICS\n\n        constexpr Size(Numerics::float2 const& value) noexcept\n            : Width(value.x), Height(value.y)\n        {}\n\n        operator Numerics::float2() const noexcept\n        {\n            return { Width, Height };\n        }\n\n#endif\n    };\n\n    constexpr bool operator==(Size const& left, Size const& right) noexcept\n    {\n        return left.Width == right.Width && left.Height == right.Height;\n    }\n\n    constexpr bool operator!=(Size const& left, Size const& right) noexcept\n    {\n        return !(left == right);\n    }\n\n    struct Rect\n    {\n        float X;\n        float Y;\n        float Width;\n        float Height;\n\n        Rect() noexcept = default;\n\n        constexpr Rect(float X, float Y, float Width, float Height) noexcept :\n            X(X), Y(Y), Width(Width), Height(Height)\n        {}\n\n        constexpr Rect(Point const& point, Size const& size)  noexcept :\n            X(point.X), Y(point.Y), Width(size.Width), Height(size.Height)\n        {}\n    };\n\n    constexpr bool operator==(Rect const& left, Rect const& righ..." /* TRUNCATED STRING LITERAL */
                   );
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar3,auStack_4a8._0_8_,
               "\nWINRT_EXPORT namespace winrt::Windows::Foundation\n{\n    struct Point\n    {\n        float X;\n        float Y;\n\n        Point() noexcept = default;\n\n        constexpr Point(float X, float Y) noexcept\n            : X(X), Y(Y)\n        {}\n\n#ifdef WINRT_IMPL_NUMERICS\n\n        constexpr Point(Numerics::float2 const& value) noexcept\n            : X(value.x), Y(value.y)\n        {}\n\n        operator Numerics::float2() const noexcept\n        {\n            return { X, Y };\n        }\n\n#endif\n    };\n\n    constexpr bool operator==(Point const& left, Point const& right) noexcept\n    {\n        return left.X == right.X && left.Y == right.Y;\n    }\n\n    constexpr bool operator!=(Point const& left, Point const& right) noexcept\n    {\n        return !(left == right);\n    }\n\n    struct Size\n    {\n        float Width;\n        float Height;\n\n        Size() noexcept = default;\n\n        constexpr Size(float Width, float Height) noexcept\n            : Width(Width), Height(Height)\n        {}\n\n#ifdef WINRT_IMPL_NUMERICS\n\n        constexpr Size(Numerics::float2 const& value) noexcept\n            : Width(value.x), Height(value.y)\n        {}\n\n        operator Numerics::float2() const noexcept\n        {\n            return { Width, Height };\n        }\n\n#endif\n    };\n\n    constexpr bool operator==(Size const& left, Size const& right) noexcept\n    {\n        return left.Width == right.Width && left.Height == right.Height;\n    }\n\n    constexpr bool operator!=(Size const& left, Size const& right) noexcept\n    {\n        return !(left == right);\n    }\n\n    struct Rect\n    {\n        float X;\n        float Y;\n        float Width;\n        float Height;\n\n        Rect() noexcept = default;\n\n        constexpr Rect(float X, float Y, float Width, float Height) noexcept :\n            X(X), Y(Y), Width(Width), Height(Height)\n        {}\n\n        constexpr Rect(Point const& point, Size const& size)  noexcept :\n            X(point.X), Y(point.Y), Width(size.Width), Height(size.Height)\n        {}\n    };\n\n    constexpr bool operator==(Rect const& left, Rect const& righ..." /* TRUNCATED STRING LITERAL */
               ,"\nWINRT_EXPORT namespace winrt::Windows::Foundation\n{\n    struct Point\n    {\n        float X;\n        float Y;\n\n        Point() noexcept = default;\n\n        constexpr Point(float X, float Y) noexcept\n            : X(X), Y(Y)\n        {}\n\n#ifdef WINRT_IMPL_NUMERICS\n\n        constexpr Point(Numerics::float2 const& value) noexcept\n            : X(value.x), Y(value.y)\n        {}\n\n        operator Numerics::float2() const noexcept\n        {\n            return { X, Y };\n        }\n\n#endif\n    };\n\n    constexpr bool operator==(Point const& left, Point const& right) noexcept\n    {\n        return left.X == right.X && left.Y == right.Y;\n    }\n\n    constexpr bool operator!=(Point const& left, Point const& right) noexcept\n    {\n        return !(left == right);\n    }\n\n    struct Size\n    {\n        float Width;\n        float Height;\n\n        Size() noexcept = default;\n\n        constexpr Size(float Width, float Height) noexcept\n            : Width(Width), Height(Height)\n        {}\n\n#ifdef WINRT_IMPL_NUMERICS\n\n        constexpr Size(Numerics::float2 const& value) noexcept\n            : Width(value.x), Height(value.y)\n        {}\n\n        operator Numerics::float2() const noexcept\n        {\n            return { Width, Height };\n        }\n\n#endif\n    };\n\n    constexpr bool operator==(Size const& left, Size const& right) noexcept\n    {\n        return left.Width == right.Width && left.Height == right.Height;\n    }\n\n    constexpr bool operator!=(Size const& left, Size const& right) noexcept\n    {\n        return !(left == right);\n    }\n\n    struct Rect\n    {\n        float X;\n        float Y;\n        float Width;\n        float Height;\n\n        Rect() noexcept = default;\n\n        constexpr Rect(float X, float Y, float Width, float Height) noexcept :\n            X(X), Y(Y), Width(Width), Height(Height)\n        {}\n\n        constexpr Rect(Point const& point, Size const& size)  noexcept :\n            X(point.X), Y(point.Y), Width(size.Width), Height(size.Height)\n        {}\n    };\n\n    constexpr bool operator==(Rect const& left, Rect const& righ..." /* TRUNCATED STRING LITERAL */
                + sVar36);
    sVar36 = strlen(
                   "\nWINRT_EXPORT namespace winrt\n{\n    struct file_time\n    {\n        uint64_t value{};\n\n        file_time() noexcept = default;\n\n        constexpr explicit file_time(uint64_t const value) noexcept : value(value)\n        {\n        }\n\n#ifdef _FILETIME_\n        constexpr file_time(FILETIME const& value) noexcept\n            : value(value.dwLowDateTime | (static_cast<uint64_t>(value.dwHighDateTime) << 32))\n        {\n        }\n\n        operator FILETIME() const noexcept\n        {\n            return { static_cast<DWORD>(value & 0xFFFFFFFF), static_cast<DWORD>(value >> 32) };\n        }\n#endif\n    };\n\n    struct clock\n    {\n        using rep = int64_t;\n        using period = impl::filetime_period;\n        using duration = Windows::Foundation::TimeSpan;\n        using time_point = Windows::Foundation::DateTime;\n\n        static constexpr bool is_steady = false;\n\n        static time_point now() noexcept\n        {\n            file_time ft;\n            WINRT_IMPL_GetSystemTimePreciseAsFileTime(&ft);\n            return from_file_time(ft);\n        }\n\n        static time_t to_time_t(time_point const& time) noexcept\n        {\n            return static_cast<time_t>(std::chrono::system_clock::to_time_t(std::chrono::time_point_cast<std::chrono::system_clock::duration>(to_sys(time))));\n        }\n\n        static time_point from_time_t(time_t time) noexcept\n        {\n            return from_sys(std::chrono::time_point_cast<duration>(std::chrono::system_clock::from_time_t(time)));\n        }\n\n        static file_time to_file_time(time_point const& time) noexcept\n        {\n            return file_time{ static_cast<uint64_t>(time.time_since_epoch().count()) };\n        }\n\n        static time_point from_file_time(file_time const& time) noexcept\n        {\n            return time_point{ duration{ time.value } };\n        }\n\n        static auto to_FILETIME(time_point const& time) noexcept\n        {\n            return to_file_time(time);\n        }\n\n        static time_point from_FILETIME(file_time const& time) noexcept\n        {\n            return f..." /* TRUNCATED STRING LITERAL */
                   );
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar3,auStack_4a8._0_8_,
               "\nWINRT_EXPORT namespace winrt\n{\n    struct file_time\n    {\n        uint64_t value{};\n\n        file_time() noexcept = default;\n\n        constexpr explicit file_time(uint64_t const value) noexcept : value(value)\n        {\n        }\n\n#ifdef _FILETIME_\n        constexpr file_time(FILETIME const& value) noexcept\n            : value(value.dwLowDateTime | (static_cast<uint64_t>(value.dwHighDateTime) << 32))\n        {\n        }\n\n        operator FILETIME() const noexcept\n        {\n            return { static_cast<DWORD>(value & 0xFFFFFFFF), static_cast<DWORD>(value >> 32) };\n        }\n#endif\n    };\n\n    struct clock\n    {\n        using rep = int64_t;\n        using period = impl::filetime_period;\n        using duration = Windows::Foundation::TimeSpan;\n        using time_point = Windows::Foundation::DateTime;\n\n        static constexpr bool is_steady = false;\n\n        static time_point now() noexcept\n        {\n            file_time ft;\n            WINRT_IMPL_GetSystemTimePreciseAsFileTime(&ft);\n            return from_file_time(ft);\n        }\n\n        static time_t to_time_t(time_point const& time) noexcept\n        {\n            return static_cast<time_t>(std::chrono::system_clock::to_time_t(std::chrono::time_point_cast<std::chrono::system_clock::duration>(to_sys(time))));\n        }\n\n        static time_point from_time_t(time_t time) noexcept\n        {\n            return from_sys(std::chrono::time_point_cast<duration>(std::chrono::system_clock::from_time_t(time)));\n        }\n\n        static file_time to_file_time(time_point const& time) noexcept\n        {\n            return file_time{ static_cast<uint64_t>(time.time_since_epoch().count()) };\n        }\n\n        static time_point from_file_time(file_time const& time) noexcept\n        {\n            return time_point{ duration{ time.value } };\n        }\n\n        static auto to_FILETIME(time_point const& time) noexcept\n        {\n            return to_file_time(time);\n        }\n\n        static time_point from_FILETIME(file_time const& time) noexcept\n        {\n            return f..." /* TRUNCATED STRING LITERAL */
               ,"\nWINRT_EXPORT namespace winrt\n{\n    struct file_time\n    {\n        uint64_t value{};\n\n        file_time() noexcept = default;\n\n        constexpr explicit file_time(uint64_t const value) noexcept : value(value)\n        {\n        }\n\n#ifdef _FILETIME_\n        constexpr file_time(FILETIME const& value) noexcept\n            : value(value.dwLowDateTime | (static_cast<uint64_t>(value.dwHighDateTime) << 32))\n        {\n        }\n\n        operator FILETIME() const noexcept\n        {\n            return { static_cast<DWORD>(value & 0xFFFFFFFF), static_cast<DWORD>(value >> 32) };\n        }\n#endif\n    };\n\n    struct clock\n    {\n        using rep = int64_t;\n        using period = impl::filetime_period;\n        using duration = Windows::Foundation::TimeSpan;\n        using time_point = Windows::Foundation::DateTime;\n\n        static constexpr bool is_steady = false;\n\n        static time_point now() noexcept\n        {\n            file_time ft;\n            WINRT_IMPL_GetSystemTimePreciseAsFileTime(&ft);\n            return from_file_time(ft);\n        }\n\n        static time_t to_time_t(time_point const& time) noexcept\n        {\n            return static_cast<time_t>(std::chrono::system_clock::to_time_t(std::chrono::time_point_cast<std::chrono::system_clock::duration>(to_sys(time))));\n        }\n\n        static time_point from_time_t(time_t time) noexcept\n        {\n            return from_sys(std::chrono::time_point_cast<duration>(std::chrono::system_clock::from_time_t(time)));\n        }\n\n        static file_time to_file_time(time_point const& time) noexcept\n        {\n            return file_time{ static_cast<uint64_t>(time.time_since_epoch().count()) };\n        }\n\n        static time_point from_file_time(file_time const& time) noexcept\n        {\n            return time_point{ duration{ time.value } };\n        }\n\n        static auto to_FILETIME(time_point const& time) noexcept\n        {\n            return to_file_time(time);\n        }\n\n        static time_point from_FILETIME(file_time const& time) noexcept\n        {\n            return f..." /* TRUNCATED STRING LITERAL */
                + sVar36);
    sVar36 = strlen(
                   "\nWINRT_EXPORT namespace winrt\n{\n    struct access_token : handle\n    {\n        static access_token process()\n        {\n            access_token token;\n            check_bool(WINRT_IMPL_OpenProcessToken(WINRT_IMPL_GetCurrentProcess(), 0x0002 /*TOKEN_DUPLICATE*/, token.put()));\n            access_token duplicate;\n            check_bool(WINRT_IMPL_DuplicateToken(token.get(), 2 /*SecurityImpersonation*/, duplicate.put()));\n            return duplicate;\n        }\n\n        static access_token thread()\n        {\n            access_token token;\n\n            if (!WINRT_IMPL_OpenThreadToken(WINRT_IMPL_GetCurrentThread(), 0x0004 /*TOKEN_IMPERSONATE*/, 1, token.put()))\n            {\n                uint32_t const error = WINRT_IMPL_GetLastError();\n\n                if (error != 1008 /*ERROR_NO_TOKEN*/)\n                {\n                    throw_hresult(impl::hresult_from_win32(error));\n                }\n            }\n\n            return token;\n        }\n\n        static access_token client()\n        {\n            struct impersonate_guard\n            {\n                impersonate_guard(com_ptr<impl::IServerSecurity> const& server) : m_server(server)\n                {\n                    check_hresult(m_server->ImpersonateClient());\n                }\n\n                ~impersonate_guard()\n                {\n                    check_hresult(m_server->RevertToSelf());\n                }\n\n            private:\n\n                com_ptr<impl::IServerSecurity> const& m_server;\n            };\n\n            auto server = capture<impl::IServerSecurity>(WINRT_IMPL_CoGetCallContext);\n            impersonate_guard impersonate(server);\n            return thread();\n        }\n\n        access_token() = default;\n        access_token(access_token&& other) = default;\n        access_token& operator=(access_token&& other) = default;\n\n        access_token impersonate() const\n        {\n            auto previous = thread();\n            check_bool(WINRT_IMPL_SetThreadToken(nullptr, get()));\n            return previous;\n        }\n\n        void revert() cons..." /* TRUNCATED STRING LITERAL */
                   );
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar3,auStack_4a8._0_8_,
               "\nWINRT_EXPORT namespace winrt\n{\n    struct access_token : handle\n    {\n        static access_token process()\n        {\n            access_token token;\n            check_bool(WINRT_IMPL_OpenProcessToken(WINRT_IMPL_GetCurrentProcess(), 0x0002 /*TOKEN_DUPLICATE*/, token.put()));\n            access_token duplicate;\n            check_bool(WINRT_IMPL_DuplicateToken(token.get(), 2 /*SecurityImpersonation*/, duplicate.put()));\n            return duplicate;\n        }\n\n        static access_token thread()\n        {\n            access_token token;\n\n            if (!WINRT_IMPL_OpenThreadToken(WINRT_IMPL_GetCurrentThread(), 0x0004 /*TOKEN_IMPERSONATE*/, 1, token.put()))\n            {\n                uint32_t const error = WINRT_IMPL_GetLastError();\n\n                if (error != 1008 /*ERROR_NO_TOKEN*/)\n                {\n                    throw_hresult(impl::hresult_from_win32(error));\n                }\n            }\n\n            return token;\n        }\n\n        static access_token client()\n        {\n            struct impersonate_guard\n            {\n                impersonate_guard(com_ptr<impl::IServerSecurity> const& server) : m_server(server)\n                {\n                    check_hresult(m_server->ImpersonateClient());\n                }\n\n                ~impersonate_guard()\n                {\n                    check_hresult(m_server->RevertToSelf());\n                }\n\n            private:\n\n                com_ptr<impl::IServerSecurity> const& m_server;\n            };\n\n            auto server = capture<impl::IServerSecurity>(WINRT_IMPL_CoGetCallContext);\n            impersonate_guard impersonate(server);\n            return thread();\n        }\n\n        access_token() = default;\n        access_token(access_token&& other) = default;\n        access_token& operator=(access_token&& other) = default;\n\n        access_token impersonate() const\n        {\n            auto previous = thread();\n            check_bool(WINRT_IMPL_SetThreadToken(nullptr, get()));\n            return previous;\n        }\n\n        void revert() cons..." /* TRUNCATED STRING LITERAL */
               ,"\nWINRT_EXPORT namespace winrt\n{\n    struct access_token : handle\n    {\n        static access_token process()\n        {\n            access_token token;\n            check_bool(WINRT_IMPL_OpenProcessToken(WINRT_IMPL_GetCurrentProcess(), 0x0002 /*TOKEN_DUPLICATE*/, token.put()));\n            access_token duplicate;\n            check_bool(WINRT_IMPL_DuplicateToken(token.get(), 2 /*SecurityImpersonation*/, duplicate.put()));\n            return duplicate;\n        }\n\n        static access_token thread()\n        {\n            access_token token;\n\n            if (!WINRT_IMPL_OpenThreadToken(WINRT_IMPL_GetCurrentThread(), 0x0004 /*TOKEN_IMPERSONATE*/, 1, token.put()))\n            {\n                uint32_t const error = WINRT_IMPL_GetLastError();\n\n                if (error != 1008 /*ERROR_NO_TOKEN*/)\n                {\n                    throw_hresult(impl::hresult_from_win32(error));\n                }\n            }\n\n            return token;\n        }\n\n        static access_token client()\n        {\n            struct impersonate_guard\n            {\n                impersonate_guard(com_ptr<impl::IServerSecurity> const& server) : m_server(server)\n                {\n                    check_hresult(m_server->ImpersonateClient());\n                }\n\n                ~impersonate_guard()\n                {\n                    check_hresult(m_server->RevertToSelf());\n                }\n\n            private:\n\n                com_ptr<impl::IServerSecurity> const& m_server;\n            };\n\n            auto server = capture<impl::IServerSecurity>(WINRT_IMPL_CoGetCallContext);\n            impersonate_guard impersonate(server);\n            return thread();\n        }\n\n        access_token() = default;\n        access_token(access_token&& other) = default;\n        access_token& operator=(access_token&& other) = default;\n\n        access_token impersonate() const\n        {\n            auto previous = thread();\n            check_bool(WINRT_IMPL_SetThreadToken(nullptr, get()));\n            return previous;\n        }\n\n        void revert() cons..." /* TRUNCATED STRING LITERAL */
                + sVar36);
    sVar36 = strlen(
                   "\nnamespace winrt::impl\n{\n    inline size_t hash_data(void const* ptr, size_t const bytes) noexcept\n    {\n#ifdef _WIN64\n        constexpr size_t fnv_offset_basis = 14695981039346656037ULL;\n        constexpr size_t fnv_prime = 1099511628211ULL;\n#else\n        constexpr size_t fnv_offset_basis = 2166136261U;\n        constexpr size_t fnv_prime = 16777619U;\n#endif\n        size_t result = fnv_offset_basis;\n        uint8_t const* const buffer = static_cast<uint8_t const*>(ptr);\n\n        for (size_t next = 0; next < bytes; ++next)\n        {\n            result ^= buffer[next];\n            result *= fnv_prime;\n        }\n\n        return result;\n    }\n\n    struct hash_base\n    {\n        size_t operator()(Windows::Foundation::IUnknown const& value) const noexcept\n        {\n            void* const abi_value = get_abi(value.try_as<Windows::Foundation::IUnknown>());\n            return std::hash<void*>{}(abi_value);\n        }\n    };\n}\n\nnamespace std\n{\n    template<> struct hash<winrt::hstring>\n    {\n        size_t operator()(winrt::hstring const& value) const noexcept\n        {\n            return std::hash<std::wstring_view>{}(value);\n        }\n    };\n\n    template<> struct hash<winrt::Windows::Foundation::IUnknown> : winrt::impl::hash_base {};\n    template<> struct hash<winrt::Windows::Foundation::IInspectable> : winrt::impl::hash_base {};\n    template<> struct hash<winrt::Windows::Foundation::IActivationFactory> : winrt::impl::hash_base {};\n    \n    template<> struct hash<winrt::guid>\n    {\n        size_t operator()(winrt::guid const& value) const noexcept\n        {\n            return winrt::impl::hash_data(&value, sizeof(value));\n        }\n    };\n}\n"
                   );
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar3,auStack_4a8._0_8_,
               "\nnamespace winrt::impl\n{\n    inline size_t hash_data(void const* ptr, size_t const bytes) noexcept\n    {\n#ifdef _WIN64\n        constexpr size_t fnv_offset_basis = 14695981039346656037ULL;\n        constexpr size_t fnv_prime = 1099511628211ULL;\n#else\n        constexpr size_t fnv_offset_basis = 2166136261U;\n        constexpr size_t fnv_prime = 16777619U;\n#endif\n        size_t result = fnv_offset_basis;\n        uint8_t const* const buffer = static_cast<uint8_t const*>(ptr);\n\n        for (size_t next = 0; next < bytes; ++next)\n        {\n            result ^= buffer[next];\n            result *= fnv_prime;\n        }\n\n        return result;\n    }\n\n    struct hash_base\n    {\n        size_t operator()(Windows::Foundation::IUnknown const& value) const noexcept\n        {\n            void* const abi_value = get_abi(value.try_as<Windows::Foundation::IUnknown>());\n            return std::hash<void*>{}(abi_value);\n        }\n    };\n}\n\nnamespace std\n{\n    template<> struct hash<winrt::hstring>\n    {\n        size_t operator()(winrt::hstring const& value) const noexcept\n        {\n            return std::hash<std::wstring_view>{}(value);\n        }\n    };\n\n    template<> struct hash<winrt::Windows::Foundation::IUnknown> : winrt::impl::hash_base {};\n    template<> struct hash<winrt::Windows::Foundation::IInspectable> : winrt::impl::hash_base {};\n    template<> struct hash<winrt::Windows::Foundation::IActivationFactory> : winrt::impl::hash_base {};\n    \n    template<> struct hash<winrt::guid>\n    {\n        size_t operator()(winrt::guid const& value) const noexcept\n        {\n            return winrt::impl::hash_data(&value, sizeof(value));\n        }\n    };\n}\n"
               ,"\nnamespace winrt::impl\n{\n    inline size_t hash_data(void const* ptr, size_t const bytes) noexcept\n    {\n#ifdef _WIN64\n        constexpr size_t fnv_offset_basis = 14695981039346656037ULL;\n        constexpr size_t fnv_prime = 1099511628211ULL;\n#else\n        constexpr size_t fnv_offset_basis = 2166136261U;\n        constexpr size_t fnv_prime = 16777619U;\n#endif\n        size_t result = fnv_offset_basis;\n        uint8_t const* const buffer = static_cast<uint8_t const*>(ptr);\n\n        for (size_t next = 0; next < bytes; ++next)\n        {\n            result ^= buffer[next];\n            result *= fnv_prime;\n        }\n\n        return result;\n    }\n\n    struct hash_base\n    {\n        size_t operator()(Windows::Foundation::IUnknown const& value) const noexcept\n        {\n            void* const abi_value = get_abi(value.try_as<Windows::Foundation::IUnknown>());\n            return std::hash<void*>{}(abi_value);\n        }\n    };\n}\n\nnamespace std\n{\n    template<> struct hash<winrt::hstring>\n    {\n        size_t operator()(winrt::hstring const& value) const noexcept\n        {\n            return std::hash<std::wstring_view>{}(value);\n        }\n    };\n\n    template<> struct hash<winrt::Windows::Foundation::IUnknown> : winrt::impl::hash_base {};\n    template<> struct hash<winrt::Windows::Foundation::IInspectable> : winrt::impl::hash_base {};\n    template<> struct hash<winrt::Windows::Foundation::IActivationFactory> : winrt::impl::hash_base {};\n    \n    template<> struct hash<winrt::guid>\n    {\n        size_t operator()(winrt::guid const& value) const noexcept\n        {\n            return winrt::impl::hash_data(&value, sizeof(value));\n        }\n    };\n}\n"
                + sVar36);
    sVar36 = strlen(
                   "\nnamespace winrt::impl\n{\n    template <typename T>\n    struct fast_iterator\n    {\n        using iterator_concept = std::random_access_iterator_tag;\n        using iterator_category = std::input_iterator_tag;\n        using value_type = decltype(std::declval<T>().GetAt(0));\n        using difference_type = ptrdiff_t;\n        using pointer = void;\n        using reference = value_type;\n\n        fast_iterator() noexcept = default;\n\n        fast_iterator(T const& collection, uint32_t const index) noexcept :\n            m_collection(&collection),\n            m_index(index)\n        {}\n\n        fast_iterator& operator++() noexcept\n        {\n            ++m_index;\n            return *this;\n        }\n\n        fast_iterator operator++(int) noexcept\n        {\n            auto previous = *this;\n            ++m_index;\n            return previous;\n        }\n\n        fast_iterator& operator--() noexcept\n        {\n            --m_index;\n            return *this;\n        }\n\n        fast_iterator operator--(int) noexcept\n        {\n            auto previous = *this;\n            --m_index;\n            return previous;\n        }\n\n        fast_iterator& operator+=(difference_type n) noexcept\n        {\n            m_index += static_cast<uint32_t>(n);\n            return *this;\n        }\n\n        fast_iterator operator+(difference_type n) const noexcept\n        {\n            return fast_iterator(*this) += n;\n        }\n\n        fast_iterator& operator-=(difference_type n) noexcept\n        {\n            return *this += -n;\n        }\n\n        fast_iterator operator-(difference_type n) const noexcept\n        {\n            return *this + -n;\n        }\n\n        difference_type operator-(fast_iterator const& other) const noexcept\n        {\n            WINRT_ASSERT(m_collection == other.m_collection);\n            return static_cast<difference_type>(m_index) - static_cast<difference_type>(other.m_index);\n        }\n\n        reference operator*() const\n        {\n            return m_collection->GetAt(m_index);\n        }\n\n        reference operator[](di..." /* TRUNCATED STRING LITERAL */
                   );
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar3,auStack_4a8._0_8_,
               "\nnamespace winrt::impl\n{\n    template <typename T>\n    struct fast_iterator\n    {\n        using iterator_concept = std::random_access_iterator_tag;\n        using iterator_category = std::input_iterator_tag;\n        using value_type = decltype(std::declval<T>().GetAt(0));\n        using difference_type = ptrdiff_t;\n        using pointer = void;\n        using reference = value_type;\n\n        fast_iterator() noexcept = default;\n\n        fast_iterator(T const& collection, uint32_t const index) noexcept :\n            m_collection(&collection),\n            m_index(index)\n        {}\n\n        fast_iterator& operator++() noexcept\n        {\n            ++m_index;\n            return *this;\n        }\n\n        fast_iterator operator++(int) noexcept\n        {\n            auto previous = *this;\n            ++m_index;\n            return previous;\n        }\n\n        fast_iterator& operator--() noexcept\n        {\n            --m_index;\n            return *this;\n        }\n\n        fast_iterator operator--(int) noexcept\n        {\n            auto previous = *this;\n            --m_index;\n            return previous;\n        }\n\n        fast_iterator& operator+=(difference_type n) noexcept\n        {\n            m_index += static_cast<uint32_t>(n);\n            return *this;\n        }\n\n        fast_iterator operator+(difference_type n) const noexcept\n        {\n            return fast_iterator(*this) += n;\n        }\n\n        fast_iterator& operator-=(difference_type n) noexcept\n        {\n            return *this += -n;\n        }\n\n        fast_iterator operator-(difference_type n) const noexcept\n        {\n            return *this + -n;\n        }\n\n        difference_type operator-(fast_iterator const& other) const noexcept\n        {\n            WINRT_ASSERT(m_collection == other.m_collection);\n            return static_cast<difference_type>(m_index) - static_cast<difference_type>(other.m_index);\n        }\n\n        reference operator*() const\n        {\n            return m_collection->GetAt(m_index);\n        }\n\n        reference operator[](di..." /* TRUNCATED STRING LITERAL */
               ,"\nnamespace winrt::impl\n{\n    template <typename T>\n    struct fast_iterator\n    {\n        using iterator_concept = std::random_access_iterator_tag;\n        using iterator_category = std::input_iterator_tag;\n        using value_type = decltype(std::declval<T>().GetAt(0));\n        using difference_type = ptrdiff_t;\n        using pointer = void;\n        using reference = value_type;\n\n        fast_iterator() noexcept = default;\n\n        fast_iterator(T const& collection, uint32_t const index) noexcept :\n            m_collection(&collection),\n            m_index(index)\n        {}\n\n        fast_iterator& operator++() noexcept\n        {\n            ++m_index;\n            return *this;\n        }\n\n        fast_iterator operator++(int) noexcept\n        {\n            auto previous = *this;\n            ++m_index;\n            return previous;\n        }\n\n        fast_iterator& operator--() noexcept\n        {\n            --m_index;\n            return *this;\n        }\n\n        fast_iterator operator--(int) noexcept\n        {\n            auto previous = *this;\n            --m_index;\n            return previous;\n        }\n\n        fast_iterator& operator+=(difference_type n) noexcept\n        {\n            m_index += static_cast<uint32_t>(n);\n            return *this;\n        }\n\n        fast_iterator operator+(difference_type n) const noexcept\n        {\n            return fast_iterator(*this) += n;\n        }\n\n        fast_iterator& operator-=(difference_type n) noexcept\n        {\n            return *this += -n;\n        }\n\n        fast_iterator operator-(difference_type n) const noexcept\n        {\n            return *this + -n;\n        }\n\n        difference_type operator-(fast_iterator const& other) const noexcept\n        {\n            WINRT_ASSERT(m_collection == other.m_collection);\n            return static_cast<difference_type>(m_index) - static_cast<difference_type>(other.m_index);\n        }\n\n        reference operator*() const\n        {\n            return m_collection->GetAt(m_index);\n        }\n\n        reference operator[](di..." /* TRUNCATED STRING LITERAL */
                + sVar36);
    sVar36 = strlen(
                   "\nnamespace winrt::impl\n{\n    inline auto submit_threadpool_callback(void(__stdcall* callback)(void*, void* context), void* context)\n    {\n        if (!WINRT_IMPL_TrySubmitThreadpoolCallback(callback, context, nullptr))\n        {\n            throw_last_error();\n        }\n    }\n\n    inline void __stdcall resume_background_callback(void*, void* context) noexcept\n    {\n        coroutine_handle<>::from_address(context)();\n    };\n\n    inline auto resume_background(coroutine_handle<> handle)\n    {\n        submit_threadpool_callback(resume_background_callback, handle.address());\n    }\n\n    inline std::pair<int32_t, int32_t> get_apartment_type() noexcept\n    {\n        int32_t aptType;\n        int32_t aptTypeQualifier;\n        if (0 == WINRT_IMPL_CoGetApartmentType(&aptType, &aptTypeQualifier))\n        {\n            return { aptType, aptTypeQualifier };\n        }\n        else\n        {\n            return { 1 /* APTTYPE_MTA */, 1 /* APTTYPEQUALIFIER_IMPLICIT_MTA */ };\n        }\n    }\n\n    inline bool is_sta_thread() noexcept\n    {\n        auto type = get_apartment_type();\n        switch (type.first)\n        {\n        case 0: /* APTTYPE_STA */\n        case 3: /* APTTYPE_MAINSTA */\n            return true;\n        case 2: /* APTTYPE_NA */\n            return type.second == 3 /* APTTYPEQUALIFIER_NA_ON_STA */ ||\n                type.second == 5 /* APTTYPEQUALIFIER_NA_ON_MAINSTA */;\n        }\n        return false;\n    }\n\n    struct resume_apartment_context\n    {\n        resume_apartment_context() = default;\n        resume_apartment_context(std::nullptr_t) : m_context(nullptr), m_context_type(-1) {}\n        resume_apartment_context(resume_apartment_context const&) = default;\n        resume_apartment_context(resume_apartment_context&& other) noexcept :\n            m_context(std::move(other.m_context)), m_context_type(std::exchange(other.m_context_type, -1)) {}\n        resume_apartment_context& operator=(resume_apartment_context const&) = default;\n        resume_apartment_context& operator=(resume_apartment_context&& other) noexcept..." /* TRUNCATED STRING LITERAL */
                   );
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar3,auStack_4a8._0_8_,
               "\nnamespace winrt::impl\n{\n    inline auto submit_threadpool_callback(void(__stdcall* callback)(void*, void* context), void* context)\n    {\n        if (!WINRT_IMPL_TrySubmitThreadpoolCallback(callback, context, nullptr))\n        {\n            throw_last_error();\n        }\n    }\n\n    inline void __stdcall resume_background_callback(void*, void* context) noexcept\n    {\n        coroutine_handle<>::from_address(context)();\n    };\n\n    inline auto resume_background(coroutine_handle<> handle)\n    {\n        submit_threadpool_callback(resume_background_callback, handle.address());\n    }\n\n    inline std::pair<int32_t, int32_t> get_apartment_type() noexcept\n    {\n        int32_t aptType;\n        int32_t aptTypeQualifier;\n        if (0 == WINRT_IMPL_CoGetApartmentType(&aptType, &aptTypeQualifier))\n        {\n            return { aptType, aptTypeQualifier };\n        }\n        else\n        {\n            return { 1 /* APTTYPE_MTA */, 1 /* APTTYPEQUALIFIER_IMPLICIT_MTA */ };\n        }\n    }\n\n    inline bool is_sta_thread() noexcept\n    {\n        auto type = get_apartment_type();\n        switch (type.first)\n        {\n        case 0: /* APTTYPE_STA */\n        case 3: /* APTTYPE_MAINSTA */\n            return true;\n        case 2: /* APTTYPE_NA */\n            return type.second == 3 /* APTTYPEQUALIFIER_NA_ON_STA */ ||\n                type.second == 5 /* APTTYPEQUALIFIER_NA_ON_MAINSTA */;\n        }\n        return false;\n    }\n\n    struct resume_apartment_context\n    {\n        resume_apartment_context() = default;\n        resume_apartment_context(std::nullptr_t) : m_context(nullptr), m_context_type(-1) {}\n        resume_apartment_context(resume_apartment_context const&) = default;\n        resume_apartment_context(resume_apartment_context&& other) noexcept :\n            m_context(std::move(other.m_context)), m_context_type(std::exchange(other.m_context_type, -1)) {}\n        resume_apartment_context& operator=(resume_apartment_context const&) = default;\n        resume_apartment_context& operator=(resume_apartment_context&& other) noexcept..." /* TRUNCATED STRING LITERAL */
               ,"\nnamespace winrt::impl\n{\n    inline auto submit_threadpool_callback(void(__stdcall* callback)(void*, void* context), void* context)\n    {\n        if (!WINRT_IMPL_TrySubmitThreadpoolCallback(callback, context, nullptr))\n        {\n            throw_last_error();\n        }\n    }\n\n    inline void __stdcall resume_background_callback(void*, void* context) noexcept\n    {\n        coroutine_handle<>::from_address(context)();\n    };\n\n    inline auto resume_background(coroutine_handle<> handle)\n    {\n        submit_threadpool_callback(resume_background_callback, handle.address());\n    }\n\n    inline std::pair<int32_t, int32_t> get_apartment_type() noexcept\n    {\n        int32_t aptType;\n        int32_t aptTypeQualifier;\n        if (0 == WINRT_IMPL_CoGetApartmentType(&aptType, &aptTypeQualifier))\n        {\n            return { aptType, aptTypeQualifier };\n        }\n        else\n        {\n            return { 1 /* APTTYPE_MTA */, 1 /* APTTYPEQUALIFIER_IMPLICIT_MTA */ };\n        }\n    }\n\n    inline bool is_sta_thread() noexcept\n    {\n        auto type = get_apartment_type();\n        switch (type.first)\n        {\n        case 0: /* APTTYPE_STA */\n        case 3: /* APTTYPE_MAINSTA */\n            return true;\n        case 2: /* APTTYPE_NA */\n            return type.second == 3 /* APTTYPEQUALIFIER_NA_ON_STA */ ||\n                type.second == 5 /* APTTYPEQUALIFIER_NA_ON_MAINSTA */;\n        }\n        return false;\n    }\n\n    struct resume_apartment_context\n    {\n        resume_apartment_context() = default;\n        resume_apartment_context(std::nullptr_t) : m_context(nullptr), m_context_type(-1) {}\n        resume_apartment_context(resume_apartment_context const&) = default;\n        resume_apartment_context(resume_apartment_context&& other) noexcept :\n            m_context(std::move(other.m_context)), m_context_type(std::exchange(other.m_context_type, -1)) {}\n        resume_apartment_context& operator=(resume_apartment_context const&) = default;\n        resume_apartment_context& operator=(resume_apartment_context&& other) noexcept..." /* TRUNCATED STRING LITERAL */
                + sVar36);
    sVar36 = strlen(
                   "\n#if defined(_DEBUG) && !defined(WINRT_NATVIS)\n#define WINRT_NATVIS\n#endif\n\n#ifdef WINRT_NATVIS\n\nnamespace winrt::impl\n{\n    struct natvis\n    {\n        static auto __stdcall abi_val(void* object, wchar_t const * iid_str, int method)\n        {\n            union variant\n            {\n                bool b;\n                wchar_t c;\n                int8_t i1;\n                int16_t i2;\n                int32_t i4;\n                int64_t i8;\n                uint8_t u1;\n                uint16_t u2;\n                uint32_t u4;\n                uint64_t u8;\n                float r4;\n                double r8;\n                guid g;\n                void* s;\n                uint8_t v[1024];\n            }\n            value;\n            value.s = 0;\n            guid iid;\n            if (WINRT_IMPL_IIDFromString(iid_str, &iid) == 0)\n            {\n                struct memory_basic_information\n                {\n                    void* base_address;\n                    void* allocation_base;\n                    uint32_t allocation_protect;\n#ifdef _WIN64\n                    uint32_t __alignment1;\n#endif\n                    uintptr_t region_size;\n                    uint32_t state;\n                    uint32_t protect;\n                    uint32_t type;\n#ifdef _WIN64\n                    uint32_t __alignment2;\n#endif\n                };\n                memory_basic_information info;\n                // validate object pointer is readable\n                if ((WINRT_IMPL_VirtualQuery(object, &info, sizeof(info)) != 0) && ((info.protect & 0xEE) != 0))\n                {\n                    inspectable_abi* pinsp;\n                    if (((unknown_abi*)object)->QueryInterface(iid, reinterpret_cast<void**>(&pinsp)) == 0)\n                    {\n                        static const int IInspectable_vtbl_size = 6;\n                        auto vtbl = *(void***)pinsp;\n                        // validate vtbl pointer is readable\n                        if ((WINRT_IMPL_VirtualQuery(vtbl, &info, sizeof(info)) != 0) && ((info.protect & 0xE..." /* TRUNCATED STRING LITERAL */
                   );
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar3,auStack_4a8._0_8_,
               "\n#if defined(_DEBUG) && !defined(WINRT_NATVIS)\n#define WINRT_NATVIS\n#endif\n\n#ifdef WINRT_NATVIS\n\nnamespace winrt::impl\n{\n    struct natvis\n    {\n        static auto __stdcall abi_val(void* object, wchar_t const * iid_str, int method)\n        {\n            union variant\n            {\n                bool b;\n                wchar_t c;\n                int8_t i1;\n                int16_t i2;\n                int32_t i4;\n                int64_t i8;\n                uint8_t u1;\n                uint16_t u2;\n                uint32_t u4;\n                uint64_t u8;\n                float r4;\n                double r8;\n                guid g;\n                void* s;\n                uint8_t v[1024];\n            }\n            value;\n            value.s = 0;\n            guid iid;\n            if (WINRT_IMPL_IIDFromString(iid_str, &iid) == 0)\n            {\n                struct memory_basic_information\n                {\n                    void* base_address;\n                    void* allocation_base;\n                    uint32_t allocation_protect;\n#ifdef _WIN64\n                    uint32_t __alignment1;\n#endif\n                    uintptr_t region_size;\n                    uint32_t state;\n                    uint32_t protect;\n                    uint32_t type;\n#ifdef _WIN64\n                    uint32_t __alignment2;\n#endif\n                };\n                memory_basic_information info;\n                // validate object pointer is readable\n                if ((WINRT_IMPL_VirtualQuery(object, &info, sizeof(info)) != 0) && ((info.protect & 0xEE) != 0))\n                {\n                    inspectable_abi* pinsp;\n                    if (((unknown_abi*)object)->QueryInterface(iid, reinterpret_cast<void**>(&pinsp)) == 0)\n                    {\n                        static const int IInspectable_vtbl_size = 6;\n                        auto vtbl = *(void***)pinsp;\n                        // validate vtbl pointer is readable\n                        if ((WINRT_IMPL_VirtualQuery(vtbl, &info, sizeof(info)) != 0) && ((info.protect & 0xE..." /* TRUNCATED STRING LITERAL */
               ,"\n#if defined(_DEBUG) && !defined(WINRT_NATVIS)\n#define WINRT_NATVIS\n#endif\n\n#ifdef WINRT_NATVIS\n\nnamespace winrt::impl\n{\n    struct natvis\n    {\n        static auto __stdcall abi_val(void* object, wchar_t const * iid_str, int method)\n        {\n            union variant\n            {\n                bool b;\n                wchar_t c;\n                int8_t i1;\n                int16_t i2;\n                int32_t i4;\n                int64_t i8;\n                uint8_t u1;\n                uint16_t u2;\n                uint32_t u4;\n                uint64_t u8;\n                float r4;\n                double r8;\n                guid g;\n                void* s;\n                uint8_t v[1024];\n            }\n            value;\n            value.s = 0;\n            guid iid;\n            if (WINRT_IMPL_IIDFromString(iid_str, &iid) == 0)\n            {\n                struct memory_basic_information\n                {\n                    void* base_address;\n                    void* allocation_base;\n                    uint32_t allocation_protect;\n#ifdef _WIN64\n                    uint32_t __alignment1;\n#endif\n                    uintptr_t region_size;\n                    uint32_t state;\n                    uint32_t protect;\n                    uint32_t type;\n#ifdef _WIN64\n                    uint32_t __alignment2;\n#endif\n                };\n                memory_basic_information info;\n                // validate object pointer is readable\n                if ((WINRT_IMPL_VirtualQuery(object, &info, sizeof(info)) != 0) && ((info.protect & 0xEE) != 0))\n                {\n                    inspectable_abi* pinsp;\n                    if (((unknown_abi*)object)->QueryInterface(iid, reinterpret_cast<void**>(&pinsp)) == 0)\n                    {\n                        static const int IInspectable_vtbl_size = 6;\n                        auto vtbl = *(void***)pinsp;\n                        // validate vtbl pointer is readable\n                        if ((WINRT_IMPL_VirtualQuery(vtbl, &info, sizeof(info)) != 0) && ((info.protect & 0xE..." /* TRUNCATED STRING LITERAL */
                + sVar36);
    sVar36 = strlen(
                   "\n// WINRT_version is used by Microsoft to analyze C++/WinRT library adoption and inform future product decisions.\nextern \"C\"\n__declspec(selectany)\nchar const * const WINRT_version = \"C++/WinRT version:\" CPPWINRT_VERSION;\n\n#if defined(_MSC_VER)\n#ifdef _M_IX86\n#pragma comment(linker, \"/include:_WINRT_version\")\n#else\n#pragma comment(linker, \"/include:WINRT_version\")\n#endif\n\n#pragma detect_mismatch(\"C++/WinRT version\", CPPWINRT_VERSION)\n#endif\n\nWINRT_EXPORT namespace winrt\n{\n    template <size_t BaseSize, size_t ComponentSize>\n    constexpr bool check_version(char const(&base)[BaseSize], char const(&component)[ComponentSize]) noexcept\n    {\n        if constexpr (BaseSize != ComponentSize)\n        {\n            return false;\n        }\n\n        for (size_t i = 0; i != BaseSize - 1; ++i)\n        {\n            if (base[i] != component[i])\n            {\n                return false;\n            }\n        }\n\n        return true;\n    }\n}\n"
                   );
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar3,auStack_4a8._0_8_,
               "\n// WINRT_version is used by Microsoft to analyze C++/WinRT library adoption and inform future product decisions.\nextern \"C\"\n__declspec(selectany)\nchar const * const WINRT_version = \"C++/WinRT version:\" CPPWINRT_VERSION;\n\n#if defined(_MSC_VER)\n#ifdef _M_IX86\n#pragma comment(linker, \"/include:_WINRT_version\")\n#else\n#pragma comment(linker, \"/include:WINRT_version\")\n#endif\n\n#pragma detect_mismatch(\"C++/WinRT version\", CPPWINRT_VERSION)\n#endif\n\nWINRT_EXPORT namespace winrt\n{\n    template <size_t BaseSize, size_t ComponentSize>\n    constexpr bool check_version(char const(&base)[BaseSize], char const(&component)[ComponentSize]) noexcept\n    {\n        if constexpr (BaseSize != ComponentSize)\n        {\n            return false;\n        }\n\n        for (size_t i = 0; i != BaseSize - 1; ++i)\n        {\n            if (base[i] != component[i])\n            {\n                return false;\n            }\n        }\n\n        return true;\n    }\n}\n"
               ,"\n// WINRT_version is used by Microsoft to analyze C++/WinRT library adoption and inform future product decisions.\nextern \"C\"\n__declspec(selectany)\nchar const * const WINRT_version = \"C++/WinRT version:\" CPPWINRT_VERSION;\n\n#if defined(_MSC_VER)\n#ifdef _M_IX86\n#pragma comment(linker, \"/include:_WINRT_version\")\n#else\n#pragma comment(linker, \"/include:WINRT_version\")\n#endif\n\n#pragma detect_mismatch(\"C++/WinRT version\", CPPWINRT_VERSION)\n#endif\n\nWINRT_EXPORT namespace winrt\n{\n    template <size_t BaseSize, size_t ComponentSize>\n    constexpr bool check_version(char const(&base)[BaseSize], char const(&component)[ComponentSize]) noexcept\n    {\n        if constexpr (BaseSize != ComponentSize)\n        {\n            return false;\n        }\n\n        for (size_t i = 0; i != BaseSize - 1; ++i)\n        {\n            if (base[i] != component[i])\n            {\n                return false;\n            }\n        }\n\n        return true;\n    }\n}\n"
                + sVar36);
    std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar3,auStack_4a8._0_8_,"#endif\n","");
    paVar4 = &output_folder._M_pathname.field_2;
    output_folder._M_pathname._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&output_folder,settings._96_8_,settings._104_8_ + settings._96_8_);
    std::__cxx11::string::append((char *)&output_folder);
    writer_base<cppwinrt::writer>::flush_to_file
              ((writer_base<cppwinrt::writer> *)&template_file,&output_folder._M_pathname);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)output_folder._M_pathname._M_dataplus._M_p != paVar4) {
      operator_delete(output_folder._M_pathname._M_dataplus._M_p,
                      output_folder._M_pathname.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~vector(avStack_440);
    std::
    _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>_>_>
                 *)(local_488 + 0x18));
    if ((undefined1 *)auStack_4a8._16_8_ != local_488) {
      operator_delete((void *)auStack_4a8._16_8_,CONCAT71(local_488._1_7_,local_488[0]) + 1);
    }
    if ((_Rb_tree_node_base *)local_4b8._8_8_ != (_Rb_tree_node_base *)0x0) {
      operator_delete((void *)local_4b8._8_8_,auStack_4a8._8_8_ - local_4b8._8_8_);
    }
    if ((_Rb_tree_node_base *)_template_file != (_Rb_tree_node_base *)0x0) {
      operator_delete(_template_file,local_4b8._0_8_ - (long)_template_file);
    }
    _template_file = (pointer)local_4b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&template_file,settings._96_8_,settings._104_8_ + settings._96_8_);
    std::__cxx11::string::append((char *)&template_file);
    writer_base<cppwinrt::writer>::flush_to_file
              (&ixx.super_writer_base<cppwinrt::writer>,(string *)&template_file);
    if ((_Rb_tree_node_base *)_template_file != (_Rb_tree_node_base *)local_4b8) {
      operator_delete(_template_file,(ulong)(local_4b8._0_8_ + 1));
    }
  }
  if (settings[0xaa] == '\x01') {
    classes.super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    classes.super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    classes.super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((_Rb_tree_header *)c.m_namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
        &c.m_namespaces._M_t._M_impl.super__Rb_tree_header) {
      p_Var34 = c.m_namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        p_Var11 = *(_Base_ptr *)(p_Var34 + 4);
        for (p_Var33 = p_Var34[3]._M_right; p_Var33 != p_Var11;
            p_Var33 = (_Base_ptr)&p_Var33->_M_left) {
          bVar21 = winmd::reader::filter::includes((filter *)(settings + 0x1b8),(TypeDef *)p_Var33);
          if (bVar21) {
            if (classes.
                super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                classes.
                super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>>::
              _M_realloc_insert<winmd::reader::TypeDef_const&>
                        ((vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>> *)
                         &classes,(iterator)
                                  classes.
                                  super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,(TypeDef *)p_Var33);
            }
            else {
              p_Var13 = p_Var33->_M_parent;
              ((classes.
                super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>.
                _M_impl.super__Vector_impl_data._M_finish)->super_row_base<winmd::reader::TypeDef>).
              m_table = *(table_base **)p_Var33;
              *(_Base_ptr *)
               &((classes.
                  super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->
                super_row_base<winmd::reader::TypeDef>).m_index = p_Var13;
              classes.
              super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   classes.
                   super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
        }
        p_Var34 = (_Base_ptr)std::_Rb_tree_increment(p_Var34);
      } while ((_Rb_tree_header *)p_Var34 != &c.m_namespaces._M_t._M_impl.super__Rb_tree_header);
      if (classes.
          super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          classes.
          super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        writer_base<cppwinrt::writer>::writer_base((writer_base<cppwinrt::writer> *)&template_file);
        auStack_4a8._16_8_ = local_488;
        local_490 = 0;
        local_488[0] = false;
        local_468._M_left = &local_468;
        local_468._M_color = _S_red;
        local_468._M_parent = (_Base_ptr)0x0;
        local_488[0x10] = false;
        local_488[0x11] = false;
        local_488[0x12] = false;
        local_488[0x13] = false;
        local_488[0x14] = false;
        local_448 = 0;
        avStack_440[0].
        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        avStack_440[0].
        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        avStack_440[0].
        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_468._M_right = local_468._M_left;
        write_preamble((writer *)&template_file);
        output_folder._M_pathname._M_dataplus._M_p = (pointer)0xc;
        output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_bcd6e;
        write_open_file_guard((writer *)&template_file,(string_view *)&output_folder,'\0');
        pTVar19 = classes.
                  super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pcVar48 = (pointer)0x0;
        if (classes.
            super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            classes.
            super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          type_01 = classes.
                    super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            pcVar37 = (pointer)get_fastabi_size((writer *)&template_file,type_01);
            if (pcVar48 <= pcVar37) {
              pcVar48 = pcVar37;
            }
            type_01 = type_01 + 1;
          } while (type_01 != pTVar19);
        }
        license_arg._M_dataplus._M_p = pcVar48;
        output_folder._M_pathname._M_dataplus._M_p =
             (pointer)strlen(
                            "#include <cstddef>\n#include <atomic>\n\n#define WINRT_IMPL_STRING_1(expression) #expression\n#define WINRT_IMPL_STRING(expression) WINRT_IMPL_STRING_1(expression)\n\n#if defined(_MSC_VER)\n#define WINRT_IMPL_FF_NOVTABLE __declspec(novtable)\n#else\n#define WINRT_IMPL_FF_NOVTABLE\n#endif\n\n#if !defined(WINRT_FAST_ABI_SIZE)\n#define WINRT_FAST_ABI_SIZE %\n#endif\n\nstatic_assert(WINRT_FAST_ABI_SIZE >= %);\n\n#pragma detect_mismatch(\"WINRT_FAST_ABI_SIZE\", WINRT_IMPL_STRING(WINRT_FAST_ABI_SIZE))\n\nnamespace winrt::impl\n{\n    // Thunk definitions are in arch-specific assembly sources\n%\n    struct fast_abi_forwarder\n    {\n        struct guid\n        {\n            uint32_t Data1;\n            uint16_t Data2;\n            uint16_t Data3;\n            uint8_t  Data4[8];\n            inline bool operator!=(guid const& right) const noexcept\n            {\n                return memcmp(this, &right, sizeof(guid));\n            }\n        };\n\n        struct WINRT_IMPL_FF_NOVTABLE inspectable\n        {\n            virtual int32_t __stdcall QueryInterface(guid const& id, void** object) noexcept = 0;\n            virtual uint32_t __stdcall AddRef() noexcept = 0;\n            virtual uint32_t __stdcall Release() noexcept = 0;\n            virtual int32_t __stdcall GetIids(uint32_t* count, guid** ids) noexcept = 0;\n            virtual int32_t __stdcall GetRuntimeClassName(void** name) noexcept = 0;\n            virtual int32_t __stdcall GetTrustLevel(uint32_t* level) noexcept = 0;\n        };\n\n        void* const* m_vfptr;\n        inspectable* m_owner;\n        std::size_t m_offset;\n        guid m_iid;\n        std::atomic<uint32_t> m_references{ 1 };\n\n        fast_abi_forwarder(void* owner, guid const& iid, std::size_t offset) noexcept :\n            m_vfptr(s_vtable), m_owner(static_cast<inspectable*>(owner)), m_iid(iid), m_offset(offset)\n        {\n            m_owner->AddRef();\n        }\n\n        ~fast_abi_forwarder() noexcept\n        {\n            m_owner->Release();\n        }\n\n        static int32_t __stdcall QueryInterface(fast_abi_forwarder* self, guid co..." /* TRUNCATED STRING LITERAL */
                            );
        output_folder._M_pathname._M_string_length = (size_type)strings::base_fast_forward;
        writer_base<cppwinrt::writer>::
        write_segment<unsigned_long,_unsigned_long,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
                  ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder,
                   (unsigned_long *)&license_arg,(unsigned_long *)&license_arg,in_R8,in_R9);
        std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
                  ((vector<char,std::allocator<char>> *)(local_4b8 + 8),auStack_4a8._0_8_,"#endif\n"
                   ,"");
        paVar4 = &output_folder._M_pathname.field_2;
        output_folder._M_pathname._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&output_folder,settings._96_8_,settings._104_8_ + settings._96_8_);
        std::__cxx11::string::append((char *)&output_folder);
        writer_base<cppwinrt::writer>::flush_to_file
                  ((writer_base<cppwinrt::writer> *)&template_file,&output_folder._M_pathname);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)output_folder._M_pathname._M_dataplus._M_p != paVar4) {
          operator_delete(output_folder._M_pathname._M_dataplus._M_p,
                          output_folder._M_pathname.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector(avStack_440);
        std::
        _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>_>_>
                     *)(local_488 + 0x18));
        if ((undefined1 *)auStack_4a8._16_8_ != local_488) {
          operator_delete((void *)auStack_4a8._16_8_,CONCAT71(local_488._1_7_,local_488[0]) + 1);
        }
        if ((_Rb_tree_node_base *)local_4b8._8_8_ != (_Rb_tree_node_base *)0x0) {
          operator_delete((void *)local_4b8._8_8_,auStack_4a8._8_8_ - local_4b8._8_8_);
        }
        if ((_Rb_tree_node_base *)_template_file != (_Rb_tree_node_base *)0x0) {
          operator_delete(_template_file,local_4b8._0_8_ - (long)_template_file);
        }
        writer_base<cppwinrt::writer>::writer_base((writer_base<cppwinrt::writer> *)&template_file);
        auStack_4a8._16_8_ = local_488;
        local_490 = 0;
        local_488[0] = false;
        local_468._M_color = _S_red;
        local_468._M_parent = (_Base_ptr)0x0;
        local_488[0x10] = false;
        local_488[0x11] = false;
        local_488[0x12] = false;
        local_488[0x13] = false;
        local_488[0x14] = false;
        local_468._M_left = &local_468;
        local_448 = 0;
        avStack_440[0].
        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        avStack_440[0].
        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        avStack_440[0].
        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_468._M_right = local_468._M_left;
        write_preamble((writer *)&template_file);
        if (settings._248_8_ != 0) {
          output_folder._M_pathname._M_dataplus._M_p = (pointer)0xd;
          output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_bcdfd;
          writer_base<cppwinrt::writer>::write_segment<std::__cxx11::string>
                    ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (settings + 0xf0));
        }
        license_arg._M_dataplus._M_p = (pointer)0x4;
        license_arg._M_string_length = (size_type)anon_var_dwarf_b7966;
        output_folder._M_pathname._M_dataplus._M_p = (pointer)0x15;
        uVar47 = 0x3c;
        if (settings[0xa8] == '\0') {
          uVar47 = 0x22;
        }
        output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_bb253;
        base_type_parameter._M_dataplus._M_p._0_1_ = uVar47;
        uVar47 = 0x3e;
        if (settings[0xa8] == '\0') {
          uVar47 = 0x22;
        }
        psVar42 = &base_type_argument;
        base_type_argument._M_dataplus._M_p._0_1_ = uVar47;
        writer_base<cppwinrt::writer>::
        write_segment<char,std::basic_string_view<char,std::char_traits<char>>,char>
                  ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder,
                   (char *)&base_type_parameter,
                   (basic_string_view<char,_std::char_traits<char>_> *)&license_arg,(char *)psVar42)
        ;
        output_folder._M_pathname._M_dataplus._M_p = (pointer)0x1dc;
        output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_bce09;
        base_type_parameter._M_dataplus._M_p = (pointer)&classes;
        license_arg._M_dataplus._M_p = (pointer)&classes;
        writer_base<cppwinrt::writer>::
        write_segment<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:446:16),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:446:16)>
                  ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder,
                   (anon_class_8_1_898e5d9c *)&license_arg,&base_type_parameter,psVar42,
                   (anon_class_8_1_898e5d9c *)in_R9);
        iVar23 = std::__cxx11::string::compare(settings + 0x118);
        if (iVar23 == 0) {
          output_folder._M_pathname._M_dataplus._M_p = (pointer)0x33f;
          output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_bce24;
          writer_base<cppwinrt::writer>::write_segment<std::__cxx11::string,std::__cxx11::string>
                    ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (settings + 0x118),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (settings + 0x118));
        }
        output_folder._M_pathname._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&output_folder,settings._96_8_,settings._104_8_ + settings._96_8_);
        std::__cxx11::string::append((char *)&output_folder);
        writer_base<cppwinrt::writer>::flush_to_file
                  ((writer_base<cppwinrt::writer> *)&template_file,&output_folder._M_pathname);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)output_folder._M_pathname._M_dataplus._M_p != paVar4) {
          operator_delete(output_folder._M_pathname._M_dataplus._M_p,
                          output_folder._M_pathname.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector(avStack_440);
        std::
        _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>_>_>
                     *)(local_488 + 0x18));
        if ((undefined1 *)auStack_4a8._16_8_ != local_488) {
          operator_delete((void *)auStack_4a8._16_8_,CONCAT71(local_488._1_7_,local_488[0]) + 1);
        }
        if ((_Rb_tree_node_base *)local_4b8._8_8_ != (_Rb_tree_node_base *)0x0) {
          operator_delete((void *)local_4b8._8_8_,auStack_4a8._8_8_ - local_4b8._8_8_);
        }
        if ((_Rb_tree_node_base *)_template_file != (_Rb_tree_node_base *)0x0) {
          operator_delete(_template_file,local_4b8._0_8_ - (long)_template_file);
        }
        pTVar19 = classes.
                  super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (classes.
            super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            classes.
            super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          local_6a0 = (method_signature *)
                      classes.
                      super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          local_4e0._16_8_ = avStack_440;
          do {
            writer_base<cppwinrt::writer>::writer_base
                      ((writer_base<cppwinrt::writer> *)&template_file);
            auStack_4a8._16_8_ = local_488;
            pTVar43 = (TypeDef *)0x0;
            local_490 = 0;
            local_488[0] = false;
            local_468._M_color = _S_red;
            local_468._M_parent = (_Base_ptr)0x0;
            local_488[0x14] = false;
            local_488[0x10] = false;
            local_488[0x11] = false;
            local_488[0x12] = false;
            local_488[0x13] = false;
            local_468._M_left = &local_468;
            avStack_440[0].
            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            avStack_440[0].
            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_448 = 0;
            avStack_440[0].
            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_468._M_right = local_468._M_left;
            writer::add_depends((writer *)&template_file,(TypeDef *)local_6a0);
            ptVar12 = (local_6a0->m_method).super_row_base<winmd::reader::MethodDef>.m_table;
            pdVar8 = ptVar12->m_database;
            uVar24 = winmd::reader::table_base::get_value<unsigned_int>
                               (ptVar12,(local_6a0->m_method).
                                        super_row_base<winmd::reader::MethodDef>.m_index,1);
            type_name = winmd::reader::database::get_string(pdVar8,uVar24);
            ptVar12 = (local_6a0->m_method).super_row_base<winmd::reader::MethodDef>.m_table;
            pdVar8 = ptVar12->m_database;
            uVar24 = winmd::reader::table_base::get_value<unsigned_int>
                               (ptVar12,(local_6a0->m_method).
                                        super_row_base<winmd::reader::MethodDef>.m_index,2);
            type_namespace = winmd::reader::database::get_string(pdVar8,uVar24);
            get_factories_abi_cxx11_
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
                        *)&output_folder,(cppwinrt *)&template_file,(writer *)local_6a0,pTVar43);
            base_type_parameter._M_dataplus._M_p._0_4_ =
                 (local_6a0->m_method).super_row_base<winmd::reader::MethodDef>.m_index + 1;
            winmd::reader::
            equal_range<winmd::reader::table<winmd::reader::InterfaceImpl>,unsigned_int,winmd::reader::TypeDef::InterfaceImpl()const::compare>
                      (&license_arg,
                       (reader *)
                       &((local_6a0->m_method).super_row_base<winmd::reader::MethodDef>.m_table)->
                        m_database->InterfaceImpl,&base_type_parameter);
            bVar21 = license_arg._M_dataplus._M_p !=
                     (pointer)license_arg.field_2._M_allocated_capacity;
            bVar52 = (int)license_arg._M_string_length != license_arg.field_2._8_4_;
            if (bVar52 || bVar21) {
              TVar55 = get_base_class((cppwinrt *)
                                      (local_6a0->m_method).super_row_base<winmd::reader::MethodDef>
                                      .m_table,(TypeDef *)
                                               (ulong)(local_6a0->m_method).
                                                      super_row_base<winmd::reader::MethodDef>.
                                                      m_index);
              local_4e0._0_8_ = TVar55.super_row_base<winmd::reader::TypeDef>.m_table;
              local_4e0._8_4_ = TVar55.super_row_base<winmd::reader::TypeDef>.m_index;
              license_arg._M_dataplus._M_p = (pointer)&license_arg.field_2;
              license_arg._M_string_length = 0;
              license_arg.field_2._M_allocated_capacity =
                   license_arg.field_2._M_allocated_capacity & 0xffffffffffffff00;
              base_type_parameter._M_string_length = 0;
              base_type_parameter._M_dataplus._M_p = (pointer)&base_type_parameter.field_2;
              base_type_parameter.field_2._M_allocated_capacity =
                   base_type_parameter.field_2._M_allocated_capacity & 0xffffffffffffff00;
              base_type_argument._M_dataplus._M_p = (pointer)&base_type_argument.field_2;
              base_type_argument._M_string_length = 0;
              base_type_argument.field_2._M_allocated_capacity =
                   base_type_argument.field_2._M_allocated_capacity & 0xffffffffffffff00;
              no_module_lock._M_string_length = 0;
              no_module_lock._M_dataplus._M_p = (pointer)&no_module_lock.field_2;
              no_module_lock.field_2._M_allocated_capacity =
                   no_module_lock.field_2._M_allocated_capacity & 0xffffffffffffff00;
              external_requires._M_string_length = 0;
              external_requires._M_dataplus._M_p = (pointer)&external_requires.field_2;
              external_requires.field_2._M_local_buf[0] = '\0';
              if ((method_signature *)local_4e0._0_8_ != (method_signature *)0x0) {
                bVar22 = winmd::reader::filter::includes
                                   ((filter *)(settings + 0x1b8),(TypeDef *)local_4e0);
                if (bVar22) {
                  local_4f0._M_len = 0x1a;
                  local_4f0._M_str = "using composable_base = B;";
                  writer_base<cppwinrt::writer>::write_temp<>
                            ((string *)&base_interfaces,
                             (writer_base<cppwinrt::writer> *)&template_file,&local_4f0);
                  std::__cxx11::string::operator=((string *)&license_arg,(string *)&base_interfaces)
                  ;
                  if (base_interfaces.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                      ._M_impl.super__Vector_impl_data._M_start !=
                      (pointer)&base_interfaces.
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    operator_delete(base_interfaces.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (ulong)((long)&((base_interfaces.
                                                                                                          
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->first)._M_dataplus._M_p + 1));
                  }
                  std::__cxx11::string::_M_replace
                            ((ulong)&base_type_parameter,0,
                             (char *)base_type_parameter._M_string_length,0x1a94e9);
                  std::__cxx11::string::_M_replace
                            ((ulong)&base_type_argument,0,
                             (char *)base_type_argument._M_string_length,0x1a94f6);
                  std::__cxx11::string::_M_replace
                            ((ulong)&no_module_lock,0,(char *)no_module_lock._M_string_length,
                             0x1a94fa);
                }
                else {
                  local_4f0._M_len = 0x1a;
                  local_4f0._M_str = "using composable_base = %;";
                  pTVar43 = (TypeDef *)local_4e0;
                  writer_base<cppwinrt::writer>::write_temp<winmd::reader::TypeDef>
                            ((string *)&base_interfaces,
                             (writer_base<cppwinrt::writer> *)&template_file,&local_4f0,pTVar43);
                  std::__cxx11::string::operator=((string *)&license_arg,(string *)&base_interfaces)
                  ;
                  if (base_interfaces.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                      ._M_impl.super__Vector_impl_data._M_start !=
                      (pointer)&base_interfaces.
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    operator_delete(base_interfaces.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (ulong)((long)&((base_interfaces.
                                                                                                          
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->first)._M_dataplus._M_p + 1));
                  }
                  get_interfaces_abi_cxx11_
                            (&base_interfaces,(cppwinrt *)&template_file,(writer *)local_4e0,pTVar43
                            );
                  std::__cxx11::string::_M_replace
                            ((ulong)&external_requires,0,(char *)external_requires._M_string_length,
                             0x1a94b4);
                  ppVar15 = base_interfaces.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  if (base_interfaces.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                      ._M_impl.super__Vector_impl_data._M_start ==
                      base_interfaces.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0010ce39:
                    external_requires._M_string_length = 0;
                    *external_requires._M_dataplus._M_p = '\0';
                  }
                  else {
                    iVar23 = 0;
                    ppVar49 = base_interfaces.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    do {
                      if (((ppVar49->second).overridable == false) &&
                         (bVar22 = is_always_disabled(&(ppVar49->second).type), !bVar22)) {
                        std::__cxx11::string::append((char *)&external_requires);
                        std::__cxx11::string::_M_append
                                  ((char *)&external_requires,
                                   (ulong)(ppVar49->first)._M_dataplus._M_p);
                        iVar23 = iVar23 + 1;
                      }
                      ppVar49 = ppVar49 + 1;
                    } while (ppVar49 != ppVar15);
                    if (iVar23 == 0) goto LAB_0010ce39;
                    std::__cxx11::string::push_back((char)&external_requires);
                  }
                  std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                  ::~vector(&base_interfaces);
                }
              }
              base_interfaces.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   (pointer)
                   "namespace winrt::@::implementation\n{\n    template <typename D%, typename... I>\n    struct WINRT_IMPL_EMPTY_BASES %_base : implements<D, @::%%%, %I...>%%%\n    {\n        using base_type = %_base;\n        using class_type = @::%;\n        using implements_type = typename %_base::implements_type;\n        using implements_type::implements_type;\n        %\n        hstring GetRuntimeClassName() const\n        {\n            return L\"%.%\";\n        }\n%%%%    };\n}\n"
              ;
              base_interfaces.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1c7;
              local_1e0.args = local_6a0;
              local_d8.args = (TypeDef *)local_6a0;
              local_e0.args = (TypeDef *)local_6a0;
              local_639 = base_type_parameter._M_string_length != 0;
              local_e8.args = (TypeDef *)local_6a0;
              local_f0.args = (TypeDef *)local_6a0;
              local_f8.args = (TypeDef *)local_6a0;
              local_4f0._M_len = (size_t)local_6a0;
              local_4f0._M_str = &local_639;
              writer_base<cppwinrt::writer>::
              write_segment<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
                        ((writer_base<cppwinrt::writer> *)&template_file,
                         (string_view *)&base_interfaces,&type_namespace,&base_type_parameter,
                         &type_name,&type_namespace,&type_name,(anon_class_8_1_89897ddb *)&local_1e0
                         ,&base_type_argument,&no_module_lock,&external_requires,&local_d8,&local_e0
                         ,&type_name,&type_namespace,&type_name,&type_name,&license_arg,
                         &type_namespace,&type_name,&local_e8,&local_f0,&local_f8,
                         (anon_class_16_2_3ed68039 *)&local_4f0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)external_requires._M_dataplus._M_p != &external_requires.field_2) {
                operator_delete(external_requires._M_dataplus._M_p,
                                CONCAT71(external_requires.field_2._M_allocated_capacity._1_7_,
                                         external_requires.field_2._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)no_module_lock._M_dataplus._M_p != &no_module_lock.field_2) {
                operator_delete(no_module_lock._M_dataplus._M_p,
                                no_module_lock.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)base_type_argument._M_dataplus._M_p != &base_type_argument.field_2) {
                operator_delete(base_type_argument._M_dataplus._M_p,
                                base_type_argument.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)base_type_parameter._M_dataplus._M_p != &base_type_parameter.field_2) {
                operator_delete(base_type_parameter._M_dataplus._M_p,
                                base_type_parameter.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)license_arg._M_dataplus._M_p != &license_arg.field_2) {
                operator_delete(license_arg._M_dataplus._M_p,
                                license_arg.field_2._M_allocated_capacity + 1);
              }
            }
            bVar22 = has_factory_members((writer *)&template_file,(TypeDef *)local_6a0);
            if (bVar22) {
              license_arg._M_dataplus._M_p = (pointer)0x15e;
              license_arg._M_string_length = (size_type)anon_var_dwarf_bcf1d;
              base_type_argument._M_dataplus._M_p = (pointer)&output_folder;
              base_type_parameter._M_dataplus._M_p = base_type_argument._M_dataplus._M_p;
              writer_base<cppwinrt::writer>::
              write_segment<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
                        ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&license_arg
                         ,&type_namespace,&type_name,
                         (anon_class_8_1_89897ddb_conflict *)&base_type_parameter,&type_namespace,
                         &type_name,&type_namespace,&type_name,
                         (anon_class_8_1_89897ddb_conflict *)&base_type_argument);
            }
            if (bVar52 || bVar21) {
              license_arg._M_dataplus._M_p = (pointer)&license_arg.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&license_arg,type_name._M_str,type_name._M_str + type_name._M_len
                        );
              sVar14 = license_arg._M_string_length;
              _Var46._M_p = license_arg._M_dataplus._M_p;
              pTVar43 = extraout_RDX;
              if (license_arg._M_string_length != 0) {
                sVar51 = 0;
                do {
                  iVar23 = toupper((int)_Var46._M_p[sVar51]);
                  _Var46._M_p[sVar51] = (char)iVar23;
                  sVar51 = sVar51 + 1;
                  pTVar43 = extraout_RDX_00;
                } while (sVar14 != sVar51);
              }
              get_generated_component_filename_abi_cxx11_
                        (&base_type_parameter,(cppwinrt *)local_6a0,pTVar43);
              base_type_argument._M_dataplus._M_p = &DAT_000000e3;
              base_type_argument._M_string_length = (size_type)anon_var_dwarf_bcf39;
              writer_base<cppwinrt::writer>::
              write_segment<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                        ((writer_base<cppwinrt::writer> *)&template_file,
                         (string_view *)&base_type_argument,&license_arg,&base_type_parameter,
                         &base_type_parameter,&type_namespace,&type_name,&type_name);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)base_type_parameter._M_dataplus._M_p != &base_type_parameter.field_2) {
                operator_delete(base_type_parameter._M_dataplus._M_p,
                                base_type_parameter.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)license_arg._M_dataplus._M_p != &license_arg.field_2) {
                operator_delete(license_arg._M_dataplus._M_p,
                                license_arg.field_2._M_allocated_capacity + 1);
              }
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
                         *)&output_folder);
            uVar38 = local_4b8._0_8_;
            pnVar18 = pnStack_4c0;
            _Var46._M_p = _template_file;
            local_4b8._0_8_ = auStack_4a8._8_8_;
            _template_file = (pointer)local_4b8._8_8_;
            pnStack_4c0 = (namespace_members *)auStack_4a8._0_8_;
            local_4b8._8_8_ = _Var46._M_p;
            auStack_4a8._0_8_ = pnVar18;
            auStack_4a8._8_8_ = uVar38;
            write_preamble((writer *)&template_file);
            std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
                      ((vector<char,std::allocator<char>> *)(local_4b8 + 8),auStack_4a8._0_8_,
                       "#pragma once\n","");
            auVar56._8_8_ = extraout_RDX_01;
            auVar56._0_8_ = local_468._M_left;
            while( true ) {
              p_Var35 = auVar56._0_8_;
              if (p_Var35 == &local_468) break;
              writer::write_depends((writer *)&template_file,(string_view *)(p_Var35 + 1),'\0');
              auVar56 = std::_Rb_tree_increment(p_Var35);
            }
            get_generated_component_filename_abi_cxx11_
                      (&base_type_parameter,(cppwinrt *)local_6a0,auVar56._8_8_);
            plVar31 = (long *)std::__cxx11::string::replace
                                        ((ulong)&base_type_parameter,0,(char *)0x0,settings._96_8_);
            output_folder._M_pathname._M_dataplus._M_p = (pointer)&output_folder._M_pathname.field_2
            ;
            psVar41 = (size_type *)(plVar31 + 2);
            if ((size_type *)*plVar31 == psVar41) {
              output_folder._M_pathname.field_2._M_allocated_capacity = *psVar41;
              output_folder._M_pathname.field_2._8_8_ = plVar31[3];
            }
            else {
              output_folder._M_pathname.field_2._M_allocated_capacity = *psVar41;
              output_folder._M_pathname._M_dataplus._M_p = (pointer)*plVar31;
            }
            output_folder._M_pathname._M_string_length = plVar31[1];
            *plVar31 = (long)psVar41;
            plVar31[1] = 0;
            *(undefined1 *)(plVar31 + 2) = 0;
            plVar31 = (long *)std::__cxx11::string::append((char *)&output_folder);
            license_arg._M_dataplus._M_p = (pointer)&license_arg.field_2;
            psVar41 = (size_type *)(plVar31 + 2);
            if ((size_type *)*plVar31 == psVar41) {
              license_arg.field_2._M_allocated_capacity = *psVar41;
              license_arg.field_2._8_8_ = plVar31[3];
            }
            else {
              license_arg.field_2._M_allocated_capacity = *psVar41;
              license_arg._M_dataplus._M_p = (pointer)*plVar31;
            }
            license_arg._M_string_length = plVar31[1];
            *plVar31 = (long)psVar41;
            plVar31[1] = 0;
            *(undefined1 *)(plVar31 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)output_folder._M_pathname._M_dataplus._M_p != &output_folder._M_pathname.field_2)
            {
              operator_delete(output_folder._M_pathname._M_dataplus._M_p,
                              output_folder._M_pathname.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)base_type_parameter._M_dataplus._M_p != &base_type_parameter.field_2) {
              operator_delete(base_type_parameter._M_dataplus._M_p,
                              base_type_parameter.field_2._M_allocated_capacity + 1);
            }
            std::filesystem::__cxx11::path::
            path<std::__cxx11::string,std::filesystem::__cxx11::path>
                      (&output_folder,&license_arg,auto_format);
            std::filesystem::__cxx11::path::remove_filename();
            std::filesystem::create_directories(&output_folder);
            writer_base<cppwinrt::writer>::flush_to_file
                      ((writer_base<cppwinrt::writer> *)&template_file,&license_arg);
            std::filesystem::__cxx11::path::~path(&output_folder);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)license_arg._M_dataplus._M_p != &license_arg.field_2) {
              operator_delete(license_arg._M_dataplus._M_p,
                              license_arg.field_2._M_allocated_capacity + 1);
            }
            std::
            vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)local_4e0._16_8_);
            std::
            _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>_>_>
                         *)(local_488 + 0x18));
            pTVar43 = extraout_RDX_02;
            if ((undefined1 *)auStack_4a8._16_8_ != local_488) {
              operator_delete((void *)auStack_4a8._16_8_,CONCAT71(local_488._1_7_,local_488[0]) + 1)
              ;
              pTVar43 = extraout_RDX_03;
            }
            if ((_Rb_tree_node_base *)local_4b8._8_8_ != (_Rb_tree_node_base *)0x0) {
              operator_delete((void *)local_4b8._8_8_,auStack_4a8._8_8_ - local_4b8._8_8_);
              pTVar43 = extraout_RDX_04;
            }
            if ((_Rb_tree_node_base *)_template_file != (_Rb_tree_node_base *)0x0) {
              operator_delete(_template_file,local_4b8._0_8_ - (long)_template_file);
              pTVar43 = extraout_RDX_05;
            }
            if (settings[0x138] == '\x01') {
              writer_base<cppwinrt::writer>::writer_base
                        ((writer_base<cppwinrt::writer> *)&output_folder);
              psVar42 = (string *)0x0;
              local_5b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              local_5b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_5b0._M_impl.super__Rb_tree_header._M_header._M_left =
                   &local_5b0._M_impl.super__Rb_tree_header._M_header;
              vStack_580.
              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              vStack_580.
              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_5b0._M_impl.super__Rb_tree_header._M_node_count = 0;
              vStack_580.
              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_5b0._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_5b0._M_impl.super__Rb_tree_header._M_header._M_left;
              write_preamble((writer *)&output_folder);
              ptVar12 = (local_6a0->m_method).super_row_base<winmd::reader::MethodDef>.m_table;
              pdVar8 = ptVar12->m_database;
              uVar24 = winmd::reader::table_base::get_value<unsigned_int>
                                 (ptVar12,(local_6a0->m_method).
                                          super_row_base<winmd::reader::MethodDef>.m_index,1);
              no_module_lock._0_16_ = winmd::reader::database::get_string(pdVar8,uVar24);
              ptVar12 = (local_6a0->m_method).super_row_base<winmd::reader::MethodDef>.m_table;
              pdVar8 = ptVar12->m_database;
              uVar24 = winmd::reader::table_base::get_value<unsigned_int>
                                 (ptVar12,(local_6a0->m_method).
                                          super_row_base<winmd::reader::MethodDef>.m_index,2);
              external_requires._0_16_ = winmd::reader::database::get_string(pdVar8,uVar24);
              get_impl_name<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                        (&base_type_parameter,(cppwinrt *)&external_requires,
                         (basic_string_view<char,_std::char_traits<char>_> *)&no_module_lock,
                         (basic_string_view<char,_std::char_traits<char>_> *)psVar42);
              bVar21 = has_factory_members((writer *)&output_folder,(TypeDef *)local_6a0);
              pTVar43 = extraout_RDX_06;
              if (bVar21) {
                _template_file = (pointer)0x6b;
                pnStack_4c0 = (namespace_members *)0x1b04c6;
                psVar42 = &external_requires;
                writer_base<cppwinrt::writer>::
                write_segment<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                          ((writer_base<cppwinrt::writer> *)&output_folder,
                           (string_view *)&template_file,&base_type_parameter,
                           (basic_string_view<char,_std::char_traits<char>_> *)psVar42,
                           (basic_string_view<char,_std::char_traits<char>_> *)&no_module_lock);
                pTVar43 = extraout_RDX_07;
              }
              if (settings[0x138] == '\x01') {
                _template_file = (pointer)0x22;
                pnStack_4c0 = (namespace_members *)0x179f22;
                writer_base<cppwinrt::writer>::
                write_segment<std::basic_string_view<char,std::char_traits<char>>>
                          ((writer_base<cppwinrt::writer> *)&output_folder,
                           (string_view *)&template_file,
                           (basic_string_view<char,_std::char_traits<char>_> *)&external_requires);
                get_factories_abi_cxx11_
                          ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
                            *)&license_arg,(cppwinrt *)&output_folder,(writer *)local_6a0,
                           (TypeDef *)psVar42);
                for (uVar38 = license_arg.field_2._8_8_;
                    (size_type *)uVar38 != &license_arg._M_string_length;
                    uVar38 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar38)) {
                  p_Var35 = (_Rb_tree_node_base *)(uVar38 + 0x40);
                  if ((*(long *)(uVar38 + 0x40) == 0) ||
                     (bVar21 = is_always_disabled((TypeDef *)p_Var35), !bVar21)) {
                    if (*(char *)&((_Rb_tree_node_base *)(uVar38 + 0x40))->_M_left == '\x01') {
                      if (*(long *)p_Var35 == 0) {
                        _template_file = (pointer)0x41;
                        pnStack_4c0 = (namespace_members *)0x1b0532;
                        writer_base<cppwinrt::writer>::
                        write_segment<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                                  ((writer_base<cppwinrt::writer> *)&output_folder,
                                   (string_view *)&template_file,
                                   (basic_string_view<char,_std::char_traits<char>_> *)
                                   &no_module_lock,
                                   (basic_string_view<char,_std::char_traits<char>_> *)
                                   &no_module_lock,
                                   (basic_string_view<char,_std::char_traits<char>_> *)
                                   &no_module_lock,
                                   (basic_string_view<char,_std::char_traits<char>_> *)
                                   &external_requires,
                                   (basic_string_view<char,_std::char_traits<char>_> *)
                                   &no_module_lock);
                      }
                      else {
                        winmd::reader::row_base<winmd::reader::TypeDef>::
                        get_list<winmd::reader::MethodDef>
                                  ((pair<winmd::reader::MethodDef,_winmd::reader::MethodDef> *)
                                   &base_type_argument,(row_base<winmd::reader::TypeDef> *)p_Var35,5
                                  );
                        uVar16 = base_type_argument.field_2._M_allocated_capacity;
                        base_interfaces.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish =
                             (pointer)base_type_argument._M_string_length;
                        base_interfaces.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                        ._M_impl.super__Vector_impl_data._M_start =
                             (pointer)base_type_argument._M_dataplus._M_p;
                        auVar56 = (undefined1  [16])
                                  base_interfaces.
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                                  ._M_impl.super__Vector_impl_data._0_16_;
                        uVar17 = base_type_argument.field_2._8_4_;
                        base_interfaces.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                        ._M_impl.super__Vector_impl_data._0_16_ = auVar56;
                        if ((base_type_argument._M_dataplus._M_p !=
                             (pointer)base_type_argument.field_2._M_allocated_capacity) ||
                           (base_interfaces.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
                                 (int)base_type_argument._M_string_length,
                           bVar21 = (int)base_interfaces.
                                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish !=
                                    base_type_argument.field_2._8_4_, bVar21)) {
                          do {
                            method_signature::method_signature
                                      ((method_signature *)&template_file,
                                       (MethodDef *)&base_interfaces);
                            type_name._M_str =
                                 "    %::%(%) :\n        %(make<@::implementation::%>(%))\n    {\n    }\n"
                            ;
                            type_name._M_len = 0x43;
                            type_namespace._M_len = (size_t)&template_file;
                            local_4e0._0_8_ = (method_signature *)&template_file;
                            writer_base<cppwinrt::writer>::
                            write_segment<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
                                      ((writer_base<cppwinrt::writer> *)&output_folder,&type_name,
                                       (basic_string_view<char,_std::char_traits<char>_> *)
                                       &no_module_lock,
                                       (basic_string_view<char,_std::char_traits<char>_> *)
                                       &no_module_lock,
                                       (anon_class_8_1_89897ddb_conflict1 *)&type_namespace,
                                       (basic_string_view<char,_std::char_traits<char>_> *)
                                       &no_module_lock,
                                       (basic_string_view<char,_std::char_traits<char>_> *)
                                       &external_requires,
                                       (basic_string_view<char,_std::char_traits<char>_> *)
                                       &no_module_lock,
                                       (anon_class_8_1_89897ddb_conflict1 *)local_4e0);
                            if (local_3e0[0].
                                super__Vector_base<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
                                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                              operator_delete(local_3e0[0].
                                              super__Vector_base<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start,
                                              (long)local_3e0[0].
                                                                                                        
                                                  super__Vector_base<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              - (long)local_3e0[0].
                                                                                                            
                                                  super__Vector_base<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            }
                            std::
                            vector<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>
                            ::~vector(&local_3f8);
                            if (local_400 == true) {
                              std::_Optional_payload_base<winmd::reader::TypeSig>::_M_destroy
                                        ((_Optional_payload_base<winmd::reader::TypeSig> *)local_488
                                        );
                            }
                            if ((namespace_members *)auStack_4a8._0_8_ != (namespace_members *)0x0)
                            {
                              operator_delete((void *)auStack_4a8._0_8_,
                                              auStack_4a8._16_8_ - auStack_4a8._0_8_);
                            }
                            iVar23 = (int)base_interfaces.
                                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish + 1;
                            base_interfaces.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish._0_4_ = iVar23;
                          } while (iVar23 != uVar17 ||
                                   base_interfaces.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start != (pointer)uVar16);
                        }
                      }
                    }
                    else if ((*(char *)((long)&((_Rb_tree_node_base *)(uVar38 + 0x40))->_M_left + 2)
                              == '\x01') &&
                            (*(char *)((long)&((_Rb_tree_node_base *)(uVar38 + 0x40))->_M_left + 3)
                             == '\x01')) {
                      winmd::reader::row_base<winmd::reader::TypeDef>::
                      get_list<winmd::reader::MethodDef>
                                ((pair<winmd::reader::MethodDef,_winmd::reader::MethodDef> *)
                                 &base_type_argument,(row_base<winmd::reader::TypeDef> *)p_Var35,5);
                      uVar16 = base_type_argument.field_2._M_allocated_capacity;
                      base_interfaces.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish =
                           (pointer)base_type_argument._M_string_length;
                      base_interfaces.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                      ._M_impl.super__Vector_impl_data._M_start =
                           (pointer)base_type_argument._M_dataplus._M_p;
                      auVar56 = (undefined1  [16])
                                base_interfaces.
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                                ._M_impl.super__Vector_impl_data._0_16_;
                      uVar17 = base_type_argument.field_2._8_4_;
                      base_interfaces.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                      ._M_impl.super__Vector_impl_data._0_16_ = auVar56;
                      if ((base_type_argument._M_dataplus._M_p !=
                           (pointer)base_type_argument.field_2._M_allocated_capacity) ||
                         (base_interfaces.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
                               (int)base_type_argument._M_string_length,
                         bVar21 = (int)base_interfaces.
                                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish !=
                                  base_type_argument.field_2._8_4_, bVar21)) {
                        do {
                          method_signature::method_signature
                                    ((method_signature *)&template_file,
                                     (MethodDef *)&base_interfaces);
                          std::
                          vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
                          ::resize(local_3e0,
                                   ((long)local_3e0[0].
                                          super__Vector_base<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_3e0[0].
                                          super__Vector_base<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                   -0x5555555555555555 - 2);
                          type_name._M_str =
                               "    %::%(%) :\n        %(make<@::implementation::%>(%))\n    {\n    }\n"
                          ;
                          type_name._M_len = 0x43;
                          type_namespace._M_len = (size_t)&template_file;
                          local_4e0._0_8_ = (method_signature *)&template_file;
                          writer_base<cppwinrt::writer>::
                          write_segment<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
                                    ((writer_base<cppwinrt::writer> *)&output_folder,&type_name,
                                     (basic_string_view<char,_std::char_traits<char>_> *)
                                     &no_module_lock,
                                     (basic_string_view<char,_std::char_traits<char>_> *)
                                     &no_module_lock,
                                     (anon_class_8_1_89897ddb_conflict1 *)&type_namespace,
                                     (basic_string_view<char,_std::char_traits<char>_> *)
                                     &no_module_lock,
                                     (basic_string_view<char,_std::char_traits<char>_> *)
                                     &external_requires,
                                     (basic_string_view<char,_std::char_traits<char>_> *)
                                     &no_module_lock,(anon_class_8_1_89897ddb_conflict1 *)local_4e0)
                          ;
                          if (local_3e0[0].
                              super__Vector_base<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_3e0[0].
                                            super__Vector_base<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_3e0[0].
                                                  super__Vector_base<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_3e0[0].
                                                                                                        
                                                  super__Vector_base<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          std::
                          vector<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>
                          ::~vector(&local_3f8);
                          if (local_400 == true) {
                            std::_Optional_payload_base<winmd::reader::TypeSig>::_M_destroy
                                      ((_Optional_payload_base<winmd::reader::TypeSig> *)local_488);
                          }
                          if ((namespace_members *)auStack_4a8._0_8_ != (namespace_members *)0x0) {
                            operator_delete((void *)auStack_4a8._0_8_,
                                            auStack_4a8._16_8_ - auStack_4a8._0_8_);
                          }
                          iVar23 = (int)base_interfaces.
                                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish + 1;
                          base_interfaces.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish._0_4_ = iVar23;
                        } while (iVar23 != uVar17 ||
                                 base_interfaces.
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start != (pointer)uVar16);
                      }
                    }
                    else if (*(char *)((long)&((_Rb_tree_node_base *)(uVar38 + 0x40))->_M_left + 1)
                             == '\x01') {
                      winmd::reader::row_base<winmd::reader::TypeDef>::
                      get_list<winmd::reader::MethodDef>
                                ((pair<winmd::reader::MethodDef,_winmd::reader::MethodDef> *)
                                 &base_type_argument,(row_base<winmd::reader::TypeDef> *)p_Var35,5);
                      uVar16 = base_type_argument.field_2._M_allocated_capacity;
                      base_interfaces.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish =
                           (pointer)base_type_argument._M_string_length;
                      base_interfaces.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                      ._M_impl.super__Vector_impl_data._M_start =
                           (pointer)base_type_argument._M_dataplus._M_p;
                      auVar56 = (undefined1  [16])
                                base_interfaces.
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                                ._M_impl.super__Vector_impl_data._0_16_;
                      uVar17 = base_type_argument.field_2._8_4_;
                      base_interfaces.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                      ._M_impl.super__Vector_impl_data._0_16_ = auVar56;
                      if ((base_type_argument._M_dataplus._M_p !=
                           (pointer)base_type_argument.field_2._M_allocated_capacity) ||
                         (base_interfaces.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
                               (int)base_type_argument._M_string_length,
                         bVar21 = (int)base_interfaces.
                                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish !=
                                  base_type_argument.field_2._8_4_, bVar21)) {
                        do {
                          method_signature::method_signature
                                    ((method_signature *)&template_file,
                                     (MethodDef *)&base_interfaces);
                          type_name = get_name((MethodDef *)&base_interfaces);
                          method_signature::is_async((method_signature *)&template_file);
                          bVar21 = is_add_overload((MethodDef *)&base_interfaces);
                          if ((bVar21) ||
                             (bVar21 = is_remove_overload((MethodDef *)&base_interfaces), bVar21)) {
                            type_namespace._M_str =
                                 "    % %::%(%)\n    {\n        auto f = make<winrt::@::factory_implementation::%>().as<%>();\n        return f.%(%);\n    }\n"
                            ;
                            type_namespace._M_len = 0x77;
                            local_4f0._M_len = (size_t)&template_file;
                            local_4e0._0_8_ = (method_signature *)&template_file;
                            writer_base<cppwinrt::writer>::
                            write_segment<winmd::reader::RetTypeSig,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
                                      ((writer_base<cppwinrt::writer> *)&output_folder,
                                       &type_namespace,(RetTypeSig *)auStack_4a8,
                                       (basic_string_view<char,_std::char_traits<char>_> *)
                                       &no_module_lock,&type_name,
                                       (anon_class_8_1_89897ddb_conflict1 *)local_4e0,
                                       (basic_string_view<char,_std::char_traits<char>_> *)
                                       &external_requires,
                                       (basic_string_view<char,_std::char_traits<char>_> *)
                                       &no_module_lock,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(uVar38 + 0x20),&type_name,
                                       (anon_class_8_1_89897ddb_conflict1 *)&local_4f0);
                          }
                          else {
                            bVar21 = is_put_overload((MethodDef *)&base_interfaces);
                            local_4f0._M_len = 0x179e1f;
                            if ((local_400 & 1U) != 0) {
                              local_4f0._M_len = 0x1918b1;
                            }
                            if (bVar21) {
                              local_4f0._M_len = 0x179e1f;
                            }
                            type_namespace._M_str =
                                 "    % %::%(%)\n    {\n        %@::implementation::%::%(%);\n    }\n"
                            ;
                            type_namespace._M_len = 0x3f;
                            local_4e0._0_8_ = (method_signature *)&template_file;
                            local_1e0.args = (method_signature *)&template_file;
                            writer_base<cppwinrt::writer>::
                            write_segment<winmd::reader::RetTypeSig,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_const_char_*,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
                                      ((writer_base<cppwinrt::writer> *)&output_folder,
                                       &type_namespace,(RetTypeSig *)auStack_4a8,
                                       (basic_string_view<char,_std::char_traits<char>_> *)
                                       &no_module_lock,&type_name,
                                       (anon_class_8_1_89897ddb_conflict1 *)local_4e0,
                                       (char **)&local_4f0,
                                       (basic_string_view<char,_std::char_traits<char>_> *)
                                       &external_requires,
                                       (basic_string_view<char,_std::char_traits<char>_> *)
                                       &no_module_lock,&type_name,&local_1e0);
                          }
                          bVar21 = is_add_overload((MethodDef *)&base_interfaces);
                          if (bVar21) {
                            type_namespace._M_str =
                                 "    %::%_revoker %::%(auto_revoke_t, %)\n    {\n        auto f = make<winrt::@::factory_implementation::%>().as<%>();\n        return %::%_revoker{ f, f.%(%) };\n    }\n"
                            ;
                            type_namespace._M_len = 0xa4;
                            local_4f0._M_len = (size_t)&template_file;
                            local_4e0._0_8_ = (method_signature *)&template_file;
                            writer_base<cppwinrt::writer>::
                            write_segment<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
                                      ((writer_base<cppwinrt::writer> *)&output_folder,
                                       &type_namespace,
                                       (basic_string_view<char,_std::char_traits<char>_> *)
                                       &no_module_lock,&type_name,
                                       (basic_string_view<char,_std::char_traits<char>_> *)
                                       &no_module_lock,&type_name,
                                       (anon_class_8_1_89897ddb_conflict1 *)local_4e0,
                                       (basic_string_view<char,_std::char_traits<char>_> *)
                                       &external_requires,
                                       (basic_string_view<char,_std::char_traits<char>_> *)
                                       &no_module_lock,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(uVar38 + 0x20),
                                       (basic_string_view<char,_std::char_traits<char>_> *)
                                       &no_module_lock,&type_name,&type_name,
                                       (anon_class_8_1_89897ddb_conflict1 *)&local_4f0);
                          }
                          if (local_3e0[0].
                              super__Vector_base<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_3e0[0].
                                            super__Vector_base<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_3e0[0].
                                                  super__Vector_base<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_3e0[0].
                                                                                                        
                                                  super__Vector_base<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          std::
                          vector<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>
                          ::~vector(&local_3f8);
                          if (local_400 == true) {
                            std::_Optional_payload_base<winmd::reader::TypeSig>::_M_destroy
                                      ((_Optional_payload_base<winmd::reader::TypeSig> *)local_488);
                          }
                          if ((namespace_members *)auStack_4a8._0_8_ != (namespace_members *)0x0) {
                            operator_delete((void *)auStack_4a8._0_8_,
                                            auStack_4a8._16_8_ - auStack_4a8._0_8_);
                          }
                          iVar23 = (int)base_interfaces.
                                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish + 1;
                          base_interfaces.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish._0_4_ = iVar23;
                        } while (iVar23 != uVar17 ||
                                 base_interfaces.
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start != (pointer)uVar16);
                      }
                    }
                  }
                }
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
                ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
                             *)&license_arg);
                std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
                          ((vector<char,std::allocator<char>> *)
                           ((long)&output_folder._M_pathname.field_2 + 8),output_folder._32_8_,"}\n"
                           ,"");
                pTVar43 = extraout_RDX_08;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)base_type_parameter._M_dataplus._M_p != &base_type_parameter.field_2) {
                operator_delete(base_type_parameter._M_dataplus._M_p,
                                base_type_parameter.field_2._M_allocated_capacity + 1);
                pTVar43 = extraout_RDX_09;
              }
              get_generated_component_filename_abi_cxx11_
                        (&base_type_parameter,(cppwinrt *)local_6a0,pTVar43);
              puVar39 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&base_type_parameter,0,(char *)0x0,settings._96_8_);
              p_Var35 = (_Rb_tree_node_base *)(puVar39 + 2);
              if ((_Rb_tree_node_base *)*puVar39 == p_Var35) {
                local_4b8._0_8_ = *(undefined8 *)&p_Var35->_M_color;
                local_4b8._8_8_ = puVar39[3];
                _template_file = (pointer)local_4b8;
              }
              else {
                local_4b8._0_8_ = *(undefined8 *)&p_Var35->_M_color;
                _template_file = (pointer)*puVar39;
              }
              pnStack_4c0 = (namespace_members *)puVar39[1];
              *puVar39 = p_Var35;
              puVar39[1] = 0;
              *(undefined1 *)(puVar39 + 2) = 0;
              plVar31 = (long *)std::__cxx11::string::append((char *)&template_file);
              license_arg._M_dataplus._M_p = (pointer)&license_arg.field_2;
              psVar41 = (size_type *)(plVar31 + 2);
              if ((size_type *)*plVar31 == psVar41) {
                license_arg.field_2._M_allocated_capacity = *psVar41;
                license_arg.field_2._8_8_ = plVar31[3];
              }
              else {
                license_arg.field_2._M_allocated_capacity = *psVar41;
                license_arg._M_dataplus._M_p = (pointer)*plVar31;
              }
              license_arg._M_string_length = plVar31[1];
              *plVar31 = (long)psVar41;
              plVar31[1] = 0;
              *(undefined1 *)(plVar31 + 2) = 0;
              if ((_Rb_tree_node_base *)_template_file != (_Rb_tree_node_base *)local_4b8) {
                operator_delete(_template_file,(ulong)(local_4b8._0_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)base_type_parameter._M_dataplus._M_p != &base_type_parameter.field_2) {
                operator_delete(base_type_parameter._M_dataplus._M_p,
                                base_type_parameter.field_2._M_allocated_capacity + 1);
              }
              std::filesystem::__cxx11::path::
              path<std::__cxx11::string,std::filesystem::__cxx11::path>
                        ((path *)&template_file,&license_arg,auto_format);
              std::filesystem::__cxx11::path::remove_filename();
              std::filesystem::create_directories((path *)&template_file);
              writer_base<cppwinrt::writer>::flush_to_file
                        ((writer_base<cppwinrt::writer> *)&output_folder,&license_arg);
              std::filesystem::__cxx11::path::~path((path *)&template_file);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)license_arg._M_dataplus._M_p != &license_arg.field_2) {
                operator_delete(license_arg._M_dataplus._M_p,
                                license_arg.field_2._M_allocated_capacity + 1);
              }
              std::
              vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::~vector(&vStack_580);
              std::
              _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>_>_>
              ::~_Rb_tree(&local_5b0);
              pTVar43 = extraout_RDX_10;
              if (output_folder._M_pathname.field_2._8_8_ != 0) {
                operator_delete((void *)output_folder._M_pathname.field_2._8_8_,
                                (long)local_5e0 - output_folder._M_pathname.field_2._8_8_);
                pTVar43 = extraout_RDX_11;
              }
              if (output_folder._M_pathname._M_dataplus._M_p != (pointer)0x0) {
                operator_delete(output_folder._M_pathname._M_dataplus._M_p,
                                output_folder._M_pathname.field_2._M_allocated_capacity -
                                (long)output_folder._M_pathname._M_dataplus._M_p);
                pTVar43 = extraout_RDX_12;
              }
            }
            if (settings._184_8_ != 0) {
              get_component_filename_abi_cxx11_
                        (&output_folder._M_pathname,(cppwinrt *)local_6a0,pTVar43);
              puVar39 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&output_folder,0,(char *)0x0,settings._176_8_);
              p_Var35 = (_Rb_tree_node_base *)(puVar39 + 2);
              if ((_Rb_tree_node_base *)*puVar39 == p_Var35) {
                local_4b8._0_8_ = *(undefined8 *)&p_Var35->_M_color;
                local_4b8._8_8_ = puVar39[3];
                _template_file = (pointer)local_4b8;
              }
              else {
                local_4b8._0_8_ = *(undefined8 *)&p_Var35->_M_color;
                _template_file = (pointer)*puVar39;
              }
              pnStack_4c0 = (namespace_members *)puVar39[1];
              *puVar39 = p_Var35;
              puVar39[1] = 0;
              *(undefined1 *)(puVar39 + 2) = 0;
              plVar31 = (long *)std::__cxx11::string::append((char *)&template_file);
              no_module_lock._M_dataplus._M_p = (pointer)&no_module_lock.field_2;
              psVar41 = (size_type *)(plVar31 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar31 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar41) {
                no_module_lock.field_2._M_allocated_capacity = *psVar41;
                no_module_lock.field_2._8_8_ = plVar31[3];
              }
              else {
                no_module_lock.field_2._M_allocated_capacity = *psVar41;
                no_module_lock._M_dataplus._M_p = (pointer)*plVar31;
              }
              no_module_lock._M_string_length = plVar31[1];
              *plVar31 = (long)psVar41;
              plVar31[1] = 0;
              *(undefined1 *)(plVar31 + 2) = 0;
              if ((_Rb_tree_node_base *)_template_file != (_Rb_tree_node_base *)local_4b8) {
                operator_delete(_template_file,(ulong)(local_4b8._0_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)output_folder._M_pathname._M_dataplus._M_p !=
                  &output_folder._M_pathname.field_2) {
                operator_delete(output_folder._M_pathname._M_dataplus._M_p,
                                output_folder._M_pathname.field_2._M_allocated_capacity + 1);
              }
              if (settings[0x111] == '\0') {
                std::filesystem::__cxx11::path::
                path<std::__cxx11::string,std::filesystem::__cxx11::path>
                          ((path *)&template_file,&no_module_lock,auto_format);
                cVar20 = std::filesystem::status((path *)&template_file);
                std::filesystem::__cxx11::path::~path((path *)&template_file);
                if ((cVar20 == '\0') || (pTVar43 = extraout_RDX_13, cVar20 == -1))
                goto LAB_0010dfa4;
              }
              else {
LAB_0010dfa4:
                writer_base<cppwinrt::writer>::writer_base
                          ((writer_base<cppwinrt::writer> *)&template_file);
                auStack_4a8._16_8_ = local_488;
                local_490 = 0;
                local_488[0] = false;
                local_468._M_color = _S_red;
                local_468._M_parent = (_Base_ptr)0x0;
                local_488[0x14] = false;
                local_488[0x10] = false;
                local_488[0x11] = false;
                local_488[0x12] = false;
                local_488[0x13] = false;
                local_468._M_left = &local_468;
                avStack_440[0].
                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                avStack_440[0].
                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_448 = 0;
                avStack_440[0].
                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_468._M_right = local_468._M_left;
                std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
                          ((vector<char,std::allocator<char>> *)(local_4b8 + 8),auStack_4a8._0_8_,
                           "#pragma once\n","");
                ptVar12 = (local_6a0->m_method).super_row_base<winmd::reader::MethodDef>.m_table;
                pdVar8 = ptVar12->m_database;
                uVar24 = winmd::reader::table_base::get_value<unsigned_int>
                                   (ptVar12,(local_6a0->m_method).
                                            super_row_base<winmd::reader::MethodDef>.m_index,1);
                external_requires._0_16_ = winmd::reader::database::get_string(pdVar8,uVar24);
                ptVar12 = (local_6a0->m_method).super_row_base<winmd::reader::MethodDef>.m_table;
                pdVar8 = ptVar12->m_database;
                uVar24 = winmd::reader::table_base::get_value<unsigned_int>
                                   (ptVar12,(local_6a0->m_method).
                                            super_row_base<winmd::reader::MethodDef>.m_index,2);
                base_interfaces.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                ._M_impl.super__Vector_impl_data._0_16_ =
                     winmd::reader::database::get_string(pdVar8,uVar24);
                TVar55 = get_base_class((cppwinrt *)
                                        (local_6a0->m_method).
                                        super_row_base<winmd::reader::MethodDef>.m_table,
                                        (TypeDef *)
                                        (ulong)(local_6a0->m_method).
                                               super_row_base<winmd::reader::MethodDef>.m_index);
                pTVar43 = TVar55.super_row_base<winmd::reader::TypeDef>._8_8_;
                type_name._0_12_ = TVar55.super_row_base<winmd::reader::TypeDef>._0_12_;
                output_folder._M_pathname._M_dataplus._M_p =
                     (pointer)&output_folder._M_pathname.field_2;
                output_folder._M_pathname._M_string_length = 0;
                output_folder._M_pathname.field_2._M_allocated_capacity =
                     output_folder._M_pathname.field_2._M_allocated_capacity & 0xffffffffffffff00;
                if ((TVar55.super_row_base<winmd::reader::TypeDef>.m_table != (table_base *)0x0) &&
                   (bVar21 = winmd::reader::filter::includes
                                       ((filter *)(settings + 0x1b8),(TypeDef *)&type_name),
                   pTVar43 = type_00, bVar21)) {
                  get_component_filename_abi_cxx11_
                            (&base_type_argument,(cppwinrt *)&type_name,type_00);
                  plVar31 = (long *)std::__cxx11::string::replace
                                              ((ulong)&base_type_argument,0,(char *)0x0,0x1b344f);
                  base_type_parameter._M_dataplus._M_p = (pointer)&base_type_parameter.field_2;
                  psVar41 = (size_type *)(plVar31 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar31 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar41) {
                    base_type_parameter.field_2._M_allocated_capacity = *psVar41;
                    base_type_parameter.field_2._8_8_ = plVar31[3];
                  }
                  else {
                    base_type_parameter.field_2._M_allocated_capacity = *psVar41;
                    base_type_parameter._M_dataplus._M_p = (pointer)*plVar31;
                  }
                  base_type_parameter._M_string_length = plVar31[1];
                  *plVar31 = (long)psVar41;
                  plVar31[1] = 0;
                  *(undefined1 *)(plVar31 + 2) = 0;
                  plVar31 = (long *)std::__cxx11::string::append((char *)&base_type_parameter);
                  psVar41 = (size_type *)(plVar31 + 2);
                  if ((size_type *)*plVar31 == psVar41) {
                    license_arg.field_2._M_allocated_capacity = *psVar41;
                    license_arg.field_2._8_8_ = plVar31[3];
                    license_arg._M_dataplus._M_p = (pointer)&license_arg.field_2;
                  }
                  else {
                    license_arg.field_2._M_allocated_capacity = *psVar41;
                    license_arg._M_dataplus._M_p = (pointer)*plVar31;
                  }
                  license_arg._M_string_length = plVar31[1];
                  *plVar31 = (long)psVar41;
                  plVar31[1] = 0;
                  *(undefined1 *)(plVar31 + 2) = 0;
                  std::__cxx11::string::operator=((string *)&output_folder,(string *)&license_arg);
                  pTVar43 = extraout_RDX_14;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)license_arg._M_dataplus._M_p != &license_arg.field_2) {
                    operator_delete(license_arg._M_dataplus._M_p,
                                    license_arg.field_2._M_allocated_capacity + 1);
                    pTVar43 = extraout_RDX_15;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)base_type_parameter._M_dataplus._M_p != &base_type_parameter.field_2) {
                    operator_delete(base_type_parameter._M_dataplus._M_p,
                                    base_type_parameter.field_2._M_allocated_capacity + 1);
                    pTVar43 = extraout_RDX_16;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)base_type_argument._M_dataplus._M_p != &base_type_argument.field_2) {
                    operator_delete(base_type_argument._M_dataplus._M_p,
                                    base_type_argument.field_2._M_allocated_capacity + 1);
                    pTVar43 = extraout_RDX_17;
                  }
                }
                base_type_parameter._M_string_length =
                     (size_type)
                     "#include \"%.g.h\"\n%%\nnamespace winrt::@::implementation\n{\n    struct %%\n    {\n        %() = default;\n\n%    };\n}\n"
                ;
                base_type_parameter._M_dataplus._M_p = (pointer)0x6f;
                paVar57 = (anon_class_8_1_89897ddb *)0x10e256;
                get_generated_component_filename_abi_cxx11_
                          (&license_arg,(cppwinrt *)local_6a0,pTVar43);
                base_type_argument._M_dataplus._M_p = (pointer)local_6a0;
                type_namespace._M_len = (size_t)local_6a0;
                writer_base<cppwinrt::writer>::
                write_segment<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
                          ((writer_base<cppwinrt::writer> *)&template_file,
                           (string_view *)&base_type_parameter,&license_arg,
                           &output_folder._M_pathname,(anon_class_1_0_00000001 *)&base_interfaces,
                           (basic_string_view<char,_std::char_traits<char>_> *)&external_requires,
                           (basic_string_view<char,_std::char_traits<char>_> *)&base_type_argument,
                           (anon_class_8_1_89897ddb *)&external_requires,&type_namespace,paVar57);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)license_arg._M_dataplus._M_p != &license_arg.field_2) {
                  operator_delete(license_arg._M_dataplus._M_p,
                                  license_arg.field_2._M_allocated_capacity + 1);
                }
                bVar21 = has_factory_members((writer *)&template_file,(TypeDef *)local_6a0);
                if (bVar21) {
                  license_arg._M_dataplus._M_p = (pointer)0x64;
                  license_arg._M_string_length = (size_type)anon_var_dwarf_bd5fc;
                  writer_base<cppwinrt::writer>::
                  write_segment<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                            ((writer_base<cppwinrt::writer> *)&template_file,
                             (string_view *)&license_arg,
                             (basic_string_view<char,_std::char_traits<char>_> *)&base_interfaces,
                             (basic_string_view<char,_std::char_traits<char>_> *)&external_requires,
                             (basic_string_view<char,_std::char_traits<char>_> *)&external_requires,
                             (basic_string_view<char,_std::char_traits<char>_> *)&external_requires,
                             (basic_string_view<char,_std::char_traits<char>_> *)&external_requires)
                  ;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)output_folder._M_pathname._M_dataplus._M_p !=
                    &output_folder._M_pathname.field_2) {
                  operator_delete(output_folder._M_pathname._M_dataplus._M_p,
                                  output_folder._M_pathname.field_2._M_allocated_capacity + 1);
                }
                writer_base<cppwinrt::writer>::flush_to_file
                          ((writer_base<cppwinrt::writer> *)&template_file,&no_module_lock);
                std::
                vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_4e0._16_8_);
                std::
                _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>_>_>
                ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>_>_>
                             *)(local_488 + 0x18));
                pTVar43 = extraout_RDX_18;
                if ((undefined1 *)auStack_4a8._16_8_ != local_488) {
                  operator_delete((void *)auStack_4a8._16_8_,
                                  CONCAT71(local_488._1_7_,local_488[0]) + 1);
                  pTVar43 = extraout_RDX_19;
                }
                if ((_Rb_tree_node_base *)local_4b8._8_8_ != (_Rb_tree_node_base *)0x0) {
                  operator_delete((void *)local_4b8._8_8_,auStack_4a8._8_8_ - local_4b8._8_8_);
                  pTVar43 = extraout_RDX_20;
                }
                if ((_Rb_tree_node_base *)_template_file != (_Rb_tree_node_base *)0x0) {
                  operator_delete(_template_file,local_4b8._0_8_ - (long)_template_file);
                  pTVar43 = extraout_RDX_21;
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)no_module_lock._M_dataplus._M_p != &no_module_lock.field_2) {
                operator_delete(no_module_lock._M_dataplus._M_p,
                                no_module_lock.field_2._M_allocated_capacity + 1);
                pTVar43 = extraout_RDX_22;
              }
              if (settings._184_8_ != 0) {
                get_component_filename_abi_cxx11_
                          (&output_folder._M_pathname,(cppwinrt *)local_6a0,pTVar43);
                paVar57 = (anon_class_8_1_89897ddb *)settings._184_8_;
                puVar39 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&output_folder,0,(char *)0x0,settings._176_8_);
                p_Var35 = (_Rb_tree_node_base *)(puVar39 + 2);
                if ((_Rb_tree_node_base *)*puVar39 == p_Var35) {
                  local_4b8._0_8_ = *(undefined8 *)&p_Var35->_M_color;
                  local_4b8._8_8_ = puVar39[3];
                  _template_file = (pointer)local_4b8;
                }
                else {
                  local_4b8._0_8_ = *(undefined8 *)&p_Var35->_M_color;
                  _template_file = (pointer)*puVar39;
                }
                pnStack_4c0 = (namespace_members *)puVar39[1];
                *puVar39 = p_Var35;
                puVar39[1] = 0;
                *(undefined1 *)(puVar39 + 2) = 0;
                plVar31 = (long *)std::__cxx11::string::append((char *)&template_file);
                license_arg._M_dataplus._M_p = (pointer)&license_arg.field_2;
                psVar41 = (size_type *)(plVar31 + 2);
                if ((size_type *)*plVar31 == psVar41) {
                  license_arg.field_2._M_allocated_capacity = *psVar41;
                  license_arg.field_2._8_8_ = plVar31[3];
                }
                else {
                  license_arg.field_2._M_allocated_capacity = *psVar41;
                  license_arg._M_dataplus._M_p = (pointer)*plVar31;
                }
                license_arg._M_string_length = plVar31[1];
                *plVar31 = (long)psVar41;
                plVar31[1] = 0;
                *(undefined1 *)(plVar31 + 2) = 0;
                if ((_Rb_tree_node_base *)_template_file != (_Rb_tree_node_base *)local_4b8) {
                  operator_delete(_template_file,(ulong)(local_4b8._0_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)output_folder._M_pathname._M_dataplus._M_p !=
                    &output_folder._M_pathname.field_2) {
                  operator_delete(output_folder._M_pathname._M_dataplus._M_p,
                                  output_folder._M_pathname.field_2._M_allocated_capacity + 1);
                }
                if (settings[0x111] == '\0') {
                  std::filesystem::__cxx11::path::
                  path<std::__cxx11::string,std::filesystem::__cxx11::path>
                            ((path *)&template_file,&license_arg,auto_format);
                  cVar20 = std::filesystem::status((path *)&template_file);
                  std::filesystem::__cxx11::path::~path((path *)&template_file);
                  if ((cVar20 == '\0') || (cVar20 == -1)) goto LAB_0010e543;
                }
                else {
LAB_0010e543:
                  writer_base<cppwinrt::writer>::writer_base
                            ((writer_base<cppwinrt::writer> *)&template_file);
                  auStack_4a8._16_8_ = local_488;
                  local_490 = 0;
                  local_488[0] = false;
                  local_468._M_color = _S_red;
                  local_468._M_parent = (_Base_ptr)0x0;
                  local_488[0x14] = false;
                  local_488[0x10] = false;
                  local_488[0x11] = false;
                  local_488[0x12] = false;
                  local_488[0x13] = false;
                  local_468._M_left = &local_468;
                  avStack_440[0].
                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  avStack_440[0].
                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_448 = 0;
                  avStack_440[0].
                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  pTVar43 = extraout_RDX_23;
                  local_468._M_right = local_468._M_left;
                  if (settings._248_8_ != 0) {
                    output_folder._M_pathname._M_dataplus._M_p = (pointer)0xd;
                    output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_bcdfd;
                    writer_base<cppwinrt::writer>::write_segment<std::__cxx11::string>
                              ((writer_base<cppwinrt::writer> *)&template_file,
                               (string_view *)&output_folder,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (settings + 0xf0));
                    pTVar43 = extraout_RDX_24;
                  }
                  get_component_filename_abi_cxx11_
                            (&output_folder._M_pathname,(cppwinrt *)local_6a0,pTVar43);
                  base_type_parameter._M_string_length = (size_type)"#include \"%.h\"\n";
                  base_type_parameter._M_dataplus._M_p = (pointer)0xf;
                  writer_base<cppwinrt::writer>::write_segment<std::__cxx11::string>
                            ((writer_base<cppwinrt::writer> *)&template_file,
                             (string_view *)&base_type_parameter,&output_folder._M_pathname);
                  pTVar43 = extraout_RDX_25;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)output_folder._M_pathname._M_dataplus._M_p !=
                      &output_folder._M_pathname.field_2) {
                    operator_delete(output_folder._M_pathname._M_dataplus._M_p,
                                    output_folder._M_pathname.field_2._M_allocated_capacity + 1);
                    pTVar43 = extraout_RDX_26;
                  }
                  if (settings[0x138] == '\x01') {
                    get_generated_component_filename_abi_cxx11_
                              (&output_folder._M_pathname,(cppwinrt *)local_6a0,pTVar43);
                    base_type_parameter._M_string_length = (size_type)"#include \"%.g.cpp\"\n";
                    base_type_parameter._M_dataplus._M_p = (pointer)0x13;
                    writer_base<cppwinrt::writer>::write_segment<std::__cxx11::string>
                              ((writer_base<cppwinrt::writer> *)&template_file,
                               (string_view *)&base_type_parameter,&output_folder._M_pathname);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)output_folder._M_pathname._M_dataplus._M_p !=
                        &output_folder._M_pathname.field_2) {
                      operator_delete(output_folder._M_pathname._M_dataplus._M_p,
                                      output_folder._M_pathname.field_2._M_allocated_capacity + 1);
                    }
                  }
                  output_folder._M_pathname._M_dataplus._M_p = (pointer)0x2a;
                  output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_bd6d2;
                  ptVar12 = (local_6a0->m_method).super_row_base<winmd::reader::MethodDef>.m_table;
                  pdVar8 = ptVar12->m_database;
                  uVar24 = winmd::reader::table_base::get_value<unsigned_int>
                                     (ptVar12,(local_6a0->m_method).
                                              super_row_base<winmd::reader::MethodDef>.m_index,2);
                  base_type_parameter._0_16_ = winmd::reader::database::get_string(pdVar8,uVar24);
                  base_type_argument._M_dataplus._M_p = (pointer)local_6a0;
                  writer_base<cppwinrt::writer>::
                  write_segment<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
                            ((writer_base<cppwinrt::writer> *)&template_file,
                             (string_view *)&output_folder,
                             (anon_class_1_0_00000001 *)&base_type_parameter,
                             (basic_string_view<char,_std::char_traits<char>_> *)&base_type_argument
                             ,paVar57);
                  writer_base<cppwinrt::writer>::flush_to_file
                            ((writer_base<cppwinrt::writer> *)&template_file,&license_arg);
                  std::
                  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)local_4e0._16_8_);
                  std::
                  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>_>_>
                  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>_>_>
                               *)(local_488 + 0x18));
                  if ((undefined1 *)auStack_4a8._16_8_ != local_488) {
                    operator_delete((void *)auStack_4a8._16_8_,
                                    CONCAT71(local_488._1_7_,local_488[0]) + 1);
                  }
                  if ((_Rb_tree_node_base *)local_4b8._8_8_ != (_Rb_tree_node_base *)0x0) {
                    operator_delete((void *)local_4b8._8_8_,auStack_4a8._8_8_ - local_4b8._8_8_);
                  }
                  if ((_Rb_tree_node_base *)_template_file != (_Rb_tree_node_base *)0x0) {
                    operator_delete(_template_file,local_4b8._0_8_ - (long)_template_file);
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)license_arg._M_dataplus._M_p != &license_arg.field_2) {
                  operator_delete(license_arg._M_dataplus._M_p,
                                  license_arg.field_2._M_allocated_capacity + 1);
                }
              }
            }
            local_6a0 = (method_signature *)&local_6a0->m_signature;
          } while (local_6a0 != (method_signature *)pTVar19);
        }
      }
      if (classes.
          super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(classes.
                        super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)classes.
                              super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)classes.
                              super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  task_group::get(&group);
  if (settings[0xa9] == '\x01') {
    _template_file = (pointer)0xc;
    pnStack_4c0 = (namespace_members *)0x178cb8;
    lVar40 = std::chrono::_V2::system_clock::now();
    output_folder._M_pathname._M_dataplus._M_p = (pointer)((lVar40 - lVar25) / 1000000);
    writer_base<cppwinrt::writer>::write_segment<long>
              (&w.super_writer_base<cppwinrt::writer>,(string_view *)&template_file,
               (long *)&output_folder);
  }
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&ixx.generic_param_stack);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>_>_>
  ::~_Rb_tree(&ixx.depends._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ixx.type_namespace._M_dataplus._M_p != &ixx.type_namespace.field_2) {
    operator_delete(ixx.type_namespace._M_dataplus._M_p,
                    CONCAT71(ixx.type_namespace.field_2._M_allocated_capacity._1_7_,
                             ixx.type_namespace.field_2._M_local_buf[0]) + 1);
  }
  if (ixx.super_writer_base<cppwinrt::writer>.m_first.
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(ixx.super_writer_base<cppwinrt::writer>.m_first.
                    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)ixx.super_writer_base<cppwinrt::writer>.m_first.
                                   super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)ixx.super_writer_base<cppwinrt::writer>.m_first.
                                   super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  if (ixx.super_writer_base<cppwinrt::writer>.m_second.
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(ixx.super_writer_base<cppwinrt::writer>.m_second.
                    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)ixx.super_writer_base<cppwinrt::writer>.m_second.
                                   super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)ixx.super_writer_base<cppwinrt::writer>.m_second.
                                   super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  task_group::~task_group(&group);
  std::
  _Rb_tree<winmd::reader::TypeDef,_std::pair<const_winmd::reader::TypeDef,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>,_std::_Select1st<std::pair<const_winmd::reader::TypeDef,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>_>,_std::less<winmd::reader::TypeDef>,_std::allocator<std::pair<const_winmd::reader::TypeDef,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>_>_>
  ::~_Rb_tree(&c.m_nested_types._M_t);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members>_>_>
  ::~_Rb_tree(&c.m_namespaces._M_t);
  std::__cxx11::_List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>::
  _M_clear((_List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_> *)&c);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)&args);
  writer_base<cppwinrt::writer>::flush_to_console(&w.super_writer_base<cppwinrt::writer>,true);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&w.generic_param_stack);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>_>_>
  ::~_Rb_tree(&w.depends._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)w.type_namespace._M_dataplus._M_p != &w.type_namespace.field_2) {
    operator_delete(w.type_namespace._M_dataplus._M_p,
                    CONCAT71(w.type_namespace.field_2._M_allocated_capacity._1_7_,
                             w.type_namespace.field_2._M_local_buf[0]) + 1);
  }
  if (w.super_writer_base<cppwinrt::writer>.m_first.super__Vector_base<char,_std::allocator<char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(w.super_writer_base<cppwinrt::writer>.m_first.
                    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)w.super_writer_base<cppwinrt::writer>.m_first.
                                   super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)w.super_writer_base<cppwinrt::writer>.m_first.
                                   super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  if (w.super_writer_base<cppwinrt::writer>.m_second.super__Vector_base<char,_std::allocator<char>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(w.super_writer_base<cppwinrt::writer>.m_second.
                    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)w.super_writer_base<cppwinrt::writer>.m_second.
                                   super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)w.super_writer_base<cppwinrt::writer>.m_second.
                                   super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

static int run(int const argc, char** argv)
    {
        int result{};
        writer w;

        try
        {
            auto start = get_start_time();

            reader args{ argc, argv, options };

            if (!args || args.exists("help") || args.exists("?"))
            {
                throw usage_exception{};
            }

            process_args(args);
            cache c{ get_files_to_cache(), [](TypeDef const& type) { return type.Flags().WindowsRuntime(); } };
            remove_foundation_types(c);
            build_filters(c);
            settings.base = settings.base || (!settings.component && settings.projection_filter.empty());
            build_fastabi_cache(c);

            if (settings.verbose)
            {
                {
                    char* path = argv[0];
#if defined(_WIN32) || defined(_WIN64)
                    char path_buf[32768];
                    DWORD path_size = GetModuleFileNameA(nullptr, path_buf, sizeof(path_buf));
                    if (path_size)
                    {
                        path_buf[sizeof(path_buf) - 1] = 0;
                        path = path_buf;
                    }
#endif
                    w.write(" tool:  %\n", path);
                }
                w.write(" ver:   %\n", CPPWINRT_VERSION_STRING);

                for (auto&& file : settings.input)
                {
                    w.write(" in:    %\n", file);
                }

                for (auto&& file : settings.reference)
                {
                    w.write(" ref:   %\n", file);
                }

                w.write(" out:   %\n", settings.output_folder);

                if (!settings.component_folder.empty())
                {
                    w.write(" cout:  %\n", settings.component_folder);
                }
            }

            w.flush_to_console();
            task_group group;
            group.synchronous(args.exists("synchronous"));
            writer ixx;
            write_preamble(ixx);
            ixx.write("module;\n");
            ixx.write(strings::base_includes);
            ixx.write("\nexport module winrt;\n#define WINRT_EXPORT export\n\n");

            for (auto&&[ns, members] : c.namespaces())
            {
                if (!has_projected_types(members) || !settings.projection_filter.includes(members))
                {
                    continue;
                }

                ixx.write("#include \"winrt/%.h\"\n", ns);

                group.add([&, &ns = ns, &members = members]
                {
                    write_namespace_0_h(ns, members);
                    write_namespace_1_h(ns, members);
                    write_namespace_2_h(ns, members);
                    write_namespace_h(c, ns, members);
                });
            }

            if (settings.base)
            {
                write_base_h();
                ixx.flush_to_file(settings.output_folder + "winrt/winrt.ixx");
            }

            if (settings.component)
            {
                std::vector<TypeDef> classes;

                for (auto&&[ns, members] : c.namespaces())
                {
                    for (auto&& type : members.classes)
                    {
                        if (settings.component_filter.includes(type))
                        {
                            classes.push_back(type);
                        }
                    }
                }

                if (!classes.empty())
                {
                    write_fast_forward_h(classes);
                    write_module_g_cpp(classes);

                    for (auto&& type : classes)
                    {
                        write_component_g_h(type);
                        write_component_g_cpp(type);
                        write_component_h(type);
                        write_component_cpp(type);
                    }
                }
            }

            group.get();

            if (settings.verbose)
            {
                w.write(" time:  %ms\n", get_elapsed_time(start));
            }
        }
        catch (usage_exception const&)
        {
            print_usage(w);
        }
        catch (std::exception const& e)
        {
            w.write("cppwinrt : error %\n", e.what());
            result = 1;
        }

        w.flush_to_console(result == 0);
        return result;
    }